

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Mish_x86_avx512::forward_inplace(Mish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [24];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [24];
  undefined1 auVar235 [24];
  undefined8 in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  float fVar236;
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  Mat tmp;
  int elempack;
  int size;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  __m256 two;
  __m256 one_2;
  __m256 two_2;
  __m256 one_12;
  __m256 y_1;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_1;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 y_7;
  __m256 z_2;
  __m256 tmp_8;
  __m256 mask_7;
  __m256 e_2;
  __m256 invalid_mask_2;
  __m256 one_11;
  __m256i imm0_4;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp_1;
  __m256 pow2n_4;
  __m256 y_6;
  __m256 mask_6;
  __m256 one_10;
  __m256i imm0_3;
  __m256 fx_4;
  __m256 tmp_7;
  __m256 one_13;
  __m256 pow2n_5;
  __m256 y_8;
  __m256 mask_8;
  __m256 one_14;
  __m256i imm0_5;
  __m256 fx_5;
  __m256 tmp_9;
  __m256 one_3;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_2;
  __m256 one_4;
  __m256i imm0_2;
  __m256 fx_1;
  __m256 tmp_3;
  __m128 two_1;
  __m128 one_7;
  __m128 two_3;
  __m128 one_17;
  v4sf y_4;
  v4sf z_1;
  v4sf tmp_5;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_1;
  v4sf y_10;
  v4sf z_3;
  v4sf tmp_11;
  v4sf mask_10;
  v4sf e_3;
  v4sf invalid_mask_3;
  v4sf one_16;
  v4si emm0_4;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_4;
  v4sf pow2n_6;
  v4sf y_9;
  v4sf mask_9;
  v4sf one_15;
  v4si emm0_3;
  v4sf fx_6;
  v4sf tmp_10;
  __m128 one_18;
  v4sf pow2n_7;
  v4sf y_11;
  v4sf mask_11;
  v4sf one_19;
  v4si emm0_5;
  v4sf fx_7;
  v4sf tmp_12;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_2;
  v4sf fx_3;
  v4sf tmp_6;
  undefined4 in_stack_ffffffffffff9730;
  undefined4 in_stack_ffffffffffff9734;
  undefined8 in_stack_ffffffffffff9738;
  int _elempack;
  Mat *in_stack_ffffffffffff9740;
  undefined4 in_stack_ffffffffffff9748;
  undefined4 in_stack_ffffffffffff974c;
  undefined8 local_67b0;
  undefined8 uStack_67a8;
  undefined8 local_67a0;
  undefined8 uStack_6798;
  undefined8 uStack_6790;
  undefined8 uStack_6788;
  int local_676c;
  undefined8 local_6768;
  undefined8 local_6760;
  undefined8 local_6758;
  undefined4 local_6750;
  long local_6748;
  undefined4 local_6740;
  undefined4 local_673c;
  undefined4 local_6738;
  undefined4 local_6734;
  undefined4 local_6730;
  undefined8 local_6728;
  undefined1 (*local_6720) [32];
  int local_6714;
  undefined8 local_6710;
  undefined8 uStack_6708;
  int local_66fc;
  undefined1 (*local_66b0) [16];
  int local_66a4;
  undefined8 local_66a0;
  undefined8 uStack_6698;
  undefined8 uStack_6690;
  undefined8 uStack_6688;
  int local_6674;
  undefined1 (*local_6628) [32];
  int local_6620;
  void *local_6610;
  int *local_6608;
  undefined8 local_6600;
  undefined4 local_65f8;
  long *local_65f0;
  undefined4 local_65e8;
  undefined4 local_65e4;
  undefined4 local_65e0;
  undefined4 local_65dc;
  undefined4 local_65d8;
  undefined8 local_65d0;
  int local_65c8;
  int local_65c4;
  int local_65c0;
  int local_65bc;
  int local_65b8;
  int local_65b4;
  undefined8 local_65b0;
  long *local_65a8;
  int local_6594;
  void **local_6590;
  void **local_6588;
  undefined8 *local_6558;
  undefined1 local_6545;
  int local_6544;
  undefined8 *local_6538;
  undefined8 *local_64e8;
  undefined1 (*local_64d0) [32];
  undefined8 local_64c0;
  undefined8 uStack_64b8;
  undefined8 uStack_64b0;
  undefined8 uStack_64a8;
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 uStack_6470;
  undefined8 uStack_6468;
  undefined1 (*local_6448) [32];
  undefined1 (*local_6410) [32];
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 local_63e0;
  undefined8 uStack_63d8;
  undefined1 (*local_63c8) [32];
  undefined8 *local_6358;
  int local_6300;
  undefined4 local_62fc;
  void **local_62f8;
  void *local_62f0;
  long local_6228;
  undefined4 local_621c;
  long local_6218;
  undefined1 (*local_6210) [32];
  undefined4 local_6204;
  int local_6200;
  int local_61fc;
  undefined8 *local_61f8;
  undefined4 local_61ec;
  long local_61e8;
  float local_61c0;
  float fStack_61bc;
  float fStack_61b8;
  float fStack_61b4;
  float local_61a0;
  float fStack_619c;
  float fStack_6198;
  float fStack_6194;
  float fStack_6190;
  float fStack_618c;
  float fStack_6188;
  undefined4 uStack_6184;
  undefined1 local_6180 [8];
  float fStack_6178;
  float fStack_6174;
  undefined1 local_6160 [8];
  float fStack_6158;
  float fStack_6154;
  float fStack_6150;
  float fStack_614c;
  float fStack_6148;
  undefined4 uStack_6144;
  float local_60e0;
  float fStack_60dc;
  float fStack_60d8;
  float fStack_60d4;
  float fStack_60d0;
  float fStack_60cc;
  float fStack_60c8;
  float local_60c0;
  float fStack_60bc;
  float fStack_60b8;
  float fStack_60b4;
  float fStack_60b0;
  float fStack_60ac;
  float fStack_60a8;
  undefined4 uStack_60a4;
  undefined8 local_60a0;
  undefined8 uStack_6098;
  undefined8 uStack_6090;
  undefined8 uStack_6088;
  undefined8 local_6080;
  undefined8 uStack_6078;
  undefined8 uStack_6070;
  undefined8 uStack_6068;
  undefined8 local_6060;
  undefined8 uStack_6058;
  undefined8 uStack_6050;
  undefined8 uStack_6048;
  undefined8 local_6040;
  undefined8 uStack_6038;
  undefined8 uStack_6030;
  undefined8 uStack_6028;
  undefined8 local_6020;
  undefined8 uStack_6018;
  undefined8 uStack_6010;
  undefined8 uStack_6008;
  undefined1 local_6000 [8];
  float fStack_5ff8;
  float fStack_5ff4;
  float fStack_5ff0;
  float fStack_5fec;
  float fStack_5fe8;
  undefined4 uStack_5fe4;
  undefined1 local_5f80 [8];
  float fStack_5f78;
  float fStack_5f74;
  undefined8 uStack_5f70;
  undefined8 uStack_5f68;
  undefined1 local_5f00 [8];
  float fStack_5ef8;
  float fStack_5ef4;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  float local_5e80;
  float fStack_5e7c;
  float fStack_5e78;
  float fStack_5e74;
  undefined1 local_5e20 [8];
  undefined8 uStack_5e18;
  undefined8 uStack_5e10;
  undefined8 uStack_5e08;
  float local_5e00;
  float fStack_5dfc;
  float fStack_5df8;
  float fStack_5df4;
  float fStack_5df0;
  float fStack_5dec;
  float fStack_5de8;
  float fStack_5de4;
  undefined1 local_5de0 [32];
  undefined1 local_5dc0 [32];
  undefined1 local_5da0 [8];
  undefined8 uStack_5d98;
  undefined8 uStack_5d90;
  undefined8 uStack_5d88;
  undefined1 local_5d80 [32];
  undefined4 local_5d60;
  undefined4 uStack_5d5c;
  undefined4 uStack_5d58;
  undefined4 uStack_5d54;
  undefined4 uStack_5d50;
  undefined4 uStack_5d4c;
  undefined4 uStack_5d48;
  undefined4 uStack_5d44;
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [8];
  undefined8 uStack_5d18;
  undefined8 uStack_5d10;
  undefined8 uStack_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined8 local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  ulong uStack_5cc8;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined8 local_5c20;
  undefined8 uStack_5c18;
  undefined8 uStack_5c10;
  undefined8 uStack_5c08;
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  float local_5b80;
  float fStack_5b7c;
  float fStack_5b78;
  float fStack_5b74;
  float local_5b40;
  float fStack_5b3c;
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  float fStack_5b24;
  float local_5b20;
  float fStack_5b1c;
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  float fStack_5b04;
  float local_5ae0;
  float fStack_5adc;
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  float fStack_5ac4;
  float local_5ac0;
  float fStack_5abc;
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  float fStack_5aa4;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  undefined1 local_5a20 [32];
  undefined1 local_59c0 [16];
  undefined8 uStack_59b0;
  undefined8 uStack_59a8;
  undefined1 local_5980 [8];
  float fStack_5978;
  float fStack_5974;
  float local_5940;
  float fStack_593c;
  float fStack_5938;
  float fStack_5934;
  float fStack_5930;
  float fStack_592c;
  float fStack_5928;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  undefined1 local_5860 [8];
  undefined8 uStack_5858;
  undefined8 uStack_5850;
  undefined8 uStack_5848;
  undefined1 local_5840 [32];
  undefined4 local_5820;
  undefined4 uStack_581c;
  undefined4 uStack_5818;
  undefined4 uStack_5814;
  undefined4 uStack_5810;
  undefined4 uStack_580c;
  undefined4 uStack_5808;
  undefined4 uStack_5804;
  undefined1 local_5800 [32];
  undefined1 local_57e0 [32];
  undefined1 local_57c0 [8];
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined1 local_57a0 [32];
  undefined8 local_5780;
  undefined8 uStack_5778;
  undefined8 uStack_5770;
  undefined8 uStack_5768;
  undefined8 local_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  undefined8 local_5740;
  undefined8 uStack_5738;
  undefined8 uStack_5730;
  undefined8 uStack_5728;
  undefined8 local_5720;
  undefined8 uStack_5718;
  undefined8 uStack_5710;
  undefined8 uStack_5708;
  undefined8 local_5700;
  undefined8 uStack_56f8;
  undefined8 uStack_56f0;
  undefined8 uStack_56e8;
  undefined8 local_56e0;
  undefined8 uStack_56d8;
  undefined8 uStack_56d0;
  undefined8 uStack_56c8;
  undefined4 local_56b8;
  undefined4 local_56b4;
  undefined4 local_56a4;
  undefined8 local_56a0;
  undefined8 uStack_5698;
  undefined8 uStack_5690;
  undefined8 uStack_5688;
  undefined8 local_5680;
  undefined8 uStack_5678;
  undefined8 uStack_5670;
  undefined8 uStack_5668;
  undefined1 local_5660 [32];
  undefined8 local_55e0;
  undefined8 uStack_55d8;
  undefined8 uStack_55d0;
  undefined8 uStack_55c8;
  float local_55c0;
  float fStack_55bc;
  float fStack_55b8;
  float fStack_55b4;
  float fStack_55b0;
  float fStack_55ac;
  float fStack_55a8;
  undefined4 uStack_55a4;
  undefined8 local_55a0;
  undefined8 uStack_5598;
  undefined8 uStack_5590;
  undefined8 uStack_5588;
  float local_5580;
  float fStack_557c;
  float fStack_5578;
  float fStack_5574;
  float fStack_5570;
  float fStack_556c;
  float fStack_5568;
  float fStack_5564;
  undefined8 local_5560;
  undefined8 uStack_5558;
  undefined8 uStack_5550;
  undefined8 uStack_5548;
  undefined1 local_5540 [8];
  undefined8 uStack_5538;
  undefined8 uStack_5530;
  undefined8 uStack_5528;
  undefined1 local_5520 [32];
  undefined4 local_5500;
  undefined4 uStack_54fc;
  undefined4 uStack_54f8;
  undefined4 uStack_54f4;
  undefined4 uStack_54f0;
  undefined4 uStack_54ec;
  undefined4 uStack_54e8;
  undefined4 uStack_54e4;
  undefined1 local_54e0 [32];
  undefined1 local_54c0 [32];
  undefined1 local_54a0 [8];
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  undefined1 local_5480 [32];
  undefined8 local_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 local_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 local_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined4 local_5384;
  float local_5380;
  float fStack_537c;
  float fStack_5378;
  float fStack_5374;
  float fStack_5370;
  float fStack_536c;
  float fStack_5368;
  float fStack_5364;
  undefined1 local_52e0 [32];
  undefined1 local_5280 [16];
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  undefined1 local_5240 [8];
  float fStack_5238;
  float fStack_5234;
  float local_5200;
  float fStack_51fc;
  float fStack_51f8;
  float fStack_51f4;
  float fStack_51f0;
  float fStack_51ec;
  float fStack_51e8;
  float local_51a0;
  float fStack_519c;
  float fStack_5198;
  float fStack_5194;
  float local_5160;
  float fStack_515c;
  float fStack_5158;
  float fStack_5154;
  float local_50e0;
  float fStack_50dc;
  float fStack_50d8;
  float fStack_50d4;
  float fStack_50d0;
  float fStack_50cc;
  float fStack_50c8;
  float fStack_50c4;
  float local_50c0;
  float fStack_50bc;
  float fStack_50b8;
  float fStack_50b4;
  float fStack_50b0;
  float fStack_50ac;
  float fStack_50a8;
  float fStack_50a4;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined1 local_4f20 [32];
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  undefined8 local_4ee0;
  undefined8 uStack_4ed8;
  undefined8 uStack_4ed0;
  undefined8 uStack_4ec8;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined4 local_4ce0;
  undefined4 uStack_4cdc;
  undefined4 uStack_4cd8;
  undefined4 uStack_4cd4;
  undefined4 uStack_4cd0;
  undefined4 uStack_4ccc;
  undefined4 uStack_4cc8;
  undefined4 uStack_4cc4;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined4 local_4ca0;
  undefined4 uStack_4c9c;
  undefined4 uStack_4c98;
  undefined4 uStack_4c94;
  undefined4 uStack_4c90;
  undefined4 uStack_4c8c;
  undefined4 uStack_4c88;
  undefined4 uStack_4c84;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined4 local_4c20;
  undefined4 uStack_4c1c;
  undefined4 uStack_4c18;
  undefined4 uStack_4c14;
  undefined4 uStack_4c10;
  undefined4 uStack_4c0c;
  undefined4 uStack_4c08;
  undefined4 uStack_4c04;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined4 local_4b84;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  undefined8 local_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined8 local_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  undefined8 local_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined4 local_4960;
  undefined4 uStack_495c;
  undefined4 uStack_4958;
  undefined4 uStack_4954;
  undefined4 uStack_4950;
  undefined4 uStack_494c;
  undefined4 uStack_4948;
  undefined4 uStack_4944;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 local_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined4 local_4820;
  undefined4 uStack_481c;
  undefined4 uStack_4818;
  undefined4 uStack_4814;
  undefined4 uStack_4810;
  undefined4 uStack_480c;
  undefined4 uStack_4808;
  undefined4 uStack_4804;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  undefined8 local_4760;
  undefined8 uStack_4758;
  undefined8 uStack_4750;
  undefined8 uStack_4748;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  undefined8 local_46e0;
  undefined8 uStack_46d8;
  undefined8 uStack_46d0;
  undefined8 uStack_46c8;
  undefined1 *local_45f0;
  undefined1 *local_45e8;
  undefined1 *local_45e0;
  float *local_45d8;
  undefined1 *local_45d0;
  undefined1 *local_45c8;
  float *local_45c0;
  undefined1 *local_45b8;
  undefined1 *local_45b0;
  float *local_45a8;
  undefined1 *local_45a0;
  undefined1 *local_4598;
  float *local_4590;
  undefined1 *local_4588;
  undefined1 *local_4580;
  float *local_4578;
  undefined1 *local_4570;
  undefined1 *local_4568;
  float *local_4560;
  float *local_4558;
  undefined1 *local_4550;
  undefined1 *local_4548;
  undefined1 *local_4540;
  undefined1 *local_4538;
  float *local_4530;
  undefined1 *local_4528;
  undefined1 *local_4520;
  float *local_4518;
  undefined1 *local_4510;
  undefined1 *local_4508;
  float *local_4500;
  undefined1 *local_44f8;
  undefined1 *local_44f0;
  float *local_44e8;
  undefined1 *local_44e0;
  undefined1 *local_44d8;
  float *local_44d0;
  undefined1 *local_44c8;
  undefined1 *local_44c0;
  float *local_44b8;
  float *local_44b0;
  undefined1 *local_44a8;
  undefined1 *local_43f8;
  float *local_43f0;
  undefined1 *local_43e8;
  undefined1 *local_43e0;
  float *local_43d8;
  undefined1 *local_43d0;
  float *local_43c8;
  undefined1 *local_43c0;
  undefined1 *local_43b8;
  float *local_43b0;
  undefined1 *local_43a8;
  undefined1 *local_43a0;
  float *local_4398;
  undefined1 *local_4390;
  undefined1 *local_4388;
  float *local_4380;
  undefined1 *local_4378;
  undefined1 *local_4370;
  float *local_4368;
  undefined1 *local_4360;
  undefined1 *local_4358;
  float *local_4350;
  undefined1 *local_4348;
  undefined1 *local_4340;
  float *local_4338;
  undefined1 *local_4330;
  undefined1 *local_4328;
  float *local_4320;
  undefined1 *local_4318;
  undefined1 *local_4310;
  undefined1 *local_41e8;
  float *local_41e0;
  undefined1 *local_41d8;
  undefined1 *local_41d0;
  float *local_41c8;
  undefined1 *local_41c0;
  undefined1 *local_41b8;
  float *local_41b0;
  undefined1 *local_41a8;
  undefined1 *local_41a0;
  float *local_4198;
  undefined1 *local_4190;
  undefined1 *local_4158;
  float *local_4150;
  float *local_4148;
  undefined4 local_40e4;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  float local_3c80 [2];
  float afStack_3c78 [2];
  float afStack_3c70 [2];
  float afStack_3c68 [2];
  undefined8 local_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  float local_3c20 [2];
  float afStack_3c18 [2];
  float afStack_3c10 [2];
  float afStack_3c08 [2];
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  float local_3bc0 [2];
  float afStack_3bb8 [2];
  float afStack_3bb0 [2];
  float afStack_3ba8 [2];
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  float local_3b60 [2];
  float afStack_3b58 [2];
  float afStack_3b50 [2];
  float afStack_3b48 [2];
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  float local_3b00 [2];
  float afStack_3af8 [2];
  float afStack_3af0 [2];
  float afStack_3ae8 [2];
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  float local_3aa0 [2];
  float afStack_3a98 [2];
  float afStack_3a90 [2];
  float afStack_3a88 [2];
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  float local_3a40 [2];
  float afStack_3a38 [2];
  float afStack_3a30 [2];
  float afStack_3a28 [2];
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  float local_39e0 [2];
  float afStack_39d8 [2];
  float afStack_39d0 [2];
  float afStack_39c8 [2];
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  ulong uStack_3968;
  float local_3960 [2];
  float afStack_3958 [2];
  float afStack_3950 [2];
  float afStack_3948 [2];
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  float local_3900 [2];
  float afStack_38f8 [2];
  float afStack_38f0 [2];
  float afStack_38e8 [2];
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  float local_3620 [2];
  float afStack_3618 [2];
  float afStack_3610 [2];
  float afStack_3608 [2];
  float local_3600 [2];
  float afStack_35f8 [2];
  float afStack_35f0 [2];
  float afStack_35e8 [2];
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  float local_35c0 [2];
  float afStack_35b8 [2];
  float afStack_35b0 [2];
  float afStack_35a8 [2];
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  float local_3560 [2];
  float afStack_3558 [2];
  float afStack_3550 [2];
  float afStack_3548 [2];
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  float local_3500 [2];
  float afStack_34f8 [2];
  float afStack_34f0 [2];
  float afStack_34e8 [2];
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  float local_34a0 [2];
  float afStack_3498 [2];
  float afStack_3490 [2];
  float afStack_3488 [2];
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  float local_3440 [2];
  float afStack_3438 [2];
  float afStack_3430 [2];
  float afStack_3428 [2];
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  float local_3380 [2];
  float afStack_3378 [2];
  float afStack_3370 [2];
  float afStack_3368 [2];
  float local_3360 [2];
  float afStack_3358 [2];
  float afStack_3350 [2];
  float afStack_3348 [2];
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  float local_3320 [2];
  float afStack_3318 [2];
  float afStack_3310 [2];
  float afStack_3308 [2];
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  float local_32c0 [2];
  float afStack_32b8 [2];
  float afStack_32b0 [2];
  float afStack_32a8 [2];
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  float local_3260 [2];
  float afStack_3258 [2];
  float afStack_3250 [2];
  float afStack_3248 [2];
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  float local_3200 [2];
  float afStack_31f8 [2];
  float afStack_31f0 [2];
  float afStack_31e8 [2];
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  float local_31a0 [2];
  float afStack_3198 [2];
  float afStack_3190 [2];
  float afStack_3188 [2];
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  float local_2dc0 [2];
  float afStack_2db8 [2];
  float afStack_2db0 [2];
  float afStack_2da8 [2];
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  float local_2ca0 [2];
  float afStack_2c98 [2];
  float afStack_2c90 [2];
  float afStack_2c88 [2];
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  float local_2c40 [2];
  float afStack_2c38 [2];
  float afStack_2c30 [2];
  float afStack_2c28 [2];
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  float local_2be0 [2];
  float afStack_2bd8 [2];
  float afStack_2bd0 [2];
  float afStack_2bc8 [2];
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  float local_2b80 [2];
  float afStack_2b78 [2];
  float afStack_2b70 [2];
  float afStack_2b68 [2];
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined4 local_2a40;
  undefined4 uStack_2a3c;
  undefined4 uStack_2a38;
  undefined4 uStack_2a34;
  undefined4 uStack_2a30;
  undefined4 uStack_2a2c;
  undefined4 uStack_2a28;
  undefined4 uStack_2a24;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined4 local_2a00;
  undefined4 uStack_29fc;
  undefined4 uStack_29f8;
  undefined4 uStack_29f4;
  undefined4 uStack_29f0;
  undefined4 uStack_29ec;
  undefined4 uStack_29e8;
  undefined4 uStack_29e4;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  float local_2980;
  float fStack_297c;
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  float fStack_2964;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  float local_2920;
  float fStack_291c;
  float fStack_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  float fStack_2908;
  float fStack_2904;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined4 local_27a4;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined4 local_2764;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined4 local_2524;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined4 local_24e4;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined1 local_2440 [16];
  undefined1 auStack_2430 [16];
  undefined4 local_2420;
  undefined4 local_241c;
  undefined4 local_2418;
  undefined4 local_2414;
  undefined4 local_2410;
  undefined4 local_240c;
  undefined4 local_2408;
  undefined4 local_2404;
  undefined1 local_2400 [16];
  undefined1 auStack_23f0 [16];
  undefined4 local_23e0;
  undefined4 local_23dc;
  undefined4 local_23d8;
  undefined4 local_23d4;
  undefined4 local_23d0;
  undefined4 local_23cc;
  undefined4 local_23c8;
  undefined4 local_23c4;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined1 local_2300 [16];
  undefined1 auStack_22f0 [16];
  undefined4 local_22e0;
  undefined4 local_22dc;
  undefined4 local_22d8;
  undefined4 local_22d4;
  undefined4 local_22d0;
  undefined4 local_22cc;
  undefined4 local_22c8;
  undefined4 local_22c4;
  undefined1 local_22c0 [16];
  undefined1 auStack_22b0 [16];
  undefined4 local_22a0;
  undefined4 local_229c;
  undefined4 local_2298;
  undefined4 local_2294;
  undefined4 local_2290;
  undefined4 local_228c;
  undefined4 local_2288;
  undefined4 local_2284;
  float local_2280;
  float fStack_227c;
  float fStack_2278;
  float fStack_2274;
  float local_2270;
  float fStack_226c;
  float fStack_2268;
  float fStack_2264;
  undefined1 local_2260 [8];
  float fStack_2258;
  float fStack_2254;
  undefined1 local_2250 [8];
  float fStack_2248;
  float fStack_2244;
  float local_2200;
  float fStack_21fc;
  float fStack_21f8;
  float fStack_21f4;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  undefined8 local_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 local_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined1 local_2190 [8];
  float fStack_2188;
  float fStack_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 local_2170;
  undefined8 uStack_2168;
  undefined1 local_2160 [8];
  float fStack_2158;
  float fStack_2154;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined1 local_20e0 [8];
  undefined8 uStack_20d8;
  float local_20a0;
  float fStack_209c;
  float fStack_2098;
  float fStack_2094;
  undefined1 local_2070 [8];
  undefined8 uStack_2068;
  float local_2060;
  float fStack_205c;
  float fStack_2058;
  float fStack_2054;
  undefined1 local_2050 [16];
  undefined1 local_2040 [16];
  undefined1 local_2030 [8];
  undefined8 uStack_2028;
  undefined1 local_2020 [16];
  undefined4 local_2010;
  undefined4 uStack_200c;
  undefined4 uStack_2008;
  undefined4 uStack_2004;
  undefined1 local_2000 [16];
  undefined1 local_1ff0 [8];
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 local_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 local_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 local_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 local_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 local_1f30;
  undefined8 uStack_1f28;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float local_1f00;
  float fStack_1efc;
  float fStack_1ef8;
  float fStack_1ef4;
  float local_1ef0;
  float fStack_1eec;
  float fStack_1ee8;
  float fStack_1ee4;
  float local_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 local_1e90;
  undefined8 uStack_1e88;
  undefined1 local_1e70 [16];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 local_1e30;
  undefined8 uStack_1e28;
  undefined1 local_1e20 [8];
  float fStack_1e18;
  float fStack_1e14;
  float local_1e00;
  float fStack_1dfc;
  float fStack_1df8;
  float fStack_1df4;
  float local_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  float local_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float fStack_1da4;
  float local_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined1 local_1d50 [8];
  undefined8 uStack_1d48;
  undefined1 local_1d40 [16];
  undefined4 local_1d30;
  undefined4 uStack_1d2c;
  undefined4 uStack_1d28;
  undefined4 uStack_1d24;
  undefined1 local_1d20 [16];
  undefined1 local_1d10 [8];
  undefined8 uStack_1d08;
  undefined1 local_1d00 [8];
  undefined8 uStack_1cf8;
  undefined1 local_1cf0 [16];
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 local_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 local_1cb0;
  undefined8 uStack_1ca8;
  undefined4 local_1ca0;
  undefined4 uStack_1c9c;
  undefined4 uStack_1c98;
  undefined4 uStack_1c94;
  undefined8 local_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 local_1c70;
  undefined8 uStack_1c68;
  undefined4 local_1c60;
  undefined4 uStack_1c5c;
  undefined4 uStack_1c58;
  undefined4 uStack_1c54;
  undefined8 local_1c50;
  undefined8 uStack_1c48;
  undefined4 local_1c40;
  undefined4 uStack_1c3c;
  undefined4 uStack_1c38;
  undefined4 uStack_1c34;
  undefined4 local_1c24;
  undefined4 local_1c20;
  undefined4 uStack_1c1c;
  undefined4 uStack_1c18;
  undefined4 uStack_1c14;
  undefined4 local_1c04;
  undefined4 local_1ba0;
  undefined4 uStack_1b9c;
  undefined4 uStack_1b98;
  undefined4 uStack_1b94;
  undefined4 local_1b84;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 local_1b70;
  undefined8 uStack_1b68;
  undefined1 local_1b40 [16];
  undefined8 local_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 local_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined1 local_1ab0 [16];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  float local_1a70;
  float fStack_1a6c;
  float fStack_1a68;
  float fStack_1a64;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined1 local_1a50 [16];
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined1 local_1a30 [8];
  undefined8 uStack_1a28;
  undefined1 local_1a20 [16];
  undefined4 local_1a10;
  undefined4 uStack_1a0c;
  undefined4 uStack_1a08;
  undefined4 uStack_1a04;
  undefined1 local_1a00 [16];
  undefined1 local_19f0 [8];
  undefined8 uStack_19e8;
  undefined1 local_19e0 [8];
  undefined8 uStack_19d8;
  undefined1 local_19d0 [16];
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined1 local_19b0 [16];
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 local_1990;
  undefined8 uStack_1988;
  undefined4 local_1980;
  undefined4 uStack_197c;
  undefined4 uStack_1978;
  undefined4 uStack_1974;
  undefined8 local_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 local_1950;
  undefined8 uStack_1948;
  undefined4 local_1940;
  undefined4 uStack_193c;
  undefined4 uStack_1938;
  undefined4 uStack_1934;
  undefined8 local_1930;
  undefined8 uStack_1928;
  undefined4 local_1920;
  undefined4 uStack_191c;
  undefined4 uStack_1918;
  undefined4 uStack_1914;
  undefined4 local_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 local_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 local_18d0;
  undefined8 uStack_18c8;
  undefined1 local_1870 [16];
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 local_1830;
  undefined8 uStack_1828;
  undefined1 local_1820 [8];
  float fStack_1818;
  float fStack_1814;
  float local_1800;
  float fStack_17fc;
  float fStack_17f8;
  float fStack_17f4;
  float local_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  float local_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  float local_16e0;
  float fStack_16dc;
  float fStack_16d8;
  float fStack_16d4;
  undefined1 local_16d0 [16];
  undefined1 local_16a0 [16];
  undefined1 local_1690 [16];
  undefined1 local_1680 [16];
  undefined1 local_1660 [16];
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 local_1630;
  undefined8 uStack_1628;
  undefined4 local_15e0;
  undefined4 uStack_15dc;
  undefined4 uStack_15d8;
  undefined4 uStack_15d4;
  undefined8 local_15d0;
  undefined8 uStack_15c8;
  undefined4 local_15c0;
  undefined4 uStack_15bc;
  undefined4 uStack_15b8;
  undefined4 uStack_15b4;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  undefined4 local_1580;
  undefined4 uStack_157c;
  undefined4 uStack_1578;
  undefined4 uStack_1574;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined4 local_1534;
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined4 local_1420;
  undefined4 uStack_141c;
  undefined4 uStack_1418;
  undefined4 uStack_1414;
  undefined8 local_1410;
  undefined8 uStack_1408;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 local_1390;
  undefined8 uStack_1388;
  undefined4 local_1380;
  undefined4 uStack_137c;
  undefined4 uStack_1378;
  undefined4 uStack_1374;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined4 local_1280;
  undefined4 uStack_127c;
  undefined4 uStack_1278;
  undefined4 uStack_1274;
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined1 *local_11b0;
  undefined1 *local_11a8;
  undefined1 *local_11a0;
  float *local_1198;
  undefined1 *local_1190;
  undefined1 *local_1188;
  float *local_1180;
  undefined1 *local_1178;
  undefined1 *local_1170;
  float *local_1168;
  undefined1 *local_1160;
  undefined1 *local_1158;
  float *local_1150;
  undefined1 *local_1148;
  undefined1 *local_1140;
  float *local_1138;
  undefined1 *local_1130;
  undefined1 *local_1128;
  undefined1 *local_1120;
  undefined1 *local_1118;
  undefined1 *local_1110;
  float *local_1108;
  undefined1 *local_1100;
  undefined1 *local_10f8;
  float *local_10f0;
  undefined1 *local_10e8;
  undefined1 *local_10e0;
  float *local_10d8;
  undefined1 *local_10d0;
  undefined1 *local_10c8;
  float *local_10c0;
  undefined1 *local_10b8;
  undefined1 *local_10b0;
  float *local_10a8;
  undefined1 *local_10a0;
  undefined1 *local_1098;
  undefined1 *local_1000;
  float *local_ff8;
  undefined1 *local_ff0;
  undefined1 *local_fe8;
  float *local_fe0;
  undefined1 *local_fd8;
  float *local_fd0;
  undefined1 *local_fc8;
  undefined1 *local_fc0;
  float *local_fb8;
  undefined1 *local_fb0;
  undefined1 *local_fa8;
  float *local_fa0;
  undefined1 *local_f98;
  undefined1 *local_f90;
  float *local_f88;
  undefined1 *local_f80;
  undefined1 *local_f78;
  float *local_f70;
  undefined1 *local_f68;
  undefined1 *local_f60;
  float *local_f58;
  undefined1 *local_f50;
  undefined1 *local_f48;
  float *local_f40;
  undefined1 *local_f38;
  undefined1 *local_f30;
  float *local_f28;
  undefined1 *local_f20;
  undefined1 *local_f18;
  undefined1 *local_df0;
  float *local_de8;
  undefined1 *local_de0;
  undefined1 *local_dd8;
  float *local_dd0;
  undefined1 *local_dc8;
  undefined1 *local_dc0;
  float *local_db8;
  undefined1 *local_db0;
  undefined1 *local_da8;
  float *local_da0;
  undefined1 *local_d98;
  undefined1 *local_d60;
  float *local_d58;
  float *local_d50;
  float local_b50 [2];
  float afStack_b48 [2];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  float local_b20 [2];
  float afStack_b18 [2];
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  float local_af0 [2];
  float afStack_ae8 [2];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  float local_ac0 [2];
  float afStack_ab8 [2];
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  float local_a90 [2];
  float afStack_a88 [2];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  float local_a60 [2];
  float afStack_a58 [2];
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  float local_a30 [2];
  float afStack_a28 [2];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  float local_a00 [2];
  float afStack_9f8 [2];
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  float local_9c0 [2];
  float afStack_9b8 [2];
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  float local_990 [2];
  float afStack_988 [2];
  undefined8 local_980;
  undefined8 uStack_978;
  float local_850 [2];
  float afStack_848 [2];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  float local_820 [2];
  float afStack_818 [2];
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  float local_7f0 [2];
  float afStack_7e8 [2];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  float local_7c0 [2];
  float afStack_7b8 [2];
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  float local_790 [2];
  float afStack_788 [2];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  float local_730 [2];
  float afStack_728 [2];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  float local_700 [2];
  float afStack_6f8 [2];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  float local_6d0 [2];
  float afStack_6c8 [2];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  float local_6a0 [2];
  float afStack_698 [2];
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  float local_670 [2];
  float afStack_668 [2];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  float local_4b0 [2];
  float afStack_4a8 [2];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_430;
  undefined8 uStack_428;
  float local_420 [2];
  float afStack_418 [2];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  float local_3f0 [2];
  float afStack_3e8 [2];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  float local_3c0 [2];
  float afStack_3b8 [2];
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_390 [2];
  float afStack_388 [2];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined4 local_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  
  _elempack = (int)((ulong)in_stack_ffffffffffff9738 >> 0x20);
  local_65b4 = *(int *)((long)in_RSI + 0x2c);
  local_65b8 = (int)in_RSI[6];
  local_65bc = *(int *)((long)in_RSI + 0x34);
  local_65c0 = (int)in_RSI[7];
  local_65c4 = local_65b4 * local_65b8 * local_65bc;
  local_65c8 = (int)in_RSI[3];
  if (local_65c8 == 0x10) {
    local_6590 = &local_6610;
    local_6610 = (void *)0x0;
    local_6608 = (int *)0x0;
    local_6600 = 0;
    local_65f8 = 0;
    local_65f0 = (long *)0x0;
    local_65e8 = 0;
    local_65e4 = 0;
    local_65e0 = 0;
    local_65dc = 0;
    local_65d8 = 0;
    local_65d0 = 0;
    local_65b0 = in_RDX;
    convert_packing((Mat *)CONCAT44(in_stack_ffffffffffff974c,in_stack_ffffffffffff9748),
                    in_stack_ffffffffffff9740,_elempack,
                    (Option *)CONCAT44(in_stack_ffffffffffff9734,in_stack_ffffffffffff9730));
    (**(code **)*in_RDI)(in_RDI,&local_6610,local_65b0);
    convert_packing((Mat *)CONCAT44(in_stack_ffffffffffff974c,in_stack_ffffffffffff9748),
                    in_stack_ffffffffffff9740,_elempack,
                    (Option *)CONCAT44(in_stack_ffffffffffff9734,in_stack_ffffffffffff9730));
    local_6594 = 0;
    local_6588 = &local_6610;
    if (local_6608 != (int *)0x0) {
      local_62fc = 0xffffffff;
      LOCK();
      local_6300 = *local_6608;
      *local_6608 = *local_6608 + -1;
      UNLOCK();
      if (local_6300 == 1) {
        local_62f8 = local_6588;
        if (local_65f0 == (long *)0x0) {
          local_62f0 = local_6610;
          if (local_6610 != (void *)0x0) {
            free(local_6610);
          }
        }
        else {
          (**(code **)(*local_65f0 + 0x18))(local_65f0,local_6610);
        }
      }
    }
  }
  else if (local_65c8 == 8) {
    for (local_6620 = 0; local_6620 < local_65c0; local_6620 = local_6620 + 1) {
      local_6628 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_6620 * in_RSI[2]);
      for (local_6674 = 0; local_6674 < local_65c4; local_6674 = local_6674 + 1) {
        auVar118._8_4_ = 0x42b0c0a5;
        auVar118._0_8_ = 0x42b0c0a542b0c0a5;
        auVar118._12_4_ = 0x42b0c0a5;
        auVar118._16_4_ = 0x42b0c0a5;
        auVar118._20_4_ = 0x42b0c0a5;
        auVar118._24_4_ = 0x42b0c0a5;
        auVar118._28_4_ = 0x42b0c0a5;
        auVar4 = vminps_avx(*local_6628,auVar118);
        auVar41._8_4_ = 0xc2b0c0a5;
        auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar41._12_4_ = 0xc2b0c0a5;
        auVar41._16_4_ = 0xc2b0c0a5;
        auVar41._20_4_ = 0xc2b0c0a5;
        auVar41._24_4_ = 0xc2b0c0a5;
        auVar41._28_4_ = 0xc2b0c0a5;
        auVar237 = vmaxps_avx(auVar4,auVar41);
        auVar79._8_4_ = 1.442695;
        auVar79._12_4_ = 1.442695;
        auVar79._0_4_ = 1.442695;
        auVar79._4_4_ = 1.442695;
        auVar79._16_4_ = 1.442695;
        auVar79._20_4_ = 1.442695;
        auVar79._24_4_ = 1.442695;
        auVar79._28_4_ = 1.442695;
        auVar78._8_4_ = 0.5;
        auVar78._12_4_ = 0.5;
        auVar78._0_4_ = 0.5;
        auVar78._4_4_ = 0.5;
        auVar78._16_4_ = 0.5;
        auVar78._20_4_ = 0.5;
        auVar78._24_4_ = 0.5;
        auVar78._28_4_ = 0.5;
        auVar7 = vfmadd213ps_fma(auVar79,auVar237,auVar78);
        auVar5 = vroundps_avx(ZEXT1632(auVar7),1);
        auVar4 = vcmpps_avx(ZEXT1632(auVar7),auVar5,1);
        auVar49._8_8_ = 0x3f8000003f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._16_8_ = 0x3f8000003f800000;
        auVar49._24_8_ = 0x3f8000003f800000;
        auVar4 = vpand_avx2(auVar4,auVar49);
        auVar4 = vsubps_avx(auVar5,auVar4);
        auVar107._8_4_ = 0.6933594;
        auVar107._12_4_ = 0.6933594;
        auVar107._0_4_ = 0.6933594;
        auVar107._4_4_ = 0.6933594;
        auVar107._16_4_ = 0.6933594;
        auVar107._20_4_ = 0.6933594;
        auVar107._24_4_ = 0.6933594;
        auVar107._28_4_ = 0.6933594;
        auVar7 = vfnmadd213ps_fma(auVar107,auVar4,auVar237);
        auVar108._8_4_ = -0.00021219444;
        auVar108._12_4_ = -0.00021219444;
        auVar108._0_4_ = -0.00021219444;
        auVar108._4_4_ = -0.00021219444;
        auVar108._16_4_ = -0.00021219444;
        auVar108._20_4_ = -0.00021219444;
        auVar108._24_4_ = -0.00021219444;
        auVar108._28_4_ = -0.00021219444;
        auVar7 = vfnmadd213ps_fma(auVar108,auVar4,ZEXT1632(auVar7));
        auVar237 = ZEXT1632(auVar7);
        local_58e0 = auVar7._0_4_;
        fStack_58dc = auVar7._4_4_;
        fStack_58d8 = auVar7._8_4_;
        fStack_58d4 = auVar7._12_4_;
        _local_5980 = ZEXT1632(CONCAT412(fStack_58d4 * fStack_58d4,
                                         CONCAT48(fStack_58d8 * fStack_58d8,
                                                  CONCAT44(fStack_58dc * fStack_58dc,
                                                           local_58e0 * local_58e0))));
        local_5a20._8_4_ = 0x39506967;
        local_5a20._0_8_ = 0x3950696739506967;
        local_5a20._12_4_ = 0x39506967;
        local_5a20._16_4_ = 0x39506967;
        local_5a20._20_4_ = 0x39506967;
        local_5a20._24_4_ = 0x39506967;
        local_5a20._28_4_ = 0x39506967;
        auVar80._8_4_ = 0.0013981999;
        auVar80._12_4_ = 0.0013981999;
        auVar80._0_4_ = 0.0013981999;
        auVar80._4_4_ = 0.0013981999;
        auVar80._16_4_ = 0.0013981999;
        auVar80._20_4_ = 0.0013981999;
        auVar80._24_4_ = 0.0013981999;
        auVar80._28_4_ = 0.0013981999;
        auVar7 = vfmadd213ps_fma(auVar237,local_5a20,auVar80);
        auVar81._8_4_ = 0.008333452;
        auVar81._12_4_ = 0.008333452;
        auVar81._0_4_ = 0.008333452;
        auVar81._4_4_ = 0.008333452;
        auVar81._16_4_ = 0.008333452;
        auVar81._20_4_ = 0.008333452;
        auVar81._24_4_ = 0.008333452;
        auVar81._28_4_ = 0.008333452;
        auVar7 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar7),auVar81);
        auVar82._8_4_ = 0.041665796;
        auVar82._12_4_ = 0.041665796;
        auVar82._0_4_ = 0.041665796;
        auVar82._4_4_ = 0.041665796;
        auVar82._16_4_ = 0.041665796;
        auVar82._20_4_ = 0.041665796;
        auVar82._24_4_ = 0.041665796;
        auVar82._28_4_ = 0.041665796;
        auVar7 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar7),auVar82);
        auVar83._8_4_ = 0.16666666;
        auVar83._12_4_ = 0.16666666;
        auVar83._0_4_ = 0.16666666;
        auVar83._4_4_ = 0.16666666;
        auVar83._16_4_ = 0.16666666;
        auVar83._20_4_ = 0.16666666;
        auVar83._24_4_ = 0.16666666;
        auVar83._28_4_ = 0.16666666;
        auVar7 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar7),auVar83);
        auVar84._8_4_ = 0.5;
        auVar84._12_4_ = 0.5;
        auVar84._0_4_ = 0.5;
        auVar84._4_4_ = 0.5;
        auVar84._16_4_ = 0.5;
        auVar84._20_4_ = 0.5;
        auVar84._24_4_ = 0.5;
        auVar84._28_4_ = 0.5;
        auVar7 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar7),auVar84);
        auVar7 = vfmadd213ps_fma(_local_5980,ZEXT1632(auVar7),auVar237);
        local_58a0 = auVar7._0_4_;
        fStack_589c = auVar7._4_4_;
        fStack_5898 = auVar7._8_4_;
        fStack_5894 = auVar7._12_4_;
        local_2920 = auVar4._0_4_;
        fStack_291c = auVar4._4_4_;
        fStack_2918 = auVar4._8_4_;
        fStack_2914 = auVar4._12_4_;
        fStack_2910 = auVar4._16_4_;
        fStack_290c = auVar4._20_4_;
        fStack_2908 = auVar4._24_4_;
        fStack_2904 = auVar4._28_4_;
        local_59c0._4_4_ = (int)fStack_291c;
        local_59c0._0_4_ = (int)local_2920;
        local_59c0._8_4_ = (int)fStack_2918;
        local_59c0._12_4_ = (int)fStack_2914;
        uStack_59b0._0_4_ = (int)fStack_2910;
        uStack_59b0._4_4_ = (int)fStack_290c;
        uStack_59a8._0_4_ = (int)fStack_2908;
        uStack_59a8._4_4_ = (int)fStack_2904;
        auVar4 = _local_59c0;
        uStack_59a8 = auVar4._24_8_;
        auVar120._16_8_ = uStack_59b0;
        auVar120._0_16_ = local_59c0;
        auVar120._24_8_ = uStack_59a8;
        auVar119._8_8_ = 0x7f0000007f;
        auVar119._0_8_ = 0x7f0000007f;
        auVar119._16_8_ = 0x7f0000007f;
        auVar119._24_8_ = 0x7f0000007f;
        auVar4 = vpaddd_avx2(auVar119,auVar120);
        auVar4 = vpslld_avx2(auVar4,ZEXT416(0x17));
        local_5940 = auVar4._0_4_;
        fStack_593c = auVar4._4_4_;
        fStack_5938 = auVar4._8_4_;
        fStack_5934 = auVar4._12_4_;
        fStack_5930 = auVar4._16_4_;
        fStack_592c = auVar4._20_4_;
        fStack_5928 = auVar4._24_4_;
        auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        local_5ac0 = auVar7._0_4_;
        fStack_5abc = auVar7._4_4_;
        fStack_5ab8 = auVar7._8_4_;
        fStack_5ab4 = auVar7._12_4_;
        fStack_5ab0 = auVar1._0_4_;
        fStack_5aac = auVar1._4_4_;
        fStack_5aa8 = auVar1._8_4_;
        fStack_5aa4 = auVar1._12_4_;
        local_5f00._4_4_ = fStack_5abc + fStack_593c * (fStack_589c + 1.0);
        local_5f00._0_4_ = local_5ac0 + local_5940 * (local_58a0 + 1.0);
        fStack_5ef8 = fStack_5ab8 + fStack_5938 * (fStack_5898 + 1.0);
        fStack_5ef4 = fStack_5ab4 + fStack_5934 * (fStack_5894 + 1.0);
        uStack_5ef0._0_4_ = fStack_5ab0 + fStack_5930 * 1.0;
        uStack_5ef0._4_4_ = fStack_5aac + fStack_592c * 1.0;
        uStack_5ee8._0_4_ = fStack_5aa8 + fStack_5928 * 1.0;
        uStack_5ee8._4_4_ = fStack_5aa4 + 1.0;
        auVar237 = _local_5f00;
        auVar4 = vcmpps_avx(_local_5f00,ZEXT1632(ZEXT816(0)),2);
        uStack_5ee8 = auVar237._24_8_;
        auVar45._16_8_ = uStack_5ef0;
        auVar45._0_16_ = _local_5f00;
        auVar45._24_8_ = uStack_5ee8;
        auVar44._8_4_ = 0x800000;
        auVar44._0_8_ = 0x80000000800000;
        auVar44._12_4_ = 0x800000;
        auVar44._16_4_ = 0x800000;
        auVar44._20_4_ = 0x800000;
        auVar44._24_4_ = 0x800000;
        auVar44._28_4_ = 0x800000;
        auVar237 = vmaxps_avx(auVar44,auVar45);
        auVar6 = vpsrld_avx2(auVar237,ZEXT416(0x17));
        auVar53._8_4_ = 0x807fffff;
        auVar53._0_8_ = 0x807fffff807fffff;
        auVar53._12_4_ = 0x807fffff;
        auVar53._16_4_ = 0x807fffff;
        auVar53._20_4_ = 0x807fffff;
        auVar53._24_4_ = 0x807fffff;
        auVar53._28_4_ = 0x807fffff;
        auVar237 = vpand_avx2(auVar53,auVar237);
        auVar55._8_4_ = 0x3f000000;
        auVar55._0_8_ = 0x3f0000003f000000;
        auVar55._12_4_ = 0x3f000000;
        auVar55._16_4_ = 0x3f000000;
        auVar55._20_4_ = 0x3f000000;
        auVar55._24_4_ = 0x3f000000;
        auVar55._28_4_ = 0x3f000000;
        auVar5 = vpor_avx2(auVar55,auVar237);
        auVar56._8_8_ = 0x7f0000007f;
        auVar56._0_8_ = 0x7f0000007f;
        auVar56._16_8_ = 0x7f0000007f;
        auVar56._24_8_ = 0x7f0000007f;
        auVar237 = vpsubd_avx2(auVar6,auVar56);
        auVar237 = vcvtdq2ps_avx(auVar237);
        local_5ae0 = auVar237._0_4_;
        fStack_5adc = auVar237._4_4_;
        fStack_5ad8 = auVar237._8_4_;
        fStack_5ad4 = auVar237._12_4_;
        fStack_5ad0 = auVar237._16_4_;
        fStack_5acc = auVar237._20_4_;
        fStack_5ac8 = auVar237._24_4_;
        fStack_5ac4 = auVar237._28_4_;
        local_5f80._4_4_ = fStack_5adc + 1.0;
        local_5f80._0_4_ = local_5ae0 + 1.0;
        fStack_5f78 = fStack_5ad8 + 1.0;
        fStack_5f74 = fStack_5ad4 + 1.0;
        uStack_5f70._0_4_ = fStack_5ad0 + 1.0;
        uStack_5f70._4_4_ = fStack_5acc + 1.0;
        uStack_5f68._0_4_ = fStack_5ac8 + 1.0;
        uStack_5f68._4_4_ = fStack_5ac4 + 1.0;
        auVar31 = _local_5f80;
        auVar246._8_4_ = 0x3f3504f3;
        auVar246._0_8_ = 0x3f3504f33f3504f3;
        auVar246._12_4_ = 0x3f3504f3;
        auVar246._16_4_ = 0x3f3504f3;
        auVar246._20_4_ = 0x3f3504f3;
        auVar246._24_4_ = 0x3f3504f3;
        auVar246._28_4_ = 0x3f3504f3;
        auVar237 = vcmpps_avx(auVar5,auVar246,1);
        auVar6 = vpand_avx2(auVar237,auVar5);
        auVar37._8_8_ = 0x3f8000003f800000;
        auVar37._0_8_ = 0x3f8000003f800000;
        auVar37._16_8_ = 0x3f8000003f800000;
        auVar37._24_8_ = 0x3f8000003f800000;
        auVar5 = vsubps_avx(auVar5,auVar37);
        uStack_5f68 = auVar31._24_8_;
        auVar52._8_8_ = 0x3f8000003f800000;
        auVar52._0_8_ = 0x3f8000003f800000;
        auVar52._16_8_ = 0x3f8000003f800000;
        auVar52._24_8_ = 0x3f8000003f800000;
        auVar237 = vpand_avx2(auVar237,auVar52);
        auVar36._16_8_ = uStack_5f70;
        auVar36._0_16_ = _local_5f80;
        auVar36._24_8_ = uStack_5f68;
        auVar237 = vsubps_avx(auVar36,auVar237);
        local_5b20 = auVar5._0_4_;
        fStack_5b1c = auVar5._4_4_;
        fStack_5b18 = auVar5._8_4_;
        fStack_5b14 = auVar5._12_4_;
        fStack_5b10 = auVar5._16_4_;
        fStack_5b0c = auVar5._20_4_;
        fStack_5b08 = auVar5._24_4_;
        fStack_5b04 = auVar5._28_4_;
        local_5b40 = auVar6._0_4_;
        fStack_5b3c = auVar6._4_4_;
        fStack_5b38 = auVar6._8_4_;
        fStack_5b34 = auVar6._12_4_;
        fStack_5b30 = auVar6._16_4_;
        fStack_5b2c = auVar6._20_4_;
        fStack_5b28 = auVar6._24_4_;
        fStack_5b24 = auVar6._28_4_;
        local_5f00._0_4_ = local_5b40 + local_5b20;
        local_5f00._4_4_ = fStack_5b3c + fStack_5b1c;
        fStack_5ef8 = fStack_5b38 + fStack_5b18;
        fStack_5ef4 = fStack_5b34 + fStack_5b14;
        uStack_5ef0._0_4_ = fStack_5b30 + fStack_5b10;
        uStack_5ef0._4_4_ = fStack_5b2c + fStack_5b0c;
        uStack_5ee8._0_4_ = fStack_5b28 + fStack_5b08;
        uStack_5ee8._4_4_ = fStack_5b24 + fStack_5b04;
        fStack_5ff8 = 0.070376836;
        local_6000 = (undefined1  [8])0x3d9021bb3d9021bb;
        fStack_5ff4 = 0.070376836;
        fStack_5ff0 = 0.070376836;
        fStack_5fec = 0.070376836;
        fStack_5fe8 = 0.070376836;
        uStack_5fe4 = 0x3d9021bb;
        auVar58._8_4_ = -0.1151461;
        auVar58._12_4_ = -0.1151461;
        auVar58._0_4_ = -0.1151461;
        auVar58._4_4_ = -0.1151461;
        auVar58._16_4_ = -0.1151461;
        auVar58._20_4_ = -0.1151461;
        auVar58._24_4_ = -0.1151461;
        auVar58._28_4_ = -0.1151461;
        auVar7 = vfmadd213ps_fma(_local_5f00,_local_6000,auVar58);
        auVar59._8_4_ = 0.116769984;
        auVar59._12_4_ = 0.116769984;
        auVar59._0_4_ = 0.116769984;
        auVar59._4_4_ = 0.116769984;
        auVar59._16_4_ = 0.116769984;
        auVar59._20_4_ = 0.116769984;
        auVar59._24_4_ = 0.116769984;
        auVar59._28_4_ = 0.116769984;
        auVar7 = vfmadd213ps_fma(_local_5f00,ZEXT1632(auVar7),auVar59);
        auVar60._8_4_ = -0.12420141;
        auVar60._12_4_ = -0.12420141;
        auVar60._0_4_ = -0.12420141;
        auVar60._4_4_ = -0.12420141;
        auVar60._16_4_ = -0.12420141;
        auVar60._20_4_ = -0.12420141;
        auVar60._24_4_ = -0.12420141;
        auVar60._28_4_ = -0.12420141;
        auVar7 = vfmadd213ps_fma(_local_5f00,ZEXT1632(auVar7),auVar60);
        auVar61._8_4_ = 0.14249323;
        auVar61._12_4_ = 0.14249323;
        auVar61._0_4_ = 0.14249323;
        auVar61._4_4_ = 0.14249323;
        auVar61._16_4_ = 0.14249323;
        auVar61._20_4_ = 0.14249323;
        auVar61._24_4_ = 0.14249323;
        auVar61._28_4_ = 0.14249323;
        auVar7 = vfmadd213ps_fma(_local_5f00,ZEXT1632(auVar7),auVar61);
        auVar62._8_4_ = -0.16668057;
        auVar62._12_4_ = -0.16668057;
        auVar62._0_4_ = -0.16668057;
        auVar62._4_4_ = -0.16668057;
        auVar62._16_4_ = -0.16668057;
        auVar62._20_4_ = -0.16668057;
        auVar62._24_4_ = -0.16668057;
        auVar62._28_4_ = -0.16668057;
        auVar7 = vfmadd213ps_fma(_local_5f00,ZEXT1632(auVar7),auVar62);
        auVar63._8_4_ = 0.20000714;
        auVar63._12_4_ = 0.20000714;
        auVar63._0_4_ = 0.20000714;
        auVar63._4_4_ = 0.20000714;
        auVar63._16_4_ = 0.20000714;
        auVar63._20_4_ = 0.20000714;
        auVar63._24_4_ = 0.20000714;
        auVar63._28_4_ = 0.20000714;
        auVar7 = vfmadd213ps_fma(_local_5f00,ZEXT1632(auVar7),auVar63);
        auVar64._8_4_ = -0.24999994;
        auVar64._12_4_ = -0.24999994;
        auVar64._0_4_ = -0.24999994;
        auVar64._4_4_ = -0.24999994;
        auVar64._16_4_ = -0.24999994;
        auVar64._20_4_ = -0.24999994;
        auVar64._24_4_ = -0.24999994;
        auVar64._28_4_ = -0.24999994;
        auVar7 = vfmadd213ps_fma(_local_5f00,ZEXT1632(auVar7),auVar64);
        auVar65._8_4_ = 0.3333333;
        auVar65._12_4_ = 0.3333333;
        auVar65._0_4_ = 0.3333333;
        auVar65._4_4_ = 0.3333333;
        auVar65._16_4_ = 0.3333333;
        auVar65._20_4_ = 0.3333333;
        auVar65._24_4_ = 0.3333333;
        auVar65._28_4_ = 0.3333333;
        auVar7 = vfmadd213ps_fma(_local_5f00,ZEXT1632(auVar7),auVar65);
        local_5e80 = auVar7._0_4_;
        fStack_5e7c = auVar7._4_4_;
        fStack_5e78 = auVar7._8_4_;
        fStack_5e74 = auVar7._12_4_;
        local_6000._4_4_ =
             (float)local_5f00._4_4_ * (float)local_5f00._4_4_ *
             (float)local_5f00._4_4_ * fStack_5e7c;
        local_6000._0_4_ =
             (float)local_5f00._0_4_ * (float)local_5f00._0_4_ *
             (float)local_5f00._0_4_ * local_5e80;
        fStack_5ff8 = fStack_5ef8 * fStack_5ef8 * fStack_5ef8 * fStack_5e78;
        fStack_5ff4 = fStack_5ef4 * fStack_5ef4 * fStack_5ef4 * fStack_5e74;
        fStack_5ff0 = (float)uStack_5ef0 * (float)uStack_5ef0 * (float)uStack_5ef0 * 0.0;
        fStack_5fec = uStack_5ef0._4_4_ * uStack_5ef0._4_4_ * uStack_5ef0._4_4_ * 0.0;
        fStack_5fe8 = (float)uStack_5ee8 * (float)uStack_5ee8 * (float)uStack_5ee8 * 0.0;
        uStack_5fe4 = 0;
        auVar66._8_4_ = -0.00021219444;
        auVar66._12_4_ = -0.00021219444;
        auVar66._0_4_ = -0.00021219444;
        auVar66._4_4_ = -0.00021219444;
        auVar66._16_4_ = -0.00021219444;
        auVar66._20_4_ = -0.00021219444;
        auVar66._24_4_ = -0.00021219444;
        auVar66._28_4_ = -0.00021219444;
        auVar7 = vfmadd213ps_fma(auVar66,auVar237,_local_6000);
        auVar230._4_4_ = (float)local_5f00._4_4_ * (float)local_5f00._4_4_;
        auVar230._0_4_ = (float)local_5f00._0_4_ * (float)local_5f00._0_4_;
        auVar230._8_4_ = fStack_5ef8 * fStack_5ef8;
        auVar230._12_4_ = fStack_5ef4 * fStack_5ef4;
        auVar230._16_4_ = (float)uStack_5ef0 * (float)uStack_5ef0;
        auVar230._20_4_ = uStack_5ef0._4_4_ * uStack_5ef0._4_4_;
        auVar230._24_4_ = (float)uStack_5ee8 * (float)uStack_5ee8;
        auVar230._28_4_ = uStack_5ee8._4_4_;
        auVar105._8_4_ = 0.5;
        auVar105._12_4_ = 0.5;
        auVar105._0_4_ = 0.5;
        auVar105._4_4_ = 0.5;
        auVar105._16_4_ = 0.5;
        auVar105._20_4_ = 0.5;
        auVar105._24_4_ = 0.5;
        auVar105._28_4_ = 0.5;
        auVar7 = vfnmadd213ps_fma(auVar105,auVar230,ZEXT1632(auVar7));
        local_5b80 = auVar7._0_4_;
        fStack_5b7c = auVar7._4_4_;
        fStack_5b78 = auVar7._8_4_;
        fStack_5b74 = auVar7._12_4_;
        local_5f00._4_4_ = fStack_5b7c + (float)local_5f00._4_4_;
        local_5f00._0_4_ = local_5b80 + (float)local_5f00._0_4_;
        fStack_5ef8 = fStack_5b78 + fStack_5ef8;
        fStack_5ef4 = fStack_5b74 + fStack_5ef4;
        uStack_5ef0._0_4_ = (float)uStack_5ef0 + 0.0;
        uStack_5ef0._4_4_ = uStack_5ef0._4_4_ + 0.0;
        uStack_5ee8._0_4_ = (float)uStack_5ee8 + 0.0;
        uStack_5ee8._4_4_ = uStack_5ee8._4_4_ + 0.0;
        auVar67._8_4_ = 0.6933594;
        auVar67._12_4_ = 0.6933594;
        auVar67._0_4_ = 0.6933594;
        auVar67._4_4_ = 0.6933594;
        auVar67._16_4_ = 0.6933594;
        auVar67._20_4_ = 0.6933594;
        auVar67._24_4_ = 0.6933594;
        auVar67._28_4_ = 0.6933594;
        auVar7 = vfmadd213ps_fma(auVar67,auVar237,_local_5f00);
        auVar4 = vpor_avx2(auVar4,ZEXT1632(auVar7));
        auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        uStack_2370 = auVar1._0_8_;
        uStack_2368 = auVar1._8_8_;
        auVar1 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        uStack_2330 = auVar2._0_8_;
        uStack_2328 = auVar2._8_8_;
        local_60c0 = auVar4._0_4_;
        fStack_60bc = auVar4._4_4_;
        fStack_60b8 = auVar4._8_4_;
        fStack_60b4 = auVar4._12_4_;
        fStack_60b0 = auVar4._16_4_;
        fStack_60ac = auVar4._20_4_;
        fStack_60a8 = auVar4._24_4_;
        uStack_60a4 = auVar4._28_4_;
        local_60e0 = auVar1._0_4_;
        fStack_60dc = auVar1._4_4_;
        fStack_60d8 = auVar1._8_4_;
        fStack_60d4 = auVar1._12_4_;
        fStack_60d0 = auVar2._0_4_;
        fStack_60cc = auVar2._4_4_;
        fStack_60c8 = auVar2._8_4_;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
        local_5380 = auVar2._0_4_;
        fStack_537c = auVar2._4_4_;
        fStack_5378 = auVar2._8_4_;
        fStack_5374 = auVar2._12_4_;
        fStack_5370 = auVar3._0_4_;
        fStack_536c = auVar3._4_4_;
        fStack_5368 = auVar3._8_4_;
        fStack_5364 = auVar3._12_4_;
        auVar33._4_4_ = fStack_60dc * fStack_60bc;
        auVar33._0_4_ = local_60e0 * local_60c0;
        auVar33._12_4_ = fStack_60d4 * fStack_60b4;
        auVar33._8_4_ = fStack_60d8 * fStack_60b8;
        auVar33._20_4_ = fStack_60cc * fStack_60ac;
        auVar33._16_4_ = fStack_60d0 * fStack_60b0;
        auVar33._28_4_ = uStack_60a4;
        auVar33._24_4_ = fStack_60c8 * fStack_60a8;
        auVar4 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar33);
        auVar115._8_4_ = 0x42b0c0a5;
        auVar115._0_8_ = 0x42b0c0a542b0c0a5;
        auVar115._12_4_ = 0x42b0c0a5;
        auVar115._16_4_ = 0x42b0c0a5;
        auVar115._20_4_ = 0x42b0c0a5;
        auVar115._24_4_ = 0x42b0c0a5;
        auVar115._28_4_ = 0x42b0c0a5;
        auVar4 = vminps_avx(auVar4,auVar115);
        auVar38._8_4_ = 0xc2b0c0a5;
        auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar38._12_4_ = 0xc2b0c0a5;
        auVar38._16_4_ = 0xc2b0c0a5;
        auVar38._20_4_ = 0xc2b0c0a5;
        auVar38._24_4_ = 0xc2b0c0a5;
        auVar38._28_4_ = 0xc2b0c0a5;
        auVar237 = vmaxps_avx(auVar4,auVar38);
        auVar99._8_4_ = 1.442695;
        auVar99._12_4_ = 1.442695;
        auVar99._0_4_ = 1.442695;
        auVar99._4_4_ = 1.442695;
        auVar99._16_4_ = 1.442695;
        auVar99._20_4_ = 1.442695;
        auVar99._24_4_ = 1.442695;
        auVar99._28_4_ = 1.442695;
        auVar98._8_4_ = 0.5;
        auVar98._12_4_ = 0.5;
        auVar98._0_4_ = 0.5;
        auVar98._4_4_ = 0.5;
        auVar98._16_4_ = 0.5;
        auVar98._20_4_ = 0.5;
        auVar98._24_4_ = 0.5;
        auVar98._28_4_ = 0.5;
        auVar3 = vfmadd213ps_fma(auVar99,auVar237,auVar98);
        auVar5 = vroundps_avx(ZEXT1632(auVar3),1);
        auVar4 = vcmpps_avx(ZEXT1632(auVar3),auVar5,1);
        auVar46._8_8_ = 0x3f8000003f800000;
        auVar46._0_8_ = 0x3f8000003f800000;
        auVar46._16_8_ = 0x3f8000003f800000;
        auVar46._24_8_ = 0x3f8000003f800000;
        auVar4 = vpand_avx2(auVar4,auVar46);
        auVar4 = vsubps_avx(auVar5,auVar4);
        auVar113._8_4_ = 0.6933594;
        auVar113._12_4_ = 0.6933594;
        auVar113._0_4_ = 0.6933594;
        auVar113._4_4_ = 0.6933594;
        auVar113._16_4_ = 0.6933594;
        auVar113._20_4_ = 0.6933594;
        auVar113._24_4_ = 0.6933594;
        auVar113._28_4_ = 0.6933594;
        auVar3 = vfnmadd213ps_fma(auVar113,auVar4,auVar237);
        auVar114._8_4_ = -0.00021219444;
        auVar114._12_4_ = -0.00021219444;
        auVar114._0_4_ = -0.00021219444;
        auVar114._4_4_ = -0.00021219444;
        auVar114._16_4_ = -0.00021219444;
        auVar114._20_4_ = -0.00021219444;
        auVar114._24_4_ = -0.00021219444;
        auVar114._28_4_ = -0.00021219444;
        auVar3 = vfnmadd213ps_fma(auVar114,auVar4,ZEXT1632(auVar3));
        auVar237 = ZEXT1632(auVar3);
        local_51a0 = auVar3._0_4_;
        fStack_519c = auVar3._4_4_;
        fStack_5198 = auVar3._8_4_;
        fStack_5194 = auVar3._12_4_;
        _local_5240 = ZEXT1632(CONCAT412(fStack_5194 * fStack_5194,
                                         CONCAT48(fStack_5198 * fStack_5198,
                                                  CONCAT44(fStack_519c * fStack_519c,
                                                           local_51a0 * local_51a0))));
        local_52e0._8_4_ = 0x39506967;
        local_52e0._0_8_ = 0x3950696739506967;
        local_52e0._12_4_ = 0x39506967;
        local_52e0._16_4_ = 0x39506967;
        local_52e0._20_4_ = 0x39506967;
        local_52e0._24_4_ = 0x39506967;
        local_52e0._28_4_ = 0x39506967;
        auVar100._8_4_ = 0.0013981999;
        auVar100._12_4_ = 0.0013981999;
        auVar100._0_4_ = 0.0013981999;
        auVar100._4_4_ = 0.0013981999;
        auVar100._16_4_ = 0.0013981999;
        auVar100._20_4_ = 0.0013981999;
        auVar100._24_4_ = 0.0013981999;
        auVar100._28_4_ = 0.0013981999;
        auVar3 = vfmadd213ps_fma(auVar237,local_52e0,auVar100);
        auVar101._8_4_ = 0.008333452;
        auVar101._12_4_ = 0.008333452;
        auVar101._0_4_ = 0.008333452;
        auVar101._4_4_ = 0.008333452;
        auVar101._16_4_ = 0.008333452;
        auVar101._20_4_ = 0.008333452;
        auVar101._24_4_ = 0.008333452;
        auVar101._28_4_ = 0.008333452;
        auVar3 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar3),auVar101);
        auVar102._8_4_ = 0.041665796;
        auVar102._12_4_ = 0.041665796;
        auVar102._0_4_ = 0.041665796;
        auVar102._4_4_ = 0.041665796;
        auVar102._16_4_ = 0.041665796;
        auVar102._20_4_ = 0.041665796;
        auVar102._24_4_ = 0.041665796;
        auVar102._28_4_ = 0.041665796;
        auVar3 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar3),auVar102);
        auVar103._8_4_ = 0.16666666;
        auVar103._12_4_ = 0.16666666;
        auVar103._0_4_ = 0.16666666;
        auVar103._4_4_ = 0.16666666;
        auVar103._16_4_ = 0.16666666;
        auVar103._20_4_ = 0.16666666;
        auVar103._24_4_ = 0.16666666;
        auVar103._28_4_ = 0.16666666;
        auVar3 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar3),auVar103);
        auVar104._8_4_ = 0.5;
        auVar104._12_4_ = 0.5;
        auVar104._0_4_ = 0.5;
        auVar104._4_4_ = 0.5;
        auVar104._16_4_ = 0.5;
        auVar104._20_4_ = 0.5;
        auVar104._24_4_ = 0.5;
        auVar104._28_4_ = 0.5;
        auVar3 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar3),auVar104);
        auVar3 = vfmadd213ps_fma(_local_5240,ZEXT1632(auVar3),auVar237);
        local_5160 = auVar3._0_4_;
        fStack_515c = auVar3._4_4_;
        fStack_5158 = auVar3._8_4_;
        fStack_5154 = auVar3._12_4_;
        local_2980 = auVar4._0_4_;
        fStack_297c = auVar4._4_4_;
        fStack_2978 = auVar4._8_4_;
        fStack_2974 = auVar4._12_4_;
        fStack_2970 = auVar4._16_4_;
        fStack_296c = auVar4._20_4_;
        fStack_2968 = auVar4._24_4_;
        fStack_2964 = auVar4._28_4_;
        local_5280._4_4_ = (int)fStack_297c;
        local_5280._0_4_ = (int)local_2980;
        local_5280._8_4_ = (int)fStack_2978;
        local_5280._12_4_ = (int)fStack_2974;
        uStack_5270._0_4_ = (int)fStack_2970;
        uStack_5270._4_4_ = (int)fStack_296c;
        uStack_5268._0_4_ = (int)fStack_2968;
        uStack_5268._4_4_ = (int)fStack_2964;
        auVar4 = _local_5280;
        uStack_5268 = auVar4._24_8_;
        auVar126._16_8_ = uStack_5270;
        auVar126._0_16_ = local_5280;
        auVar126._24_8_ = uStack_5268;
        auVar125._8_8_ = 0x7f0000007f;
        auVar125._0_8_ = 0x7f0000007f;
        auVar125._16_8_ = 0x7f0000007f;
        auVar125._24_8_ = 0x7f0000007f;
        auVar4 = vpaddd_avx2(auVar126,auVar125);
        auVar4 = vpslld_avx2(auVar4,ZEXT416(0x17));
        local_5200 = auVar4._0_4_;
        fStack_51fc = auVar4._4_4_;
        fStack_51f8 = auVar4._8_4_;
        fStack_51f4 = auVar4._12_4_;
        fStack_51f0 = auVar4._16_4_;
        fStack_51ec = auVar4._20_4_;
        fStack_51e8 = auVar4._24_4_;
        auVar30._16_4_ = fStack_5370;
        auVar30._0_16_ = auVar2;
        auVar30._20_4_ = fStack_536c;
        auVar30._24_4_ = fStack_5368;
        auVar30._28_4_ = fStack_5364;
        auVar29._4_4_ = fStack_537c + (fStack_515c + 1.0) * fStack_51fc;
        auVar29._0_4_ = local_5380 + (local_5160 + 1.0) * local_5200;
        auVar29._8_4_ = fStack_5378 + (fStack_5158 + 1.0) * fStack_51f8;
        auVar29._12_4_ = fStack_5374 + (fStack_5154 + 1.0) * fStack_51f4;
        auVar29._16_4_ = fStack_5370 + fStack_51f0 * 1.0;
        auVar29._20_4_ = fStack_536c + fStack_51ec * 1.0;
        auVar29._24_4_ = fStack_5368 + fStack_51e8 * 1.0;
        auVar29._28_4_ = fStack_5364 + 1.0;
        auVar4 = vrcpps_avx(auVar29);
        auVar8._4_4_ = fStack_537c * auVar4._4_4_;
        auVar8._0_4_ = local_5380 * auVar4._0_4_;
        auVar8._8_4_ = fStack_5378 * auVar4._8_4_;
        auVar8._12_4_ = fStack_5374 * auVar4._12_4_;
        auVar8._16_4_ = fStack_5370 * auVar4._16_4_;
        auVar8._20_4_ = fStack_536c * auVar4._20_4_;
        auVar8._24_4_ = fStack_5368 * auVar4._24_4_;
        auVar8._28_4_ = fStack_5364;
        auVar2 = vfmsub213ps_fma(auVar8,auVar29,auVar30);
        auVar2 = vfnmadd213ps_fma(ZEXT1632(auVar2),auVar4,auVar8);
        auVar28._16_8_ = uStack_2330;
        auVar28._0_16_ = auVar1;
        auVar28._24_8_ = uStack_2328;
        auVar27._16_8_ = uStack_2370;
        auVar27._0_16_ = auVar7;
        auVar27._24_8_ = uStack_2368;
        auVar243._8_4_ = 0x80000000;
        auVar243._0_8_ = 0x8000000080000000;
        auVar243._12_4_ = 0x80000000;
        auVar243._16_4_ = 0x80000000;
        auVar243._20_4_ = 0x80000000;
        auVar243._24_4_ = 0x80000000;
        auVar243._28_4_ = 0x80000000;
        auVar7 = vfmadd213ps_fma(auVar28,ZEXT1632(auVar2),auVar27 ^ auVar243);
        local_61a0 = (float)*(undefined8 *)*local_6628;
        fStack_619c = (float)((ulong)*(undefined8 *)*local_6628 >> 0x20);
        fStack_6198 = (float)*(undefined8 *)(*local_6628 + 8);
        fStack_6194 = (float)((ulong)*(undefined8 *)(*local_6628 + 8) >> 0x20);
        fStack_6190 = (float)*(undefined8 *)(*local_6628 + 0x10);
        fStack_618c = (float)((ulong)*(undefined8 *)(*local_6628 + 0x10) >> 0x20);
        fStack_6188 = (float)*(undefined8 *)(*local_6628 + 0x18);
        uStack_6184 = (undefined4)((ulong)*(undefined8 *)(*local_6628 + 0x18) >> 0x20);
        local_61c0 = auVar7._0_4_;
        fStack_61bc = auVar7._4_4_;
        fStack_61b8 = auVar7._8_4_;
        fStack_61b4 = auVar7._12_4_;
        local_66a0 = CONCAT44(fStack_619c * fStack_61bc,local_61a0 * local_61c0);
        uStack_6698 = CONCAT44(fStack_6194 * fStack_61b4,fStack_6198 * fStack_61b8);
        uStack_6690 = CONCAT44(fStack_618c * 0.0,fStack_6190 * 0.0);
        uStack_6688 = CONCAT44(uStack_6184,fStack_6188 * 0.0);
        auVar25._8_8_ = uStack_6698;
        auVar25._0_8_ = local_66a0;
        auVar25._16_8_ = uStack_6690;
        auVar25._24_8_ = uStack_6688;
        *local_6628 = auVar25;
        local_6628 = local_6628 + 1;
      }
    }
    local_6594 = 0;
  }
  else if (local_65c8 == 4) {
    for (local_66a4 = 0; local_66a4 < local_65c0; local_66a4 = local_66a4 + 1) {
      local_66b0 = (undefined1 (*) [16])(*in_RSI + in_RSI[8] * (long)local_66a4 * in_RSI[2]);
      for (local_66fc = 0; local_66fc < local_65c4; local_66fc = local_66fc + 1) {
        auVar216._8_4_ = 0x42b0c0a5;
        auVar216._0_8_ = 0x42b0c0a542b0c0a5;
        auVar216._12_4_ = 0x42b0c0a5;
        auVar7 = vminps_avx(*local_66b0,auVar216);
        auVar140._8_4_ = 0xc2b0c0a5;
        auVar140._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar140._12_4_ = 0xc2b0c0a5;
        auVar2 = vmaxps_avx(auVar7,auVar140);
        local_1db0 = auVar2._0_4_;
        fStack_1dac = auVar2._4_4_;
        fStack_1da8 = auVar2._8_4_;
        fStack_1da4 = auVar2._12_4_;
        fVar236 = local_1db0 * 1.442695 + 0.5;
        fVar239 = fStack_1dac * 1.442695 + 0.5;
        fVar240 = fStack_1da8 * 1.442695 + 0.5;
        fVar241 = fStack_1da4 * 1.442695 + 0.5;
        local_1e30 = CONCAT44(fVar239,fVar236);
        uStack_1e28._0_4_ = fVar240;
        uStack_1e28._4_4_ = fVar241;
        local_1e40 = CONCAT44((int)fVar239,(int)fVar236);
        uStack_1e38._0_4_ = (int)fVar240;
        uStack_1e38._4_4_ = (int)fVar241;
        auVar160._8_8_ = uStack_1e38;
        auVar160._0_8_ = local_1e40;
        auVar1 = vcvtdq2ps_avx(auVar160);
        auVar220._8_8_ = uStack_1e28;
        auVar220._0_8_ = local_1e30;
        auVar7 = vcmpps_avx(auVar220,auVar1,1);
        auVar148._8_8_ = 0x3f8000003f800000;
        auVar148._0_8_ = 0x3f8000003f800000;
        auVar7 = vpand_avx(auVar7,auVar148);
        auVar7 = vsubps_avx(auVar1,auVar7);
        auVar205._8_4_ = 0.6933594;
        auVar205._12_4_ = 0.6933594;
        auVar205._0_4_ = 0.6933594;
        auVar205._4_4_ = 0.6933594;
        auVar1 = vfnmadd213ps_fma(auVar205,auVar7,auVar2);
        auVar206._8_4_ = -0.00021219444;
        auVar206._12_4_ = -0.00021219444;
        auVar206._0_4_ = -0.00021219444;
        auVar206._4_4_ = -0.00021219444;
        auVar2 = vfnmadd213ps_fma(auVar206,auVar7,auVar1);
        local_1dd0 = auVar2._0_4_;
        fStack_1dcc = auVar2._4_4_;
        fStack_1dc8 = auVar2._8_4_;
        fStack_1dc4 = auVar2._12_4_;
        local_1e20._4_4_ = fStack_1dcc * fStack_1dcc;
        local_1e20._0_4_ = local_1dd0 * local_1dd0;
        fStack_1e18 = fStack_1dc8 * fStack_1dc8;
        fStack_1e14 = fStack_1dc4 * fStack_1dc4;
        local_1e70._8_4_ = 0x39506967;
        local_1e70._0_8_ = 0x3950696739506967;
        local_1e70._12_4_ = 0x39506967;
        auVar183._8_4_ = 0.0013981999;
        auVar183._12_4_ = 0.0013981999;
        auVar183._0_4_ = 0.0013981999;
        auVar183._4_4_ = 0.0013981999;
        auVar1 = vfmadd213ps_fma(auVar2,local_1e70,auVar183);
        auVar184._8_4_ = 0.008333452;
        auVar184._12_4_ = 0.008333452;
        auVar184._0_4_ = 0.008333452;
        auVar184._4_4_ = 0.008333452;
        auVar1 = vfmadd213ps_fma(auVar2,auVar1,auVar184);
        auVar185._8_4_ = 0.041665796;
        auVar185._12_4_ = 0.041665796;
        auVar185._0_4_ = 0.041665796;
        auVar185._4_4_ = 0.041665796;
        auVar1 = vfmadd213ps_fma(auVar2,auVar1,auVar185);
        auVar186._8_4_ = 0.16666666;
        auVar186._12_4_ = 0.16666666;
        auVar186._0_4_ = 0.16666666;
        auVar186._4_4_ = 0.16666666;
        auVar1 = vfmadd213ps_fma(auVar2,auVar1,auVar186);
        auVar187._8_4_ = 0.5;
        auVar187._12_4_ = 0.5;
        auVar187._0_4_ = 0.5;
        auVar187._4_4_ = 0.5;
        auVar1 = vfmadd213ps_fma(auVar2,auVar1,auVar187);
        auVar1 = vfmadd213ps_fma(_local_1e20,auVar1,auVar2);
        local_1d90 = auVar1._0_4_;
        fStack_1d8c = auVar1._4_4_;
        fStack_1d88 = auVar1._8_4_;
        fStack_1d84 = auVar1._12_4_;
        local_230 = auVar7._0_4_;
        fStack_22c = auVar7._4_4_;
        fStack_228 = auVar7._8_4_;
        fStack_224 = auVar7._12_4_;
        local_1e40 = CONCAT44((int)fStack_22c,(int)local_230);
        uStack_1e38._0_4_ = (int)fStack_228;
        uStack_1e38._4_4_ = (int)fStack_224;
        auVar228._8_8_ = uStack_1e38;
        auVar228._0_8_ = local_1e40;
        auVar227._8_8_ = 0x7f0000007f;
        auVar227._0_8_ = 0x7f0000007f;
        auVar7 = vpaddd_avx(auVar228,auVar227);
        auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
        local_1e00 = auVar7._0_4_;
        fStack_1dfc = auVar7._4_4_;
        fStack_1df8 = auVar7._8_4_;
        fStack_1df4 = auVar7._12_4_;
        local_20e0._4_4_ = (fStack_1d8c + 1.0) * fStack_1dfc + 1.0;
        local_20e0._0_4_ = (local_1d90 + 1.0) * local_1e00 + 1.0;
        uStack_20d8._0_4_ = (fStack_1d88 + 1.0) * fStack_1df8 + 1.0;
        uStack_20d8._4_4_ = (fStack_1d84 + 1.0) * fStack_1df4 + 1.0;
        auVar136._8_8_ = uStack_20d8;
        auVar136._0_8_ = local_20e0;
        auVar7 = vcmpps_avx(auVar136,ZEXT816(0),2);
        auVar144._8_8_ = uStack_20d8;
        auVar144._0_8_ = local_20e0;
        auVar143._8_4_ = 0x800000;
        auVar143._0_8_ = 0x80000000800000;
        auVar143._12_4_ = 0x800000;
        auVar1 = vmaxps_avx(auVar144,auVar143);
        auVar2 = vpsrld_avx(auVar1,ZEXT416(0x17));
        auVar152._8_4_ = 0x807fffff;
        auVar152._0_8_ = 0x807fffff807fffff;
        auVar152._12_4_ = 0x807fffff;
        auVar1 = vpand_avx(auVar1,auVar152);
        auVar154._8_4_ = 0x3f000000;
        auVar154._0_8_ = 0x3f0000003f000000;
        auVar154._12_4_ = 0x3f000000;
        auVar3 = vpor_avx(auVar1,auVar154);
        auVar156._8_8_ = 0x7f0000007f;
        auVar156._0_8_ = 0x7f0000007f;
        auVar1 = vpsubd_avx(auVar2,auVar156);
        auVar1 = vcvtdq2ps_avx(auVar1);
        local_1ed0 = auVar1._0_4_;
        fStack_1ecc = auVar1._4_4_;
        fStack_1ec8 = auVar1._8_4_;
        fStack_1ec4 = auVar1._12_4_;
        local_2120 = CONCAT44(fStack_1ecc + 1.0,local_1ed0 + 1.0);
        uStack_2118._0_4_ = fStack_1ec8 + 1.0;
        uStack_2118._4_4_ = fStack_1ec4 + 1.0;
        auVar162._8_4_ = 0x3f3504f3;
        auVar162._0_8_ = 0x3f3504f33f3504f3;
        auVar162._12_4_ = 0x3f3504f3;
        auVar1 = vcmpps_avx(auVar3,auVar162,1);
        auVar2 = vpand_avx(auVar3,auVar1);
        auVar128._8_8_ = 0x3f8000003f800000;
        auVar128._0_8_ = 0x3f8000003f800000;
        auVar3 = vsubps_avx(auVar3,auVar128);
        auVar151._8_8_ = 0x3f8000003f800000;
        auVar151._0_8_ = 0x3f8000003f800000;
        auVar1 = vpand_avx(auVar1,auVar151);
        auVar127._8_8_ = uStack_2118;
        auVar127._0_8_ = local_2120;
        auVar1 = vsubps_avx(auVar127,auVar1);
        local_1ef0 = auVar3._0_4_;
        fStack_1eec = auVar3._4_4_;
        fStack_1ee8 = auVar3._8_4_;
        fStack_1ee4 = auVar3._12_4_;
        local_1f00 = auVar2._0_4_;
        fStack_1efc = auVar2._4_4_;
        fStack_1ef8 = auVar2._8_4_;
        fStack_1ef4 = auVar2._12_4_;
        local_20e0._0_4_ = local_1ef0 + local_1f00;
        local_20e0._4_4_ = fStack_1eec + fStack_1efc;
        uStack_20d8._0_4_ = fStack_1ee8 + fStack_1ef8;
        uStack_20d8._4_4_ = fStack_1ee4 + fStack_1ef4;
        fStack_2158 = 0.070376836;
        local_2160 = (undefined1  [8])0x3d9021bb3d9021bb;
        fStack_2154 = 0.070376836;
        auVar163._8_4_ = -0.1151461;
        auVar163._12_4_ = -0.1151461;
        auVar163._0_4_ = -0.1151461;
        auVar163._4_4_ = -0.1151461;
        auVar2 = vfmadd213ps_fma(_local_20e0,_local_2160,auVar163);
        auVar164._8_4_ = 0.116769984;
        auVar164._12_4_ = 0.116769984;
        auVar164._0_4_ = 0.116769984;
        auVar164._4_4_ = 0.116769984;
        auVar2 = vfmadd213ps_fma(_local_20e0,auVar2,auVar164);
        auVar165._8_4_ = -0.12420141;
        auVar165._12_4_ = -0.12420141;
        auVar165._0_4_ = -0.12420141;
        auVar165._4_4_ = -0.12420141;
        auVar2 = vfmadd213ps_fma(_local_20e0,auVar2,auVar165);
        auVar166._8_4_ = 0.14249323;
        auVar166._12_4_ = 0.14249323;
        auVar166._0_4_ = 0.14249323;
        auVar166._4_4_ = 0.14249323;
        auVar2 = vfmadd213ps_fma(_local_20e0,auVar2,auVar166);
        auVar167._8_4_ = -0.16668057;
        auVar167._12_4_ = -0.16668057;
        auVar167._0_4_ = -0.16668057;
        auVar167._4_4_ = -0.16668057;
        auVar2 = vfmadd213ps_fma(_local_20e0,auVar2,auVar167);
        auVar168._8_4_ = 0.20000714;
        auVar168._12_4_ = 0.20000714;
        auVar168._0_4_ = 0.20000714;
        auVar168._4_4_ = 0.20000714;
        auVar2 = vfmadd213ps_fma(_local_20e0,auVar2,auVar168);
        auVar169._8_4_ = -0.24999994;
        auVar169._12_4_ = -0.24999994;
        auVar169._0_4_ = -0.24999994;
        auVar169._4_4_ = -0.24999994;
        auVar2 = vfmadd213ps_fma(_local_20e0,auVar2,auVar169);
        auVar170._8_4_ = 0.3333333;
        auVar170._12_4_ = 0.3333333;
        auVar170._0_4_ = 0.3333333;
        auVar170._4_4_ = 0.3333333;
        auVar2 = vfmadd213ps_fma(_local_20e0,auVar2,auVar170);
        local_20a0 = auVar2._0_4_;
        fStack_209c = auVar2._4_4_;
        fStack_2098 = auVar2._8_4_;
        fStack_2094 = auVar2._12_4_;
        local_2160._4_4_ =
             fStack_209c * (float)local_20e0._4_4_ *
             (float)local_20e0._4_4_ * (float)local_20e0._4_4_;
        local_2160._0_4_ =
             local_20a0 * (float)local_20e0._0_4_ *
             (float)local_20e0._0_4_ * (float)local_20e0._0_4_;
        fStack_2158 = fStack_2098 * (float)uStack_20d8 * (float)uStack_20d8 * (float)uStack_20d8;
        fStack_2154 = fStack_2094 * uStack_20d8._4_4_ * uStack_20d8._4_4_ * uStack_20d8._4_4_;
        auVar171._8_4_ = -0.00021219444;
        auVar171._12_4_ = -0.00021219444;
        auVar171._0_4_ = -0.00021219444;
        auVar171._4_4_ = -0.00021219444;
        auVar2 = vfmadd213ps_fma(auVar171,auVar1,_local_2160);
        auVar232._4_4_ = (float)local_20e0._4_4_ * (float)local_20e0._4_4_;
        auVar232._0_4_ = (float)local_20e0._0_4_ * (float)local_20e0._0_4_;
        auVar232._8_4_ = (float)uStack_20d8 * (float)uStack_20d8;
        auVar232._12_4_ = uStack_20d8._4_4_ * uStack_20d8._4_4_;
        auVar203._8_4_ = 0.5;
        auVar203._12_4_ = 0.5;
        auVar203._0_4_ = 0.5;
        auVar203._4_4_ = 0.5;
        auVar2 = vfnmadd213ps_fma(auVar203,auVar232,auVar2);
        local_1f20 = auVar2._0_4_;
        fStack_1f1c = auVar2._4_4_;
        fStack_1f18 = auVar2._8_4_;
        fStack_1f14 = auVar2._12_4_;
        local_20e0._4_4_ = (float)local_20e0._4_4_ + fStack_1f1c;
        local_20e0._0_4_ = (float)local_20e0._0_4_ + local_1f20;
        uStack_20d8._0_4_ = (float)uStack_20d8 + fStack_1f18;
        uStack_20d8._4_4_ = uStack_20d8._4_4_ + fStack_1f14;
        auVar172._8_4_ = 0.6933594;
        auVar172._12_4_ = 0.6933594;
        auVar172._0_4_ = 0.6933594;
        auVar172._4_4_ = 0.6933594;
        auVar1 = vfmadd213ps_fma(auVar172,auVar1,_local_20e0);
        auVar7 = vpor_avx(auVar1,auVar7);
        local_21e0 = auVar7._0_4_;
        fStack_21dc = auVar7._4_4_;
        fStack_21d8 = auVar7._8_4_;
        fStack_21d4 = auVar7._12_4_;
        auVar131._8_8_ = 0x3f8000003f800000;
        auVar131._0_8_ = 0x3f8000003f800000;
        auVar132._4_4_ = fStack_21dc * 2.0;
        auVar132._0_4_ = local_21e0 * 2.0;
        auVar132._12_4_ = fStack_21d4 * 2.0;
        auVar132._8_4_ = fStack_21d8 * 2.0;
        auVar7 = vsubps_avx(ZEXT816(0),auVar132);
        auVar213._8_4_ = 0x42b0c0a5;
        auVar213._0_8_ = 0x42b0c0a542b0c0a5;
        auVar213._12_4_ = 0x42b0c0a5;
        auVar7 = vminps_avx(auVar7,auVar213);
        auVar137._8_4_ = 0xc2b0c0a5;
        auVar137._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar137._12_4_ = 0xc2b0c0a5;
        auVar2 = vmaxps_avx(auVar137,auVar7);
        local_17b0 = auVar2._0_4_;
        fStack_17ac = auVar2._4_4_;
        fStack_17a8 = auVar2._8_4_;
        fStack_17a4 = auVar2._12_4_;
        fVar236 = local_17b0 * 1.442695 + 0.5;
        fVar239 = fStack_17ac * 1.442695 + 0.5;
        fVar240 = fStack_17a8 * 1.442695 + 0.5;
        fVar241 = fStack_17a4 * 1.442695 + 0.5;
        local_1830 = CONCAT44(fVar239,fVar236);
        uStack_1828._0_4_ = fVar240;
        uStack_1828._4_4_ = fVar241;
        local_1840 = CONCAT44((int)fVar239,(int)fVar236);
        uStack_1838._0_4_ = (int)fVar240;
        uStack_1838._4_4_ = (int)fVar241;
        auVar157._8_8_ = uStack_1838;
        auVar157._0_8_ = local_1840;
        auVar1 = vcvtdq2ps_avx(auVar157);
        auVar217._8_8_ = uStack_1828;
        auVar217._0_8_ = local_1830;
        auVar7 = vcmpps_avx(auVar217,auVar1,1);
        auVar145._8_8_ = 0x3f8000003f800000;
        auVar145._0_8_ = 0x3f8000003f800000;
        auVar7 = vpand_avx(auVar7,auVar145);
        auVar7 = vsubps_avx(auVar1,auVar7);
        auVar211._8_4_ = 0.6933594;
        auVar211._12_4_ = 0.6933594;
        auVar211._0_4_ = 0.6933594;
        auVar211._4_4_ = 0.6933594;
        auVar1 = vfnmadd213ps_fma(auVar211,auVar7,auVar2);
        auVar212._8_4_ = -0.00021219444;
        auVar212._12_4_ = -0.00021219444;
        auVar212._0_4_ = -0.00021219444;
        auVar212._4_4_ = -0.00021219444;
        auVar2 = vfnmadd213ps_fma(auVar212,auVar7,auVar1);
        local_17d0 = auVar2._0_4_;
        fStack_17cc = auVar2._4_4_;
        fStack_17c8 = auVar2._8_4_;
        fStack_17c4 = auVar2._12_4_;
        local_1820._4_4_ = fStack_17cc * fStack_17cc;
        local_1820._0_4_ = local_17d0 * local_17d0;
        fStack_1818 = fStack_17c8 * fStack_17c8;
        fStack_1814 = fStack_17c4 * fStack_17c4;
        local_1870._8_4_ = 0x39506967;
        local_1870._0_8_ = 0x3950696739506967;
        local_1870._12_4_ = 0x39506967;
        auVar198._8_4_ = 0.0013981999;
        auVar198._12_4_ = 0.0013981999;
        auVar198._0_4_ = 0.0013981999;
        auVar198._4_4_ = 0.0013981999;
        auVar1 = vfmadd213ps_fma(auVar2,local_1870,auVar198);
        auVar199._8_4_ = 0.008333452;
        auVar199._12_4_ = 0.008333452;
        auVar199._0_4_ = 0.008333452;
        auVar199._4_4_ = 0.008333452;
        auVar1 = vfmadd213ps_fma(auVar2,auVar1,auVar199);
        auVar200._8_4_ = 0.041665796;
        auVar200._12_4_ = 0.041665796;
        auVar200._0_4_ = 0.041665796;
        auVar200._4_4_ = 0.041665796;
        auVar1 = vfmadd213ps_fma(auVar2,auVar1,auVar200);
        auVar201._8_4_ = 0.16666666;
        auVar201._12_4_ = 0.16666666;
        auVar201._0_4_ = 0.16666666;
        auVar201._4_4_ = 0.16666666;
        auVar1 = vfmadd213ps_fma(auVar2,auVar1,auVar201);
        auVar202._8_4_ = 0.5;
        auVar202._12_4_ = 0.5;
        auVar202._0_4_ = 0.5;
        auVar202._4_4_ = 0.5;
        auVar1 = vfmadd213ps_fma(auVar2,auVar1,auVar202);
        auVar1 = vfmadd213ps_fma(_local_1820,auVar1,auVar2);
        local_1790 = auVar1._0_4_;
        fStack_178c = auVar1._4_4_;
        fStack_1788 = auVar1._8_4_;
        fStack_1784 = auVar1._12_4_;
        local_290 = auVar7._0_4_;
        fStack_28c = auVar7._4_4_;
        fStack_288 = auVar7._8_4_;
        fStack_284 = auVar7._12_4_;
        local_1840 = CONCAT44((int)fStack_28c,(int)local_290);
        uStack_1838._0_4_ = (int)fStack_288;
        uStack_1838._4_4_ = (int)fStack_284;
        auVar222._8_8_ = uStack_1838;
        auVar222._0_8_ = local_1840;
        auVar221._8_8_ = 0x7f0000007f;
        auVar221._0_8_ = 0x7f0000007f;
        auVar7 = vpaddd_avx(auVar222,auVar221);
        auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
        local_1800 = auVar7._0_4_;
        fStack_17fc = auVar7._4_4_;
        fStack_17f8 = auVar7._8_4_;
        fStack_17f4 = auVar7._12_4_;
        auVar133._4_4_ = (fStack_178c + 1.0) * fStack_17fc + 1.0;
        auVar133._0_4_ = (local_1790 + 1.0) * local_1800 + 1.0;
        auVar133._8_4_ = (fStack_1788 + 1.0) * fStack_17f8 + 1.0;
        auVar133._12_4_ = (fStack_1784 + 1.0) * fStack_17f4 + 1.0;
        auVar7 = vdivps_avx(auVar131,auVar133);
        local_2200 = auVar7._0_4_;
        fStack_21fc = auVar7._4_4_;
        fStack_21f8 = auVar7._8_4_;
        fStack_21f4 = auVar7._12_4_;
        auVar242._0_4_ = local_2200 * 2.0;
        auVar242._4_4_ = fStack_21fc * 2.0;
        auVar242._8_4_ = fStack_21f8 * 2.0;
        auVar242._12_4_ = fStack_21f4 * 2.0;
        auVar129._8_8_ = 0x3f8000003f800000;
        auVar129._0_8_ = 0x3f8000003f800000;
        auVar7 = vsubps_avx(auVar242,auVar129);
        local_2270 = (float)*(undefined8 *)*local_66b0;
        fStack_226c = (float)((ulong)*(undefined8 *)*local_66b0 >> 0x20);
        fStack_2268 = (float)*(undefined8 *)(*local_66b0 + 8);
        fStack_2264 = (float)((ulong)*(undefined8 *)(*local_66b0 + 8) >> 0x20);
        local_2280 = auVar7._0_4_;
        fStack_227c = auVar7._4_4_;
        fStack_2278 = auVar7._8_4_;
        fStack_2274 = auVar7._12_4_;
        local_6710 = CONCAT44(fStack_226c * fStack_227c,local_2270 * local_2280);
        uStack_6708 = CONCAT44(fStack_2264 * fStack_2274,fStack_2268 * fStack_2278);
        auVar26._8_8_ = uStack_6708;
        auVar26._0_8_ = local_6710;
        *local_66b0 = auVar26;
        local_66b0 = local_66b0 + 1;
      }
    }
    local_6594 = 0;
  }
  else {
    local_65a8 = in_RSI;
    for (local_6714 = 0; local_6714 < local_65c0; local_6714 = local_6714 + 1) {
      local_6538 = &local_6768;
      local_61fc = *(int *)((long)local_65a8 + 0x2c);
      local_6200 = (int)local_65a8[6];
      local_6204 = *(undefined4 *)((long)local_65a8 + 0x34);
      local_6210 = (undefined1 (*) [32])
                   (*local_65a8 + local_65a8[8] * (long)local_6714 * local_65a8[2]);
      local_6218 = local_65a8[2];
      local_621c = (undefined4)local_65a8[3];
      local_6228 = local_65a8[4];
      local_61f8 = &local_6768;
      local_61e8 = (long)local_61fc * (long)local_6200 * local_6218;
      local_64e8 = &local_6768;
      local_6558 = &local_6768;
      local_61ec = 0x10;
      local_6544 = local_6714;
      local_6545 = 1;
      local_6768 = 0;
      local_6758 = 0;
      local_6750 = 0;
      local_6740 = 0;
      local_673c = 0;
      local_6738 = 0;
      local_6734 = 0;
      local_6730 = 0;
      local_6728 = 0;
      local_6760 = 0;
      local_6720 = local_6210;
      for (local_676c = 0; local_676c + 7 < local_65c4; local_676c = local_676c + 8) {
        local_64d0 = local_6720;
        local_64c0 = *(undefined8 *)*local_6720;
        uStack_64b8 = *(undefined8 *)(*local_6720 + 8);
        uStack_64b0 = *(undefined8 *)(*local_6720 + 0x10);
        auVar229 = *(undefined1 (*) [24])*local_6720;
        uStack_64a8 = *(undefined8 *)(*local_6720 + 0x18);
        auVar8 = *local_6720;
        local_4da0 = 0;
        uStack_4d98 = 0;
        uStack_4d90 = 0;
        uStack_4d88 = 0;
        local_5820 = 0x3f800000;
        uStack_581c = 0x3f800000;
        uStack_5818 = 0x3f800000;
        uStack_5814 = 0x3f800000;
        uStack_5810 = 0x3f800000;
        uStack_580c = 0x3f800000;
        uStack_5808 = 0x3f800000;
        uStack_5804 = 0x3f800000;
        local_57a0._0_8_ = auVar229._0_8_;
        local_29e0 = local_57a0._0_8_;
        local_57a0._8_8_ = auVar229._8_8_;
        uStack_29d8 = local_57a0._8_8_;
        local_57a0._16_8_ = auVar229._16_8_;
        uStack_29d0 = local_57a0._16_8_;
        local_2a00 = 0x42b0c0a5;
        uStack_29fc = 0x42b0c0a5;
        uStack_29f8 = 0x42b0c0a5;
        uStack_29f4 = 0x42b0c0a5;
        uStack_29f0 = 0x42b0c0a5;
        uStack_29ec = 0x42b0c0a5;
        uStack_29e8 = 0x42b0c0a5;
        uStack_29e4 = 0x42b0c0a5;
        auVar117._8_4_ = 0x42b0c0a5;
        auVar117._0_8_ = 0x42b0c0a542b0c0a5;
        auVar117._12_4_ = 0x42b0c0a5;
        auVar117._16_4_ = 0x42b0c0a5;
        auVar117._20_4_ = 0x42b0c0a5;
        auVar117._24_4_ = 0x42b0c0a5;
        auVar117._28_4_ = 0x42b0c0a5;
        auVar4 = vminps_avx(*local_6720,auVar117);
        local_57a0._0_8_ = auVar4._0_8_;
        local_4c80 = local_57a0._0_8_;
        local_57a0._8_8_ = auVar4._8_8_;
        uStack_4c78 = local_57a0._8_8_;
        local_57a0._16_8_ = auVar4._16_8_;
        uStack_4c70 = local_57a0._16_8_;
        local_57a0._24_8_ = auVar4._24_8_;
        uStack_4c68 = local_57a0._24_8_;
        local_4ca0 = 0xc2b0c0a5;
        uStack_4c9c = 0xc2b0c0a5;
        uStack_4c98 = 0xc2b0c0a5;
        uStack_4c94 = 0xc2b0c0a5;
        uStack_4c90 = 0xc2b0c0a5;
        uStack_4c8c = 0xc2b0c0a5;
        uStack_4c88 = 0xc2b0c0a5;
        uStack_4c84 = 0xc2b0c0a5;
        auVar40._8_4_ = 0xc2b0c0a5;
        auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar40._12_4_ = 0xc2b0c0a5;
        auVar40._16_4_ = 0xc2b0c0a5;
        auVar40._20_4_ = 0xc2b0c0a5;
        auVar40._24_4_ = 0xc2b0c0a5;
        auVar40._28_4_ = 0xc2b0c0a5;
        auVar237 = vmaxps_avx(auVar4,auVar40);
        local_4548 = local_57a0;
        local_44b0 = ::_ps256_cephes_LOG2EF;
        local_44b8 = ::_ps256_0p5;
        local_57a0._0_8_ = auVar237._0_8_;
        local_35e0 = local_57a0._0_8_;
        local_57a0._8_8_ = auVar237._8_8_;
        uStack_35d8 = local_57a0._8_8_;
        local_57a0._16_8_ = auVar237._16_8_;
        uStack_35d0 = local_57a0._16_8_;
        local_57a0._24_8_ = auVar237._24_8_;
        uStack_35c8 = local_57a0._24_8_;
        local_3600[0] = 1.442695;
        local_3600[1] = 1.442695;
        afStack_35f8[0] = 1.442695;
        afStack_35f8[1] = 1.442695;
        afStack_35f0[0] = 1.442695;
        afStack_35f0[1] = 1.442695;
        afStack_35e8[0] = 1.442695;
        afStack_35e8[1] = 1.442695;
        local_3620[0] = 0.5;
        local_3620[1] = 0.5;
        afStack_3618[0] = 0.5;
        afStack_3618[1] = 0.5;
        afStack_3610[0] = 0.5;
        afStack_3610[1] = 0.5;
        afStack_3608[0] = 0.5;
        afStack_3608[1] = 0.5;
        auVar85._8_4_ = 1.442695;
        auVar85._12_4_ = 1.442695;
        auVar85._0_4_ = 1.442695;
        auVar85._4_4_ = 1.442695;
        auVar85._16_4_ = 1.442695;
        auVar85._20_4_ = 1.442695;
        auVar85._24_4_ = 1.442695;
        auVar85._28_4_ = 1.442695;
        auVar238._8_4_ = 0.5;
        auVar238._12_4_ = 0.5;
        auVar238._0_4_ = 0.5;
        auVar238._4_4_ = 0.5;
        auVar238._16_4_ = 0.5;
        auVar238._20_4_ = 0.5;
        auVar238._24_4_ = 0.5;
        auVar238._28_4_ = 0.5;
        auVar7 = vfmadd213ps_fma(auVar85,auVar237,auVar238);
        auVar5 = vroundps_avx(ZEXT1632(auVar7),1);
        auVar4 = vcmpps_avx(ZEXT1632(auVar7),auVar5,1);
        local_5840._0_8_ = auVar4._0_8_;
        local_4a40 = local_5840._0_8_;
        local_5840._8_8_ = auVar4._8_8_;
        uStack_4a38 = local_5840._8_8_;
        local_5840._16_8_ = auVar4._16_8_;
        uStack_4a30 = local_5840._16_8_;
        local_5840._24_8_ = auVar4._24_8_;
        uStack_4a28 = local_5840._24_8_;
        local_4a60 = 0x3f8000003f800000;
        uStack_4a58 = 0x3f8000003f800000;
        uStack_4a50 = 0x3f8000003f800000;
        uStack_4a48 = 0x3f8000003f800000;
        auVar48._8_8_ = 0x3f8000003f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        auVar48._16_8_ = 0x3f8000003f800000;
        auVar48._24_8_ = 0x3f8000003f800000;
        local_5840 = vpand_avx2(auVar4,auVar48);
        local_57c0 = auVar5._0_8_;
        local_4f80 = local_57c0;
        uStack_57b8 = auVar5._8_8_;
        uStack_4f78 = uStack_57b8;
        uStack_57b0 = auVar5._16_8_;
        uStack_4f70 = uStack_57b0;
        uStack_57a8 = auVar5._24_8_;
        uStack_4f68 = uStack_57a8;
        local_4fa0 = local_5840._0_8_;
        uStack_4f98 = local_5840._8_8_;
        uStack_4f90 = local_5840._16_8_;
        uStack_4f88 = local_5840._24_8_;
        local_57e0 = vsubps_avx(auVar5,local_5840);
        local_41a8 = local_57e0;
        local_4198 = ::_ps256_cephes_exp_C1;
        local_2c80 = local_57e0._0_8_;
        uStack_2c78 = local_57e0._8_8_;
        uStack_2c70 = local_57e0._16_8_;
        uStack_2c68 = local_57e0._24_8_;
        local_2ca0[0] = 0.6933594;
        local_2ca0[1] = 0.6933594;
        afStack_2c98[0] = 0.6933594;
        afStack_2c98[1] = 0.6933594;
        afStack_2c90[0] = 0.6933594;
        afStack_2c90[1] = 0.6933594;
        afStack_2c88[0] = 0.6933594;
        afStack_2c88[1] = 0.6933594;
        local_2cc0 = local_57a0._0_8_;
        uStack_2cb8 = local_57a0._8_8_;
        uStack_2cb0 = local_57a0._16_8_;
        uStack_2ca8 = local_57a0._24_8_;
        auVar109._8_4_ = 0.6933594;
        auVar109._12_4_ = 0.6933594;
        auVar109._0_4_ = 0.6933594;
        auVar109._4_4_ = 0.6933594;
        auVar109._16_4_ = 0.6933594;
        auVar109._20_4_ = 0.6933594;
        auVar109._24_4_ = 0.6933594;
        auVar109._28_4_ = 0.6933594;
        auVar7 = vfnmadd213ps_fma(auVar109,local_57e0,auVar237);
        local_41b0 = ::_ps256_cephes_exp_C2;
        local_2c20 = local_57e0._0_8_;
        uStack_2c18 = local_57e0._8_8_;
        uStack_2c10 = local_57e0._16_8_;
        uStack_2c08 = local_57e0._24_8_;
        local_2c40[0] = -0.00021219444;
        local_2c40[1] = -0.00021219444;
        afStack_2c38[0] = -0.00021219444;
        afStack_2c38[1] = -0.00021219444;
        afStack_2c30[0] = -0.00021219444;
        afStack_2c30[1] = -0.00021219444;
        afStack_2c28[0] = -0.00021219444;
        afStack_2c28[1] = -0.00021219444;
        local_57a0._0_8_ = auVar7._0_8_;
        local_2c60 = local_57a0._0_8_;
        local_57a0._8_8_ = auVar7._8_8_;
        uStack_2c58 = local_57a0._8_8_;
        uStack_2c50 = 0;
        uStack_2c48 = 0;
        auVar110._8_4_ = -0.00021219444;
        auVar110._12_4_ = -0.00021219444;
        auVar110._0_4_ = -0.00021219444;
        auVar110._4_4_ = -0.00021219444;
        auVar110._16_4_ = -0.00021219444;
        auVar110._20_4_ = -0.00021219444;
        auVar110._24_4_ = -0.00021219444;
        auVar110._28_4_ = -0.00021219444;
        auVar7 = vfnmadd213ps_fma(auVar110,local_57e0,ZEXT1632(auVar7));
        auVar238 = ZEXT1632(auVar7);
        local_57a0._0_8_ = auVar7._0_8_;
        local_5740 = local_57a0._0_8_;
        local_57a0._8_8_ = auVar7._8_8_;
        uStack_5738 = local_57a0._8_8_;
        uStack_5730 = 0;
        uStack_5728 = 0;
        local_5720._0_4_ = auVar7._0_4_;
        local_5720._4_4_ = auVar7._4_4_;
        uStack_5718._0_4_ = auVar7._8_4_;
        uStack_5718._4_4_ = auVar7._12_4_;
        local_57c0._4_4_ = local_5720._4_4_ * local_5720._4_4_;
        local_57c0._0_4_ = (float)local_5720 * (float)local_5720;
        local_33c0 = local_57c0;
        uStack_57b8._0_4_ = (float)uStack_5718 * (float)uStack_5718;
        uStack_57b8._4_4_ = uStack_5718._4_4_ * uStack_5718._4_4_;
        auVar1 = _local_57c0;
        _local_57c0 = ZEXT1632(_local_57c0);
        auVar48 = _local_57c0;
        uStack_5858._0_4_ = 0x39506967;
        local_5860 = (undefined1  [8])0x3950696739506967;
        uStack_5858._4_4_ = 0x39506967;
        uStack_5850._0_4_ = 0x39506967;
        uStack_5850._4_4_ = 0x39506967;
        auVar234 = _local_5860;
        uStack_5848._0_4_ = 0x39506967;
        uStack_5848._4_4_ = 0x39506967;
        auVar4 = _local_5860;
        local_4538 = local_5860;
        local_44d0 = ::_ps256_cephes_exp_p1;
        local_3580 = 0x3950696739506967;
        uStack_3578 = uStack_5858;
        uStack_5850 = auVar234._16_8_;
        uStack_3570 = uStack_5850;
        uStack_5848 = auVar4._24_8_;
        uStack_3568 = uStack_5848;
        local_35a0 = local_57a0._0_8_;
        uStack_3598 = local_57a0._8_8_;
        uStack_3590 = 0;
        uStack_3588 = 0;
        local_35c0[0] = 0.0013981999;
        local_35c0[1] = 0.0013981999;
        afStack_35b8[0] = 0.0013981999;
        afStack_35b8[1] = 0.0013981999;
        afStack_35b0[0] = 0.0013981999;
        afStack_35b0[1] = 0.0013981999;
        afStack_35a8[0] = 0.0013981999;
        afStack_35a8[1] = 0.0013981999;
        auVar86._8_4_ = 0.0013981999;
        auVar86._12_4_ = 0.0013981999;
        auVar86._0_4_ = 0.0013981999;
        auVar86._4_4_ = 0.0013981999;
        auVar86._16_4_ = 0.0013981999;
        auVar86._20_4_ = 0.0013981999;
        auVar86._24_4_ = 0.0013981999;
        auVar86._28_4_ = 0.0013981999;
        auVar7 = vfmadd213ps_fma(auVar238,auVar4,auVar86);
        local_44e8 = ::_ps256_cephes_exp_p2;
        local_5860 = auVar7._0_8_;
        local_3520 = local_5860;
        uStack_5858 = auVar7._8_8_;
        uStack_3518 = uStack_5858;
        uStack_3510 = 0;
        uStack_3508 = 0;
        local_3540 = local_57a0._0_8_;
        uStack_3538 = local_57a0._8_8_;
        uStack_3530 = 0;
        uStack_3528 = 0;
        local_3560[0] = 0.008333452;
        local_3560[1] = 0.008333452;
        afStack_3558[0] = 0.008333452;
        afStack_3558[1] = 0.008333452;
        afStack_3550[0] = 0.008333452;
        afStack_3550[1] = 0.008333452;
        afStack_3548[0] = 0.008333452;
        afStack_3548[1] = 0.008333452;
        auVar87._8_4_ = 0.008333452;
        auVar87._12_4_ = 0.008333452;
        auVar87._0_4_ = 0.008333452;
        auVar87._4_4_ = 0.008333452;
        auVar87._16_4_ = 0.008333452;
        auVar87._20_4_ = 0.008333452;
        auVar87._24_4_ = 0.008333452;
        auVar87._28_4_ = 0.008333452;
        auVar7 = vfmadd213ps_fma(auVar238,ZEXT1632(auVar7),auVar87);
        local_4500 = ::_ps256_cephes_exp_p3;
        local_5860 = auVar7._0_8_;
        local_34c0 = local_5860;
        uStack_5858 = auVar7._8_8_;
        uStack_34b8 = uStack_5858;
        uStack_34b0 = 0;
        uStack_34a8 = 0;
        local_34e0 = local_57a0._0_8_;
        uStack_34d8 = local_57a0._8_8_;
        uStack_34d0 = 0;
        uStack_34c8 = 0;
        local_3500[0] = 0.041665796;
        local_3500[1] = 0.041665796;
        afStack_34f8[0] = 0.041665796;
        afStack_34f8[1] = 0.041665796;
        afStack_34f0[0] = 0.041665796;
        afStack_34f0[1] = 0.041665796;
        afStack_34e8[0] = 0.041665796;
        afStack_34e8[1] = 0.041665796;
        auVar88._8_4_ = 0.041665796;
        auVar88._12_4_ = 0.041665796;
        auVar88._0_4_ = 0.041665796;
        auVar88._4_4_ = 0.041665796;
        auVar88._16_4_ = 0.041665796;
        auVar88._20_4_ = 0.041665796;
        auVar88._24_4_ = 0.041665796;
        auVar88._28_4_ = 0.041665796;
        auVar7 = vfmadd213ps_fma(auVar238,ZEXT1632(auVar7),auVar88);
        local_4518 = ::_ps256_cephes_exp_p4;
        local_5860 = auVar7._0_8_;
        local_3460 = local_5860;
        uStack_5858 = auVar7._8_8_;
        uStack_3458 = uStack_5858;
        uStack_3450 = 0;
        uStack_3448 = 0;
        local_3480 = local_57a0._0_8_;
        uStack_3478 = local_57a0._8_8_;
        uStack_3470 = 0;
        uStack_3468 = 0;
        local_34a0[0] = 0.16666666;
        local_34a0[1] = 0.16666666;
        afStack_3498[0] = 0.16666666;
        afStack_3498[1] = 0.16666666;
        afStack_3490[0] = 0.16666666;
        afStack_3490[1] = 0.16666666;
        afStack_3488[0] = 0.16666666;
        afStack_3488[1] = 0.16666666;
        auVar89._8_4_ = 0.16666666;
        auVar89._12_4_ = 0.16666666;
        auVar89._0_4_ = 0.16666666;
        auVar89._4_4_ = 0.16666666;
        auVar89._16_4_ = 0.16666666;
        auVar89._20_4_ = 0.16666666;
        auVar89._24_4_ = 0.16666666;
        auVar89._28_4_ = 0.16666666;
        auVar7 = vfmadd213ps_fma(auVar238,ZEXT1632(auVar7),auVar89);
        local_4530 = ::_ps256_cephes_exp_p5;
        local_5860 = auVar7._0_8_;
        local_3400 = local_5860;
        uStack_5858 = auVar7._8_8_;
        uStack_33f8 = uStack_5858;
        uStack_33f0 = 0;
        uStack_33e8 = 0;
        local_3420 = local_57a0._0_8_;
        uStack_3418 = local_57a0._8_8_;
        uStack_3410 = 0;
        uStack_3408 = 0;
        local_3440[0] = 0.5;
        local_3440[1] = 0.5;
        afStack_3438[0] = 0.5;
        afStack_3438[1] = 0.5;
        afStack_3430[0] = 0.5;
        afStack_3430[1] = 0.5;
        afStack_3428[0] = 0.5;
        afStack_3428[1] = 0.5;
        auVar90._8_4_ = 0.5;
        auVar90._12_4_ = 0.5;
        auVar90._0_4_ = 0.5;
        auVar90._4_4_ = 0.5;
        auVar90._16_4_ = 0.5;
        auVar90._20_4_ = 0.5;
        auVar90._24_4_ = 0.5;
        auVar90._28_4_ = 0.5;
        auVar7 = vfmadd213ps_fma(auVar238,ZEXT1632(auVar7),auVar90);
        local_4540 = local_57c0;
        local_5860 = auVar7._0_8_;
        local_33a0 = local_5860;
        uStack_5858 = auVar7._8_8_;
        uStack_3398 = uStack_5858;
        uStack_3390 = 0;
        uStack_3388 = 0;
        uStack_57b8 = auVar1._8_8_;
        uStack_33b8 = uStack_57b8;
        uStack_33b0 = 0;
        uStack_33a8 = 0;
        local_33e0 = local_57a0._0_8_;
        uStack_33d8 = local_57a0._8_8_;
        uStack_33d0 = 0;
        uStack_33c8 = 0;
        auVar7 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar7),auVar238);
        local_5860 = auVar7._0_8_;
        uVar9 = local_5860;
        uStack_5858 = auVar7._8_8_;
        uVar10 = uStack_5858;
        uStack_56d0 = 0;
        uStack_56c8 = 0;
        local_5700 = 0x3f8000003f800000;
        uStack_56f8 = 0x3f8000003f800000;
        uStack_56f0 = 0x3f8000003f800000;
        uStack_56e8 = 0x3f8000003f800000;
        local_56e0._0_4_ = auVar7._0_4_;
        local_56e0._4_4_ = auVar7._4_4_;
        uStack_56d8._0_4_ = auVar7._8_4_;
        uStack_56d8._4_4_ = auVar7._12_4_;
        local_5860._4_4_ = local_56e0._4_4_ + 1.0;
        local_5860._0_4_ = (float)local_56e0 + 1.0;
        uStack_5858._0_4_ = (float)uStack_56d8 + 1.0;
        uStack_5858._4_4_ = uStack_56d8._4_4_ + 1.0;
        uStack_5850._0_4_ = 0x3f800000;
        uStack_5850._4_4_ = 0x3f800000;
        auVar234 = _local_5860;
        uStack_5848._0_4_ = 0x3f800000;
        uStack_5848._4_4_ = 0x3f800000;
        auVar237 = _local_5860;
        local_2940._0_4_ = local_57e0._0_4_;
        local_2940._4_4_ = local_57e0._4_4_;
        uStack_2938._0_4_ = local_57e0._8_4_;
        uStack_2938._4_4_ = local_57e0._12_4_;
        uStack_2930._0_4_ = local_57e0._16_4_;
        uStack_2930._4_4_ = local_57e0._20_4_;
        uStack_2928._0_4_ = local_57e0._24_4_;
        uStack_2928._4_4_ = local_57e0._28_4_;
        local_5800._4_4_ = (int)local_2940._4_4_;
        local_5800._0_4_ = (int)(float)local_2940;
        local_5800._8_4_ = (int)(float)uStack_2938;
        local_5800._12_4_ = (int)uStack_2938._4_4_;
        local_5800._16_4_ = (int)(float)uStack_2930;
        local_5800._20_4_ = (int)uStack_2930._4_4_;
        auVar235 = local_5800._0_24_;
        local_5800._24_4_ = (int)(float)uStack_2928;
        local_5800._28_4_ = (int)uStack_2928._4_4_;
        auVar4 = local_5800;
        local_2860 = local_5800._0_8_;
        uStack_2858 = local_5800._8_8_;
        local_5800._16_8_ = auVar235._16_8_;
        uStack_2850 = local_5800._16_8_;
        local_5800._24_8_ = auVar4._24_8_;
        uStack_2848 = local_5800._24_8_;
        local_2880 = 0x7f0000007f;
        uStack_2878 = 0x7f0000007f;
        uStack_2870 = 0x7f0000007f;
        uStack_2868 = 0x7f0000007f;
        local_2620 = local_5800._0_8_;
        uStack_2618 = local_5800._8_8_;
        uStack_2610 = local_5800._16_8_;
        uStack_2608 = local_5800._24_8_;
        local_2640 = 0x7f0000007f;
        uStack_2638 = 0x7f0000007f;
        uStack_2630 = 0x7f0000007f;
        uStack_2628 = 0x7f0000007f;
        auVar122._16_8_ = local_5800._16_8_;
        auVar122._0_16_ = local_5800._0_16_;
        auVar122._24_8_ = local_5800._24_8_;
        auVar121._8_8_ = 0x7f0000007f;
        auVar121._0_8_ = 0x7f0000007f;
        auVar121._16_8_ = 0x7f0000007f;
        auVar121._24_8_ = 0x7f0000007f;
        auVar4 = vpaddd_avx2(auVar121,auVar122);
        local_5800._0_8_ = auVar4._0_8_;
        local_2760 = local_5800._0_8_;
        local_5800._8_8_ = auVar4._8_8_;
        uStack_2758 = local_5800._8_8_;
        local_5800._16_8_ = auVar4._16_8_;
        uStack_2750 = local_5800._16_8_;
        local_5800._24_8_ = auVar4._24_8_;
        uStack_2748 = local_5800._24_8_;
        local_2764 = 0x17;
        local_2520 = local_5800._0_8_;
        uStack_2518 = local_5800._8_8_;
        uStack_2510 = local_5800._16_8_;
        uStack_2508 = local_5800._24_8_;
        local_2524 = 0x17;
        local_5800 = vpslld_avx2(auVar4,ZEXT416(0x17));
        local_26c0 = local_5800._0_8_;
        uStack_26b8 = local_5800._8_8_;
        uStack_26b0 = local_5800._16_8_;
        uStack_26a8 = local_5800._24_8_;
        local_5880 = local_5800._0_8_;
        uStack_5878 = local_5800._8_8_;
        uStack_5870 = local_5800._16_8_;
        uStack_5868 = local_5800._24_8_;
        local_5760 = local_5860;
        uStack_5758 = uStack_5858;
        uStack_5850 = auVar234._16_8_;
        uStack_5750 = uStack_5850;
        uStack_5848 = auVar237._24_8_;
        uStack_5748 = uStack_5848;
        local_5780._0_4_ = local_5800._0_4_;
        local_5780._4_4_ = local_5800._4_4_;
        uStack_5778._0_4_ = local_5800._8_4_;
        uStack_5778._4_4_ = local_5800._12_4_;
        uStack_5770._0_4_ = local_5800._16_4_;
        uStack_5770._4_4_ = local_5800._20_4_;
        uStack_5768._0_4_ = local_5800._24_4_;
        local_5860._0_4_ = (float)local_5780 * ((float)local_56e0 + 1.0);
        local_5860._4_4_ = local_5780._4_4_ * (local_56e0._4_4_ + 1.0);
        uStack_5778._0_4_ = (float)uStack_5778 * ((float)uStack_56d8 + 1.0);
        uStack_5778._4_4_ = uStack_5778._4_4_ * (uStack_56d8._4_4_ + 1.0);
        uStack_5858._0_4_ = (float)uStack_5778;
        uStack_5858._4_4_ = uStack_5778._4_4_;
        uStack_5850._0_4_ = (float)uStack_5770 * 1.0;
        uStack_5850._4_4_ = uStack_5770._4_4_ * 1.0;
        auVar234 = _local_5860;
        uStack_5848._0_4_ = (float)uStack_5768 * 1.0;
        uStack_5848._4_4_ = 0x3f800000;
        auVar40 = _local_5860;
        local_5a60 = local_5860;
        uStack_5a58 = uStack_5858;
        uStack_5850 = auVar234._16_8_;
        uStack_5a50 = uStack_5850;
        uStack_5848 = auVar40._24_8_;
        uStack_5a48 = uStack_5848;
        local_56a4 = 0x3f800000;
        local_23e0 = 0x3f800000;
        auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
        local_2400 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
        auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
        auStack_23f0 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
        local_5a80._0_4_ = local_2400._0_4_;
        local_5a80._4_4_ = local_2400._4_4_;
        uStack_5a78._0_4_ = local_2400._8_4_;
        uStack_5a78._4_4_ = local_2400._12_4_;
        uStack_5a70._0_4_ = auStack_23f0._0_4_;
        uStack_5a70._4_4_ = auStack_23f0._4_4_;
        uStack_5a68._0_4_ = auStack_23f0._8_4_;
        uStack_5a68._4_4_ = auStack_23f0._12_4_;
        local_5d20._4_4_ = local_5a80._4_4_ + (float)local_5860._4_4_;
        local_5d20._0_4_ = (float)local_5a80 + (float)local_5860._0_4_;
        uStack_5d18._0_4_ = (float)uStack_5a78 + (float)uStack_5778;
        uStack_5d18._4_4_ = uStack_5a78._4_4_ + uStack_5778._4_4_;
        uStack_5d10._0_4_ = (float)uStack_5a70 + (float)uStack_5770 * 1.0;
        uStack_5d10._4_4_ = uStack_5a70._4_4_ + uStack_5770._4_4_ * 1.0;
        auVar234 = _local_5d20;
        uStack_5d08._0_4_ = (float)uStack_5a68 + (float)uStack_5768 * 1.0;
        uStack_5d08._4_4_ = uStack_5a68._4_4_ + 1.0;
        auVar4 = _local_5d20;
        local_5d60 = 0x3f800000;
        uStack_5d5c = 0x3f800000;
        uStack_5d58 = 0x3f800000;
        uStack_5d54 = 0x3f800000;
        uStack_5d50 = 0x3f800000;
        uStack_5d4c = 0x3f800000;
        uStack_5d48 = 0x3f800000;
        uStack_5d44 = 0x3f800000;
        local_4d60 = 0;
        uStack_4d58 = 0;
        uStack_4d50 = 0;
        uStack_4d48 = 0;
        local_5d80 = vcmpps_avx(_local_5d20,ZEXT1632(ZEXT816(0)),2);
        local_4c00 = local_5d20;
        uStack_4bf8 = uStack_5d18;
        uStack_5d10 = auVar234._16_8_;
        uStack_4bf0 = uStack_5d10;
        uStack_5d08 = auVar4._24_8_;
        uStack_4be8 = uStack_5d08;
        local_4c20 = 0x800000;
        uStack_4c1c = 0x800000;
        uStack_4c18 = 0x800000;
        uStack_4c14 = 0x800000;
        uStack_4c10 = 0x800000;
        uStack_4c0c = 0x800000;
        uStack_4c08 = 0x800000;
        uStack_4c04 = 0x800000;
        auVar43._16_8_ = uStack_5d10;
        auVar43._0_16_ = _local_5d20;
        auVar43._24_8_ = uStack_5d08;
        auVar42._8_4_ = 0x800000;
        auVar42._0_8_ = 0x80000000800000;
        auVar42._12_4_ = 0x800000;
        auVar42._16_4_ = 0x800000;
        auVar42._20_4_ = 0x800000;
        auVar42._24_4_ = 0x800000;
        auVar42._28_4_ = 0x800000;
        auVar4 = vmaxps_avx(auVar42,auVar43);
        local_5d20 = auVar4._0_8_;
        local_4b20 = local_5d20;
        uStack_5d18 = auVar4._8_8_;
        uStack_4b18 = uStack_5d18;
        uStack_5d10 = auVar4._16_8_;
        uStack_4b10 = uStack_5d10;
        uStack_5d08 = auVar4._24_8_;
        uStack_4b08 = uStack_5d08;
        local_4b80 = local_5d20;
        uStack_4b78 = uStack_5d18;
        uStack_4b70 = uStack_5d10;
        uStack_4b68 = uStack_5d08;
        local_4b84 = 0x17;
        local_40e0 = local_5d20;
        uStack_40d8 = uStack_5d18;
        uStack_40d0 = uStack_5d10;
        uStack_40c8 = uStack_5d08;
        local_40e4 = 0x17;
        auVar5 = vpsrld_avx2(auVar4,ZEXT416(0x17));
        local_4940 = local_5d20;
        uStack_4938 = uStack_5d18;
        uStack_4930 = uStack_5d10;
        uStack_4928 = uStack_5d08;
        local_4960 = 0x807fffff;
        uStack_495c = 0x807fffff;
        uStack_4958 = 0x807fffff;
        uStack_4954 = 0x807fffff;
        uStack_4950 = 0x807fffff;
        uStack_494c = 0x807fffff;
        uStack_4948 = 0x807fffff;
        uStack_4944 = 0x807fffff;
        auVar51._8_4_ = 0x807fffff;
        auVar51._0_8_ = 0x807fffff807fffff;
        auVar51._12_4_ = 0x807fffff;
        auVar51._16_4_ = 0x807fffff;
        auVar51._20_4_ = 0x807fffff;
        auVar51._24_4_ = 0x807fffff;
        auVar51._28_4_ = 0x807fffff;
        auVar4 = vpand_avx2(auVar51,auVar4);
        local_5d20 = auVar4._0_8_;
        local_4800 = local_5d20;
        uStack_5d18 = auVar4._8_8_;
        uStack_47f8 = uStack_5d18;
        uStack_5d10 = auVar4._16_8_;
        uStack_47f0 = uStack_5d10;
        uStack_5d08 = auVar4._24_8_;
        uStack_47e8 = uStack_5d08;
        local_4820 = 0x3f000000;
        uStack_481c = 0x3f000000;
        uStack_4818 = 0x3f000000;
        uStack_4814 = 0x3f000000;
        uStack_4810 = 0x3f000000;
        uStack_480c = 0x3f000000;
        uStack_4808 = 0x3f000000;
        uStack_4804 = 0x3f000000;
        auVar54._8_4_ = 0x3f000000;
        auVar54._0_8_ = 0x3f0000003f000000;
        auVar54._12_4_ = 0x3f000000;
        auVar54._16_4_ = 0x3f000000;
        auVar54._20_4_ = 0x3f000000;
        auVar54._24_4_ = 0x3f000000;
        auVar54._28_4_ = 0x3f000000;
        auVar237 = vpor_avx2(auVar54,auVar4);
        local_5d40._0_8_ = auVar5._0_8_;
        local_4740 = local_5d40._0_8_;
        local_5d40._8_8_ = auVar5._8_8_;
        uStack_4738 = local_5d40._8_8_;
        local_5d40._16_8_ = auVar5._16_8_;
        uStack_4730 = local_5d40._16_8_;
        local_5d40._24_8_ = auVar5._24_8_;
        uStack_4728 = local_5d40._24_8_;
        local_4760 = 0x7f0000007f;
        uStack_4758 = 0x7f0000007f;
        uStack_4750 = 0x7f0000007f;
        uStack_4748 = 0x7f0000007f;
        local_4060 = local_5d40._0_8_;
        uStack_4058 = local_5d40._8_8_;
        uStack_4050 = local_5d40._16_8_;
        uStack_4048 = local_5d40._24_8_;
        local_4080 = 0x7f0000007f;
        uStack_4078 = 0x7f0000007f;
        uStack_4070 = 0x7f0000007f;
        uStack_4068 = 0x7f0000007f;
        auVar57._8_8_ = 0x7f0000007f;
        auVar57._0_8_ = 0x7f0000007f;
        auVar57._16_8_ = 0x7f0000007f;
        auVar57._24_8_ = 0x7f0000007f;
        local_5d40 = vpsubd_avx2(auVar5,auVar57);
        local_46e0 = local_5d40._0_8_;
        uStack_46d8 = local_5d40._8_8_;
        uStack_46d0 = local_5d40._16_8_;
        uStack_46c8 = local_5d40._24_8_;
        auVar4 = vcvtdq2ps_avx(local_5d40);
        local_5da0 = auVar4._0_8_;
        uVar11 = local_5da0;
        uStack_5d98 = auVar4._8_8_;
        uVar12 = uStack_5d98;
        uStack_5d90 = auVar4._16_8_;
        uVar13 = uStack_5d90;
        uStack_5d88 = auVar4._24_8_;
        uVar14 = uStack_5d88;
        local_5bc0 = 0x3f8000003f800000;
        uStack_5bb8 = 0x3f8000003f800000;
        uStack_5bb0 = 0x3f8000003f800000;
        uStack_5ba8 = 0x3f8000003f800000;
        local_5ba0._0_4_ = auVar4._0_4_;
        local_5ba0._4_4_ = auVar4._4_4_;
        uStack_5b98._0_4_ = auVar4._8_4_;
        uStack_5b98._4_4_ = auVar4._12_4_;
        uStack_5b90._0_4_ = auVar4._16_4_;
        uStack_5b90._4_4_ = auVar4._20_4_;
        uStack_5b88._0_4_ = auVar4._24_4_;
        uStack_5b88._4_4_ = auVar4._28_4_;
        local_5da0._4_4_ = local_5ba0._4_4_ + 1.0;
        local_5da0._0_4_ = (float)local_5ba0 + 1.0;
        uStack_5d98._0_4_ = (float)uStack_5b98 + 1.0;
        uStack_5d98._4_4_ = uStack_5b98._4_4_ + 1.0;
        uStack_5d90._0_4_ = (float)uStack_5b90 + 1.0;
        uStack_5d90._4_4_ = uStack_5b90._4_4_ + 1.0;
        auVar234 = _local_5da0;
        uStack_5d88._0_4_ = (float)uStack_5b88 + 1.0;
        uStack_5d88._4_4_ = uStack_5b88._4_4_ + 1.0;
        auVar5 = _local_5da0;
        auVar247._8_4_ = 0x3f3504f3;
        auVar247._0_8_ = 0x3f3504f33f3504f3;
        auVar247._12_4_ = 0x3f3504f3;
        auVar247._16_4_ = 0x3f3504f3;
        auVar247._20_4_ = 0x3f3504f3;
        auVar247._24_4_ = 0x3f3504f3;
        auVar247._28_4_ = 0x3f3504f3;
        local_5dc0 = vcmpps_avx(auVar237,auVar247,1);
        local_5d20 = auVar237._0_8_;
        local_4980 = local_5d20;
        uStack_5d18 = auVar237._8_8_;
        uStack_4978 = uStack_5d18;
        uStack_5d10 = auVar237._16_8_;
        uStack_4970 = uStack_5d10;
        uStack_5d08 = auVar237._24_8_;
        uStack_4968 = uStack_5d08;
        local_49a0 = local_5dc0._0_8_;
        uStack_4998 = local_5dc0._8_8_;
        uStack_4990 = local_5dc0._16_8_;
        uStack_4988 = local_5dc0._24_8_;
        local_5de0 = vpand_avx2(local_5dc0,auVar237);
        local_4ec0 = local_5d20;
        uStack_4eb8 = uStack_5d18;
        uStack_4eb0 = uStack_5d10;
        uStack_4ea8 = uStack_5d08;
        local_4ee0 = 0x3f8000003f800000;
        uStack_4ed8 = 0x3f8000003f800000;
        uStack_4ed0 = 0x3f8000003f800000;
        uStack_4ec8 = 0x3f8000003f800000;
        auVar244._8_8_ = 0x3f8000003f800000;
        auVar244._0_8_ = 0x3f8000003f800000;
        auVar244._16_8_ = 0x3f8000003f800000;
        auVar244._24_8_ = 0x3f8000003f800000;
        auVar4 = vsubps_avx(auVar237,auVar244);
        local_4f00 = local_5da0;
        uStack_4ef8 = uStack_5d98;
        uStack_5d90 = auVar234._16_8_;
        uStack_4ef0 = uStack_5d90;
        uStack_5d88 = auVar5._24_8_;
        uStack_4ee8 = uStack_5d88;
        local_49c0 = 0x3f8000003f800000;
        uStack_49b8 = 0x3f8000003f800000;
        uStack_49b0 = 0x3f8000003f800000;
        uStack_49a8 = 0x3f8000003f800000;
        local_49e0 = local_5dc0._0_8_;
        uStack_49d8 = local_5dc0._8_8_;
        uStack_49d0 = local_5dc0._16_8_;
        uStack_49c8 = local_5dc0._24_8_;
        auVar50._8_8_ = 0x3f8000003f800000;
        auVar50._0_8_ = 0x3f8000003f800000;
        auVar50._16_8_ = 0x3f8000003f800000;
        auVar50._24_8_ = 0x3f8000003f800000;
        local_4f20 = vpand_avx2(local_5dc0,auVar50);
        auVar35._16_8_ = uStack_5d90;
        auVar35._0_16_ = _local_5da0;
        auVar35._24_8_ = uStack_5d88;
        _local_5da0 = vsubps_avx(auVar35,local_4f20);
        local_5d20 = auVar4._0_8_;
        uVar15 = local_5d20;
        uStack_5d18 = auVar4._8_8_;
        uVar16 = uStack_5d18;
        uStack_5d10 = auVar4._16_8_;
        uVar17 = uStack_5d10;
        uStack_5d08 = auVar4._24_8_;
        uVar18 = uStack_5d08;
        local_5be0._0_4_ = auVar4._0_4_;
        local_5be0._4_4_ = auVar4._4_4_;
        uStack_5bd8._0_4_ = auVar4._8_4_;
        uStack_5bd8._4_4_ = auVar4._12_4_;
        uStack_5bd0._0_4_ = auVar4._16_4_;
        uStack_5bd0._4_4_ = auVar4._20_4_;
        uStack_5bc8._0_4_ = auVar4._24_4_;
        uStack_5bc8._4_4_ = auVar4._28_4_;
        local_5c00._0_4_ = local_5de0._0_4_;
        local_5c00._4_4_ = local_5de0._4_4_;
        uStack_5bf8._0_4_ = local_5de0._8_4_;
        uStack_5bf8._4_4_ = local_5de0._12_4_;
        uStack_5bf0._0_4_ = local_5de0._16_4_;
        uStack_5bf0._4_4_ = local_5de0._20_4_;
        uStack_5be8._0_4_ = local_5de0._24_4_;
        uStack_5be8._4_4_ = local_5de0._28_4_;
        local_5d20._0_4_ = (float)local_5c00 + (float)local_5be0;
        local_5d20._4_4_ = local_5c00._4_4_ + local_5be0._4_4_;
        uStack_5bf8._0_4_ = (float)uStack_5bf8 + (float)uStack_5bd8;
        uStack_5bf8._4_4_ = uStack_5bf8._4_4_ + uStack_5bd8._4_4_;
        uStack_5bf0._0_4_ = (float)uStack_5bf0 + (float)uStack_5bd0;
        uStack_5bf0._4_4_ = uStack_5bf0._4_4_ + uStack_5bd0._4_4_;
        uStack_5be8._0_4_ = (float)uStack_5be8 + (float)uStack_5bc8;
        fStack_5de4 = uStack_5be8._4_4_ + uStack_5bc8._4_4_;
        uStack_5d18._0_4_ = (float)uStack_5bf8;
        uStack_5d18._4_4_ = uStack_5bf8._4_4_;
        uStack_5d10._0_4_ = (float)uStack_5bf0;
        uStack_5d10._4_4_ = uStack_5bf0._4_4_;
        auVar234 = _local_5d20;
        uStack_5d08._0_4_ = (float)uStack_5be8;
        uStack_5d08._4_4_ = fStack_5de4;
        auVar237 = _local_5d20;
        local_5c80 = local_5d20;
        uStack_5c78 = uStack_5d18;
        uStack_5d10 = auVar234._16_8_;
        uStack_5c70 = uStack_5d10;
        uStack_5d08 = auVar237._24_8_;
        uStack_5c68 = uStack_5d08;
        local_5e00 = (float)local_5d20._0_4_ * (float)local_5d20._0_4_;
        fStack_5dfc = (float)local_5d20._4_4_ * (float)local_5d20._4_4_;
        fStack_5df8 = (float)uStack_5bf8 * (float)uStack_5bf8;
        fStack_5df4 = uStack_5bf8._4_4_ * uStack_5bf8._4_4_;
        fStack_5df0 = (float)uStack_5bf0 * (float)uStack_5bf0;
        fStack_5dec = uStack_5bf0._4_4_ * uStack_5bf0._4_4_;
        fStack_5de8 = (float)uStack_5be8 * (float)uStack_5be8;
        uStack_5e18._0_4_ = 0x3d9021bb;
        local_5e20 = (undefined1  [8])0x3d9021bb3d9021bb;
        uStack_5e18._4_4_ = 0x3d9021bb;
        uStack_5e10._0_4_ = 0x3d9021bb;
        uStack_5e10._4_4_ = 0x3d9021bb;
        auVar234 = _local_5e20;
        uStack_5e08._0_4_ = 0.070376836;
        uStack_5e08._4_4_ = 0x3d9021bb;
        auVar4 = _local_5e20;
        local_43e0 = local_5e20;
        local_43f8 = local_5d20;
        local_4320 = ::_ps256_cephes_log_p1;
        local_3c40 = 0x3d9021bb3d9021bb;
        uStack_3c38 = uStack_5e18;
        uStack_5e10 = auVar234._16_8_;
        uStack_3c30 = uStack_5e10;
        uStack_5e08 = auVar4._24_8_;
        uStack_3c28 = uStack_5e08;
        local_3c60 = local_5d20;
        uStack_3c58 = uStack_5d18;
        uStack_3c50 = uStack_5d10;
        uStack_3c48 = uStack_5d08;
        local_3c80[0] = -0.1151461;
        local_3c80[1] = -0.1151461;
        afStack_3c78[0] = -0.1151461;
        afStack_3c78[1] = -0.1151461;
        afStack_3c70[0] = -0.1151461;
        afStack_3c70[1] = -0.1151461;
        afStack_3c68[0] = -0.1151461;
        afStack_3c68[1] = -0.1151461;
        auVar68._8_4_ = -0.1151461;
        auVar68._12_4_ = -0.1151461;
        auVar68._0_4_ = -0.1151461;
        auVar68._4_4_ = -0.1151461;
        auVar68._16_4_ = -0.1151461;
        auVar68._20_4_ = -0.1151461;
        auVar68._24_4_ = -0.1151461;
        auVar68._28_4_ = -0.1151461;
        auVar7 = vfmadd213ps_fma(auVar237,auVar4,auVar68);
        local_4338 = ::_ps256_cephes_log_p2;
        local_5e20 = auVar7._0_8_;
        local_3be0 = local_5e20;
        uStack_5e18 = auVar7._8_8_;
        uStack_3bd8 = uStack_5e18;
        uStack_3bd0 = 0;
        uStack_3bc8 = 0;
        local_3c00 = local_5d20;
        uStack_3bf8 = uStack_5d18;
        uStack_3bf0 = uStack_5d10;
        uStack_3be8 = uStack_5d08;
        local_3c20[0] = 0.116769984;
        local_3c20[1] = 0.116769984;
        afStack_3c18[0] = 0.116769984;
        afStack_3c18[1] = 0.116769984;
        afStack_3c10[0] = 0.116769984;
        afStack_3c10[1] = 0.116769984;
        afStack_3c08[0] = 0.116769984;
        afStack_3c08[1] = 0.116769984;
        auVar69._8_4_ = 0.116769984;
        auVar69._12_4_ = 0.116769984;
        auVar69._0_4_ = 0.116769984;
        auVar69._4_4_ = 0.116769984;
        auVar69._16_4_ = 0.116769984;
        auVar69._20_4_ = 0.116769984;
        auVar69._24_4_ = 0.116769984;
        auVar69._28_4_ = 0.116769984;
        auVar7 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar7),auVar69);
        local_4350 = ::_ps256_cephes_log_p3;
        local_5e20 = auVar7._0_8_;
        local_3b80 = local_5e20;
        uStack_5e18 = auVar7._8_8_;
        uStack_3b78 = uStack_5e18;
        uStack_3b70 = 0;
        uStack_3b68 = 0;
        local_3ba0 = local_5d20;
        uStack_3b98 = uStack_5d18;
        uStack_3b90 = uStack_5d10;
        uStack_3b88 = uStack_5d08;
        local_3bc0[0] = -0.12420141;
        local_3bc0[1] = -0.12420141;
        afStack_3bb8[0] = -0.12420141;
        afStack_3bb8[1] = -0.12420141;
        afStack_3bb0[0] = -0.12420141;
        afStack_3bb0[1] = -0.12420141;
        afStack_3ba8[0] = -0.12420141;
        afStack_3ba8[1] = -0.12420141;
        auVar70._8_4_ = -0.12420141;
        auVar70._12_4_ = -0.12420141;
        auVar70._0_4_ = -0.12420141;
        auVar70._4_4_ = -0.12420141;
        auVar70._16_4_ = -0.12420141;
        auVar70._20_4_ = -0.12420141;
        auVar70._24_4_ = -0.12420141;
        auVar70._28_4_ = -0.12420141;
        auVar7 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar7),auVar70);
        local_4368 = ::_ps256_cephes_log_p4;
        local_5e20 = auVar7._0_8_;
        local_3b20 = local_5e20;
        uStack_5e18 = auVar7._8_8_;
        uStack_3b18 = uStack_5e18;
        uStack_3b10 = 0;
        uStack_3b08 = 0;
        local_3b40 = local_5d20;
        uStack_3b38 = uStack_5d18;
        uStack_3b30 = uStack_5d10;
        uStack_3b28 = uStack_5d08;
        local_3b60[0] = 0.14249323;
        local_3b60[1] = 0.14249323;
        afStack_3b58[0] = 0.14249323;
        afStack_3b58[1] = 0.14249323;
        afStack_3b50[0] = 0.14249323;
        afStack_3b50[1] = 0.14249323;
        afStack_3b48[0] = 0.14249323;
        afStack_3b48[1] = 0.14249323;
        auVar71._8_4_ = 0.14249323;
        auVar71._12_4_ = 0.14249323;
        auVar71._0_4_ = 0.14249323;
        auVar71._4_4_ = 0.14249323;
        auVar71._16_4_ = 0.14249323;
        auVar71._20_4_ = 0.14249323;
        auVar71._24_4_ = 0.14249323;
        auVar71._28_4_ = 0.14249323;
        auVar7 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar7),auVar71);
        local_4380 = ::_ps256_cephes_log_p5;
        local_5e20 = auVar7._0_8_;
        local_3ac0 = local_5e20;
        uStack_5e18 = auVar7._8_8_;
        uStack_3ab8 = uStack_5e18;
        uStack_3ab0 = 0;
        uStack_3aa8 = 0;
        local_3ae0 = local_5d20;
        uStack_3ad8 = uStack_5d18;
        uStack_3ad0 = uStack_5d10;
        uStack_3ac8 = uStack_5d08;
        local_3b00[0] = -0.16668057;
        local_3b00[1] = -0.16668057;
        afStack_3af8[0] = -0.16668057;
        afStack_3af8[1] = -0.16668057;
        afStack_3af0[0] = -0.16668057;
        afStack_3af0[1] = -0.16668057;
        afStack_3ae8[0] = -0.16668057;
        afStack_3ae8[1] = -0.16668057;
        auVar72._8_4_ = -0.16668057;
        auVar72._12_4_ = -0.16668057;
        auVar72._0_4_ = -0.16668057;
        auVar72._4_4_ = -0.16668057;
        auVar72._16_4_ = -0.16668057;
        auVar72._20_4_ = -0.16668057;
        auVar72._24_4_ = -0.16668057;
        auVar72._28_4_ = -0.16668057;
        auVar7 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar7),auVar72);
        local_4398 = ::_ps256_cephes_log_p6;
        local_5e20 = auVar7._0_8_;
        local_3a60 = local_5e20;
        uStack_5e18 = auVar7._8_8_;
        uStack_3a58 = uStack_5e18;
        uStack_3a50 = 0;
        uStack_3a48 = 0;
        local_3a80 = local_5d20;
        uStack_3a78 = uStack_5d18;
        uStack_3a70 = uStack_5d10;
        uStack_3a68 = uStack_5d08;
        local_3aa0[0] = 0.20000714;
        local_3aa0[1] = 0.20000714;
        afStack_3a98[0] = 0.20000714;
        afStack_3a98[1] = 0.20000714;
        afStack_3a90[0] = 0.20000714;
        afStack_3a90[1] = 0.20000714;
        afStack_3a88[0] = 0.20000714;
        afStack_3a88[1] = 0.20000714;
        auVar73._8_4_ = 0.20000714;
        auVar73._12_4_ = 0.20000714;
        auVar73._0_4_ = 0.20000714;
        auVar73._4_4_ = 0.20000714;
        auVar73._16_4_ = 0.20000714;
        auVar73._20_4_ = 0.20000714;
        auVar73._24_4_ = 0.20000714;
        auVar73._28_4_ = 0.20000714;
        auVar7 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar7),auVar73);
        local_43b0 = ::_ps256_cephes_log_p7;
        local_5e20 = auVar7._0_8_;
        local_3a00 = local_5e20;
        uStack_5e18 = auVar7._8_8_;
        uStack_39f8 = uStack_5e18;
        uStack_39f0 = 0;
        uStack_39e8 = 0;
        local_3a20 = local_5d20;
        uStack_3a18 = uStack_5d18;
        uStack_3a10 = uStack_5d10;
        uStack_3a08 = uStack_5d08;
        local_3a40[0] = -0.24999994;
        local_3a40[1] = -0.24999994;
        afStack_3a38[0] = -0.24999994;
        afStack_3a38[1] = -0.24999994;
        afStack_3a30[0] = -0.24999994;
        afStack_3a30[1] = -0.24999994;
        afStack_3a28[0] = -0.24999994;
        afStack_3a28[1] = -0.24999994;
        auVar74._8_4_ = -0.24999994;
        auVar74._12_4_ = -0.24999994;
        auVar74._0_4_ = -0.24999994;
        auVar74._4_4_ = -0.24999994;
        auVar74._16_4_ = -0.24999994;
        auVar74._20_4_ = -0.24999994;
        auVar74._24_4_ = -0.24999994;
        auVar74._28_4_ = -0.24999994;
        auVar7 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar7),auVar74);
        local_43c8 = ::_ps256_cephes_log_p8;
        local_5e20 = auVar7._0_8_;
        local_39a0 = local_5e20;
        uStack_5e18 = auVar7._8_8_;
        uStack_3998 = uStack_5e18;
        uStack_3990 = 0;
        uStack_3988 = 0;
        local_39c0 = local_5d20;
        uStack_39b8 = uStack_5d18;
        uStack_39b0 = uStack_5d10;
        uStack_39a8 = uStack_5d08;
        local_39e0[0] = 0.3333333;
        local_39e0[1] = 0.3333333;
        afStack_39d8[0] = 0.3333333;
        afStack_39d8[1] = 0.3333333;
        afStack_39d0[0] = 0.3333333;
        afStack_39d0[1] = 0.3333333;
        afStack_39c8[0] = 0.3333333;
        afStack_39c8[1] = 0.3333333;
        auVar75._8_4_ = 0.3333333;
        auVar75._12_4_ = 0.3333333;
        auVar75._0_4_ = 0.3333333;
        auVar75._4_4_ = 0.3333333;
        auVar75._16_4_ = 0.3333333;
        auVar75._20_4_ = 0.3333333;
        auVar75._24_4_ = 0.3333333;
        auVar75._28_4_ = 0.3333333;
        auVar7 = vfmadd213ps_fma(auVar237,ZEXT1632(auVar7),auVar75);
        local_5e20 = auVar7._0_8_;
        uVar19 = local_5e20;
        uStack_5e18 = auVar7._8_8_;
        uVar20 = uStack_5e18;
        uStack_5c90 = 0;
        uStack_5c88 = 0;
        local_5cc0 = local_5d20;
        uStack_5cb8 = uStack_5d18;
        uStack_5cb0 = uStack_5d10;
        uStack_5ca8 = uStack_5d08;
        local_5ca0._0_4_ = auVar7._0_4_;
        local_5ca0._4_4_ = auVar7._4_4_;
        uStack_5c98._0_4_ = auVar7._8_4_;
        uStack_5c98._4_4_ = auVar7._12_4_;
        local_5e20._4_4_ = (float)local_5d20._4_4_ * local_5ca0._4_4_;
        local_5e20._0_4_ = (float)local_5d20._0_4_ * (float)local_5ca0;
        uStack_5e18._0_4_ = (float)uStack_5bf8 * (float)uStack_5c98;
        uStack_5e18._4_4_ = uStack_5bf8._4_4_ * uStack_5c98._4_4_;
        uStack_5e10._0_4_ = (float)uStack_5bf0 * 0.0;
        uStack_5e10._4_4_ = uStack_5bf0._4_4_ * 0.0;
        auVar234 = _local_5e20;
        local_5ce0 = local_5e20;
        uStack_5cd8 = uStack_5e18;
        uStack_5e10 = auVar234._16_8_;
        uStack_5cd0 = uStack_5e10;
        uStack_5e08 = (ulong)(uint)((float)uStack_5be8 * 0.0);
        uStack_5cc8 = uStack_5e08;
        local_5d00 = CONCAT44(fStack_5dfc,local_5e00);
        uStack_5cf8 = CONCAT44(fStack_5df4,fStack_5df8);
        uStack_5cf0 = CONCAT44(fStack_5dec,fStack_5df0);
        uStack_5ce8 = CONCAT44(fStack_5de4,fStack_5de8);
        uStack_5e08._0_4_ = fStack_5de8 * (float)uStack_5be8 * 0.0;
        local_5e20._4_4_ = fStack_5dfc * (float)local_5d20._4_4_ * local_5ca0._4_4_;
        local_5e20._0_4_ = local_5e00 * (float)local_5d20._0_4_ * (float)local_5ca0;
        uStack_5e18._0_4_ = fStack_5df8 * (float)uStack_5bf8 * (float)uStack_5c98;
        uStack_5e18._4_4_ = fStack_5df4 * uStack_5bf8._4_4_ * uStack_5c98._4_4_;
        uStack_5e10._0_4_ = fStack_5df0 * (float)uStack_5bf0 * 0.0;
        uStack_5e10._4_4_ = fStack_5dec * uStack_5bf0._4_4_ * 0.0;
        auVar234 = _local_5e20;
        uStack_5e08._4_4_ = 0;
        auVar4 = _local_5e20;
        local_43e8 = local_5da0;
        local_43d8 = ::_ps256_cephes_log_q1;
        local_3940 = local_5da0;
        uStack_3938 = uStack_5d98;
        uStack_3930 = uStack_5d90;
        uStack_3928 = uStack_5d88;
        local_3960[0] = -0.00021219444;
        local_3960[1] = -0.00021219444;
        afStack_3958[0] = -0.00021219444;
        afStack_3958[1] = -0.00021219444;
        afStack_3950[0] = -0.00021219444;
        afStack_3950[1] = -0.00021219444;
        afStack_3948[0] = -0.00021219444;
        afStack_3948[1] = -0.00021219444;
        local_3980 = local_5e20;
        uStack_3978 = uStack_5e18;
        uStack_5e10 = auVar234._16_8_;
        uStack_3970 = uStack_5e10;
        uStack_5e08 = (ulong)(uint)(float)uStack_5e08;
        uStack_3968 = uStack_5e08;
        auVar76._8_4_ = -0.00021219444;
        auVar76._12_4_ = -0.00021219444;
        auVar76._0_4_ = -0.00021219444;
        auVar76._4_4_ = -0.00021219444;
        auVar76._16_4_ = -0.00021219444;
        auVar76._20_4_ = -0.00021219444;
        auVar76._24_4_ = -0.00021219444;
        auVar76._28_4_ = -0.00021219444;
        auVar7 = vfmadd213ps_fma(auVar76,_local_5da0,auVar4);
        local_4148 = &local_5e00;
        local_4150 = ::_ps256_0p5;
        local_2da0 = CONCAT44(fStack_5dfc,local_5e00);
        uStack_2d98 = CONCAT44(fStack_5df4,fStack_5df8);
        uStack_2d90 = CONCAT44(fStack_5dec,fStack_5df0);
        uStack_2d88 = CONCAT44(fStack_5de4,fStack_5de8);
        auVar231._4_4_ = fStack_5dfc;
        auVar231._0_4_ = local_5e00;
        auVar231._8_4_ = fStack_5df8;
        auVar231._12_4_ = fStack_5df4;
        auVar231._16_4_ = fStack_5df0;
        auVar231._20_4_ = fStack_5dec;
        auVar231._24_4_ = fStack_5de8;
        auVar231._28_4_ = fStack_5de4;
        local_2dc0[0] = 0.5;
        local_2dc0[1] = 0.5;
        afStack_2db8[0] = 0.5;
        afStack_2db8[1] = 0.5;
        afStack_2db0[0] = 0.5;
        afStack_2db0[1] = 0.5;
        afStack_2da8[0] = 0.5;
        afStack_2da8[1] = 0.5;
        local_5e20 = auVar7._0_8_;
        local_2de0 = local_5e20;
        uStack_5e18 = auVar7._8_8_;
        uStack_2dd8 = uStack_5e18;
        uStack_2dd0 = 0;
        uStack_2dc8 = 0;
        auVar106._8_4_ = 0.5;
        auVar106._12_4_ = 0.5;
        auVar106._0_4_ = 0.5;
        auVar106._4_4_ = 0.5;
        auVar106._16_4_ = 0.5;
        auVar106._20_4_ = 0.5;
        auVar106._24_4_ = 0.5;
        auVar106._28_4_ = 0.5;
        auVar7 = vfnmadd213ps_fma(auVar106,auVar231,ZEXT1632(auVar7));
        local_5c20 = local_5d20;
        uStack_5c18 = uStack_5d18;
        uStack_5c10 = uStack_5d10;
        uStack_5c08 = uStack_5d08;
        local_5e20 = auVar7._0_8_;
        uVar21 = local_5e20;
        uStack_5e18 = auVar7._8_8_;
        uVar22 = uStack_5e18;
        uStack_5c30 = 0;
        uStack_5c28 = 0;
        local_5c40._0_4_ = auVar7._0_4_;
        local_5c40._4_4_ = auVar7._4_4_;
        uStack_5c38._0_4_ = auVar7._8_4_;
        uStack_5c38._4_4_ = auVar7._12_4_;
        local_5d20._4_4_ = local_5c40._4_4_ + (float)local_5d20._4_4_;
        local_5d20._0_4_ = (float)local_5c40 + (float)local_5d20._0_4_;
        uStack_5d18._0_4_ = (float)uStack_5c38 + (float)uStack_5bf8;
        uStack_5d18._4_4_ = uStack_5c38._4_4_ + uStack_5bf8._4_4_;
        uStack_5d10._0_4_ = (float)uStack_5bf0 + 0.0;
        uStack_5d10._4_4_ = uStack_5bf0._4_4_ + 0.0;
        auVar234 = _local_5d20;
        uStack_5d08._0_4_ = (float)uStack_5be8 + 0.0;
        uStack_5d08._4_4_ = fStack_5de4 + 0.0;
        auVar4 = _local_5d20;
        local_43f0 = ::_ps256_cephes_log_q2;
        local_38e0 = local_5da0;
        uStack_38d8 = uStack_5d98;
        uStack_38d0 = uStack_5d90;
        uStack_38c8 = uStack_5d88;
        local_3900[0] = 0.6933594;
        local_3900[1] = 0.6933594;
        afStack_38f8[0] = 0.6933594;
        afStack_38f8[1] = 0.6933594;
        afStack_38f0[0] = 0.6933594;
        afStack_38f0[1] = 0.6933594;
        afStack_38e8[0] = 0.6933594;
        afStack_38e8[1] = 0.6933594;
        local_3920 = local_5d20;
        uStack_3918 = uStack_5d18;
        uStack_5d10 = auVar234._16_8_;
        uStack_3910 = uStack_5d10;
        uStack_5d08 = auVar4._24_8_;
        uStack_3908 = uStack_5d08;
        auVar77._8_4_ = 0.6933594;
        auVar77._12_4_ = 0.6933594;
        auVar77._0_4_ = 0.6933594;
        auVar77._4_4_ = 0.6933594;
        auVar77._16_4_ = 0.6933594;
        auVar77._20_4_ = 0.6933594;
        auVar77._24_4_ = 0.6933594;
        auVar77._28_4_ = 0.6933594;
        auVar1 = vfmadd213ps_fma(auVar77,_local_5da0,auVar4);
        local_5d20 = auVar1._0_8_;
        local_4840 = local_5d20;
        uStack_5d18 = auVar1._8_8_;
        uStack_4838 = uStack_5d18;
        uStack_4830 = 0;
        uStack_4828 = 0;
        local_4860 = local_5d80._0_8_;
        uStack_4858 = local_5d80._8_8_;
        uStack_4850 = local_5d80._16_8_;
        uStack_4848 = local_5d80._24_8_;
        _local_5e20 = vpor_avx2(local_5d80,ZEXT1632(auVar1));
        local_6060 = local_5e20;
        uStack_6058 = uStack_5e18;
        uStack_6050 = uStack_5e10;
        uStack_6048 = uStack_5e08;
        local_56b4 = 0x3f800000;
        local_22e0 = 0x3f800000;
        auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
        local_2300 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
        auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
        auStack_22f0 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
        local_6080 = local_2300._0_8_;
        uStack_6078 = local_2300._8_8_;
        uStack_6070 = auStack_22f0._0_8_;
        uStack_6068 = auStack_22f0._8_8_;
        local_56b8 = 0x40000000;
        local_22a0 = 0x40000000;
        auVar7 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x20);
        local_22c0 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x30);
        auVar7 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x20);
        auStack_22b0 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x30);
        local_60a0 = local_22c0._0_8_;
        uStack_6098 = local_22c0._8_8_;
        uStack_6090 = auStack_22b0._0_8_;
        uStack_6088 = auStack_22b0._8_8_;
        local_6020._0_4_ = local_5e20._0_4_;
        local_6020._4_4_ = local_5e20._4_4_;
        uStack_6018._0_4_ = local_5e20._8_4_;
        uStack_6018._4_4_ = local_5e20._12_4_;
        uStack_6010._0_4_ = local_5e20._16_4_;
        uStack_6010._4_4_ = local_5e20._20_4_;
        uStack_6008._0_4_ = local_5e20._24_4_;
        uStack_6008._4_4_ = local_5e20._28_4_;
        uStack_55a4 = uStack_6008._4_4_;
        local_6040._0_4_ = local_22c0._0_4_;
        local_6040._4_4_ = local_22c0._4_4_;
        uStack_6038._0_4_ = local_22c0._8_4_;
        uStack_6038._4_4_ = local_22c0._12_4_;
        uStack_6030._0_4_ = auStack_22b0._0_4_;
        uStack_6030._4_4_ = auStack_22b0._4_4_;
        uStack_6028._0_4_ = auStack_22b0._8_4_;
        local_55c0 = (float)local_6040 * (float)local_6020;
        fStack_55bc = local_6040._4_4_ * local_6020._4_4_;
        fStack_55b8 = (float)uStack_6038 * (float)uStack_6018;
        fStack_55b4 = uStack_6038._4_4_ * uStack_6018._4_4_;
        fStack_55b0 = (float)uStack_6030 * (float)uStack_6010;
        fStack_55ac = uStack_6030._4_4_ * uStack_6010._4_4_;
        fStack_55a8 = (float)uStack_6028 * (float)uStack_6008;
        local_5384 = 0x3f800000;
        local_2420 = 0x3f800000;
        auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
        local_2440 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
        auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
        auStack_2430 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
        local_55e0._0_4_ = local_2440._0_4_;
        local_5580 = (float)local_55e0;
        local_55e0._4_4_ = local_2440._4_4_;
        fStack_557c = local_55e0._4_4_;
        uStack_55d8._0_4_ = local_2440._8_4_;
        fStack_5578 = (float)uStack_55d8;
        uStack_55d8._4_4_ = local_2440._12_4_;
        fStack_5574 = uStack_55d8._4_4_;
        uStack_55d0._0_4_ = auStack_2430._0_4_;
        fStack_5570 = (float)uStack_55d0;
        uStack_55d0._4_4_ = auStack_2430._4_4_;
        fStack_556c = uStack_55d0._4_4_;
        uStack_55c8._0_4_ = auStack_2430._8_4_;
        fStack_5568 = (float)uStack_55c8;
        uStack_55c8._4_4_ = auStack_2430._12_4_;
        fStack_5564 = uStack_55c8._4_4_;
        local_4dc0 = 0;
        uStack_4db8 = 0;
        uStack_4db0 = 0;
        uStack_4da8 = 0;
        local_4fc0 = 0;
        uStack_4fb8 = 0;
        uStack_4fb0 = 0;
        uStack_4fa8 = 0;
        local_4fe0 = CONCAT44(fStack_55bc,local_55c0);
        uStack_4fd8 = CONCAT44(fStack_55b4,fStack_55b8);
        uStack_4fd0 = CONCAT44(fStack_55ac,fStack_55b0);
        uStack_4fc8 = CONCAT44(uStack_6008._4_4_,fStack_55a8);
        auVar34._8_8_ = uStack_4fd8;
        auVar34._0_8_ = local_4fe0;
        auVar34._16_8_ = uStack_4fd0;
        auVar34._24_8_ = uStack_4fc8;
        auVar4 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar34);
        local_4de0 = 0;
        uStack_4dd8 = 0;
        uStack_4dd0 = 0;
        uStack_4dc8 = 0;
        local_5500 = 0x3f800000;
        uStack_54fc = 0x3f800000;
        uStack_54f8 = 0x3f800000;
        uStack_54f4 = 0x3f800000;
        uStack_54f0 = 0x3f800000;
        uStack_54ec = 0x3f800000;
        uStack_54e8 = 0x3f800000;
        uStack_54e4 = 0x3f800000;
        local_5480._0_8_ = auVar4._0_8_;
        local_2a20 = local_5480._0_8_;
        local_5480._8_8_ = auVar4._8_8_;
        uStack_2a18 = local_5480._8_8_;
        local_5480._16_8_ = auVar4._16_8_;
        uStack_2a10 = local_5480._16_8_;
        local_5480._24_8_ = auVar4._24_8_;
        uStack_2a08 = local_5480._24_8_;
        local_2a40 = 0x42b0c0a5;
        uStack_2a3c = 0x42b0c0a5;
        uStack_2a38 = 0x42b0c0a5;
        uStack_2a34 = 0x42b0c0a5;
        uStack_2a30 = 0x42b0c0a5;
        uStack_2a2c = 0x42b0c0a5;
        uStack_2a28 = 0x42b0c0a5;
        uStack_2a24 = 0x42b0c0a5;
        auVar116._8_4_ = 0x42b0c0a5;
        auVar116._0_8_ = 0x42b0c0a542b0c0a5;
        auVar116._12_4_ = 0x42b0c0a5;
        auVar116._16_4_ = 0x42b0c0a5;
        auVar116._20_4_ = 0x42b0c0a5;
        auVar116._24_4_ = 0x42b0c0a5;
        auVar116._28_4_ = 0x42b0c0a5;
        auVar4 = vminps_avx(auVar4,auVar116);
        local_5480._0_8_ = auVar4._0_8_;
        local_4cc0 = local_5480._0_8_;
        local_5480._8_8_ = auVar4._8_8_;
        uStack_4cb8 = local_5480._8_8_;
        local_5480._16_8_ = auVar4._16_8_;
        uStack_4cb0 = local_5480._16_8_;
        local_5480._24_8_ = auVar4._24_8_;
        uStack_4ca8 = local_5480._24_8_;
        local_4ce0 = 0xc2b0c0a5;
        uStack_4cdc = 0xc2b0c0a5;
        uStack_4cd8 = 0xc2b0c0a5;
        uStack_4cd4 = 0xc2b0c0a5;
        uStack_4cd0 = 0xc2b0c0a5;
        uStack_4ccc = 0xc2b0c0a5;
        uStack_4cc8 = 0xc2b0c0a5;
        uStack_4cc4 = 0xc2b0c0a5;
        auVar39._8_4_ = 0xc2b0c0a5;
        auVar39._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar39._12_4_ = 0xc2b0c0a5;
        auVar39._16_4_ = 0xc2b0c0a5;
        auVar39._20_4_ = 0xc2b0c0a5;
        auVar39._24_4_ = 0xc2b0c0a5;
        auVar39._28_4_ = 0xc2b0c0a5;
        auVar237 = vmaxps_avx(auVar4,auVar39);
        local_45f0 = local_5480;
        local_4558 = ::_ps256_cephes_LOG2EF;
        local_4560 = ::_ps256_0p5;
        local_5480._0_8_ = auVar237._0_8_;
        local_3340 = local_5480._0_8_;
        local_5480._8_8_ = auVar237._8_8_;
        uStack_3338 = local_5480._8_8_;
        local_5480._16_8_ = auVar237._16_8_;
        uStack_3330 = local_5480._16_8_;
        local_5480._24_8_ = auVar237._24_8_;
        uStack_3328 = local_5480._24_8_;
        local_3360[0] = 1.442695;
        local_3360[1] = 1.442695;
        afStack_3358[0] = 1.442695;
        afStack_3358[1] = 1.442695;
        afStack_3350[0] = 1.442695;
        afStack_3350[1] = 1.442695;
        afStack_3348[0] = 1.442695;
        afStack_3348[1] = 1.442695;
        local_3380[0] = 0.5;
        local_3380[1] = 0.5;
        afStack_3378[0] = 0.5;
        afStack_3378[1] = 0.5;
        afStack_3370[0] = 0.5;
        afStack_3370[1] = 0.5;
        afStack_3368[0] = 0.5;
        afStack_3368[1] = 0.5;
        auVar92._8_4_ = 1.442695;
        auVar92._12_4_ = 1.442695;
        auVar92._0_4_ = 1.442695;
        auVar92._4_4_ = 1.442695;
        auVar92._16_4_ = 1.442695;
        auVar92._20_4_ = 1.442695;
        auVar92._24_4_ = 1.442695;
        auVar92._28_4_ = 1.442695;
        auVar91._8_4_ = 0.5;
        auVar91._12_4_ = 0.5;
        auVar91._0_4_ = 0.5;
        auVar91._4_4_ = 0.5;
        auVar91._16_4_ = 0.5;
        auVar91._20_4_ = 0.5;
        auVar91._24_4_ = 0.5;
        auVar91._28_4_ = 0.5;
        auVar7 = vfmadd213ps_fma(auVar92,auVar237,auVar91);
        auVar5 = vroundps_avx(ZEXT1632(auVar7),1);
        auVar4 = vcmpps_avx(ZEXT1632(auVar7),auVar5,1);
        local_5520._0_8_ = auVar4._0_8_;
        local_4a80 = local_5520._0_8_;
        local_5520._8_8_ = auVar4._8_8_;
        uStack_4a78 = local_5520._8_8_;
        local_5520._16_8_ = auVar4._16_8_;
        uStack_4a70 = local_5520._16_8_;
        local_5520._24_8_ = auVar4._24_8_;
        uStack_4a68 = local_5520._24_8_;
        local_4aa0 = 0x3f8000003f800000;
        uStack_4a98 = 0x3f8000003f800000;
        uStack_4a90 = 0x3f8000003f800000;
        uStack_4a88 = 0x3f8000003f800000;
        auVar47._8_8_ = 0x3f8000003f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar47._16_8_ = 0x3f8000003f800000;
        auVar47._24_8_ = 0x3f8000003f800000;
        local_5520 = vpand_avx2(auVar4,auVar47);
        local_54a0 = auVar5._0_8_;
        local_5000 = local_54a0;
        uStack_5498 = auVar5._8_8_;
        uStack_4ff8 = uStack_5498;
        uStack_5490 = auVar5._16_8_;
        uStack_4ff0 = uStack_5490;
        uStack_5488 = auVar5._24_8_;
        uStack_4fe8 = uStack_5488;
        local_5020 = local_5520._0_8_;
        uStack_5018 = local_5520._8_8_;
        uStack_5010 = local_5520._16_8_;
        uStack_5008 = local_5520._24_8_;
        local_54c0 = vsubps_avx(auVar5,local_5520);
        local_41d8 = local_54c0;
        local_41c8 = ::_ps256_cephes_exp_C1;
        local_2bc0 = local_54c0._0_8_;
        uStack_2bb8 = local_54c0._8_8_;
        uStack_2bb0 = local_54c0._16_8_;
        uStack_2ba8 = local_54c0._24_8_;
        local_2be0[0] = 0.6933594;
        local_2be0[1] = 0.6933594;
        afStack_2bd8[0] = 0.6933594;
        afStack_2bd8[1] = 0.6933594;
        afStack_2bd0[0] = 0.6933594;
        afStack_2bd0[1] = 0.6933594;
        afStack_2bc8[0] = 0.6933594;
        afStack_2bc8[1] = 0.6933594;
        local_2c00 = local_5480._0_8_;
        uStack_2bf8 = local_5480._8_8_;
        uStack_2bf0 = local_5480._16_8_;
        uStack_2be8 = local_5480._24_8_;
        auVar111._8_4_ = 0.6933594;
        auVar111._12_4_ = 0.6933594;
        auVar111._0_4_ = 0.6933594;
        auVar111._4_4_ = 0.6933594;
        auVar111._16_4_ = 0.6933594;
        auVar111._20_4_ = 0.6933594;
        auVar111._24_4_ = 0.6933594;
        auVar111._28_4_ = 0.6933594;
        auVar7 = vfnmadd213ps_fma(auVar111,local_54c0,auVar237);
        local_41e0 = ::_ps256_cephes_exp_C2;
        local_2b60 = local_54c0._0_8_;
        uStack_2b58 = local_54c0._8_8_;
        uStack_2b50 = local_54c0._16_8_;
        uStack_2b48 = local_54c0._24_8_;
        local_2b80[0] = -0.00021219444;
        local_2b80[1] = -0.00021219444;
        afStack_2b78[0] = -0.00021219444;
        afStack_2b78[1] = -0.00021219444;
        afStack_2b70[0] = -0.00021219444;
        afStack_2b70[1] = -0.00021219444;
        afStack_2b68[0] = -0.00021219444;
        afStack_2b68[1] = -0.00021219444;
        local_5480._0_8_ = auVar7._0_8_;
        local_2ba0 = local_5480._0_8_;
        local_5480._8_8_ = auVar7._8_8_;
        uStack_2b98 = local_5480._8_8_;
        uStack_2b90 = 0;
        uStack_2b88 = 0;
        auVar112._8_4_ = -0.00021219444;
        auVar112._12_4_ = -0.00021219444;
        auVar112._0_4_ = -0.00021219444;
        auVar112._4_4_ = -0.00021219444;
        auVar112._16_4_ = -0.00021219444;
        auVar112._20_4_ = -0.00021219444;
        auVar112._24_4_ = -0.00021219444;
        auVar112._28_4_ = -0.00021219444;
        auVar7 = vfnmadd213ps_fma(auVar112,local_54c0,ZEXT1632(auVar7));
        auVar244 = ZEXT1632(auVar7);
        local_5480._0_8_ = auVar7._0_8_;
        local_5420 = local_5480._0_8_;
        local_5480._8_8_ = auVar7._8_8_;
        uStack_5418 = local_5480._8_8_;
        uStack_5410 = 0;
        uStack_5408 = 0;
        local_5400._0_4_ = auVar7._0_4_;
        local_5400._4_4_ = auVar7._4_4_;
        uStack_53f8._0_4_ = auVar7._8_4_;
        uStack_53f8._4_4_ = auVar7._12_4_;
        local_54a0._4_4_ = local_5400._4_4_ * local_5400._4_4_;
        local_54a0._0_4_ = (float)local_5400 * (float)local_5400;
        local_3120 = local_54a0;
        uStack_5498._0_4_ = (float)uStack_53f8 * (float)uStack_53f8;
        uStack_5498._4_4_ = uStack_53f8._4_4_ * uStack_53f8._4_4_;
        auVar2 = _local_54a0;
        _local_54a0 = ZEXT1632(_local_54a0);
        auVar35 = _local_54a0;
        uStack_5538._0_4_ = 0x39506967;
        local_5540 = (undefined1  [8])0x3950696739506967;
        uStack_5538._4_4_ = 0x39506967;
        uStack_5530._0_4_ = 0x39506967;
        uStack_5530._4_4_ = 0x39506967;
        auVar234 = _local_5540;
        uStack_5528._0_4_ = 0x39506967;
        uStack_5528._4_4_ = 0x39506967;
        auVar4 = _local_5540;
        local_45e0 = local_5540;
        local_4578 = ::_ps256_cephes_exp_p1;
        local_32e0 = 0x3950696739506967;
        uStack_32d8 = uStack_5538;
        uStack_5530 = auVar234._16_8_;
        uStack_32d0 = uStack_5530;
        uStack_5528 = auVar4._24_8_;
        uStack_32c8 = uStack_5528;
        local_3300 = local_5480._0_8_;
        uStack_32f8 = local_5480._8_8_;
        uStack_32f0 = 0;
        uStack_32e8 = 0;
        local_3320[0] = 0.0013981999;
        local_3320[1] = 0.0013981999;
        afStack_3318[0] = 0.0013981999;
        afStack_3318[1] = 0.0013981999;
        afStack_3310[0] = 0.0013981999;
        afStack_3310[1] = 0.0013981999;
        afStack_3308[0] = 0.0013981999;
        afStack_3308[1] = 0.0013981999;
        auVar93._8_4_ = 0.0013981999;
        auVar93._12_4_ = 0.0013981999;
        auVar93._0_4_ = 0.0013981999;
        auVar93._4_4_ = 0.0013981999;
        auVar93._16_4_ = 0.0013981999;
        auVar93._20_4_ = 0.0013981999;
        auVar93._24_4_ = 0.0013981999;
        auVar93._28_4_ = 0.0013981999;
        auVar7 = vfmadd213ps_fma(auVar244,auVar4,auVar93);
        local_4590 = ::_ps256_cephes_exp_p2;
        local_5540 = auVar7._0_8_;
        local_3280 = local_5540;
        uStack_5538 = auVar7._8_8_;
        uStack_3278 = uStack_5538;
        uStack_3270 = 0;
        uStack_3268 = 0;
        local_32a0 = local_5480._0_8_;
        uStack_3298 = local_5480._8_8_;
        uStack_3290 = 0;
        uStack_3288 = 0;
        local_32c0[0] = 0.008333452;
        local_32c0[1] = 0.008333452;
        afStack_32b8[0] = 0.008333452;
        afStack_32b8[1] = 0.008333452;
        afStack_32b0[0] = 0.008333452;
        afStack_32b0[1] = 0.008333452;
        afStack_32a8[0] = 0.008333452;
        afStack_32a8[1] = 0.008333452;
        auVar94._8_4_ = 0.008333452;
        auVar94._12_4_ = 0.008333452;
        auVar94._0_4_ = 0.008333452;
        auVar94._4_4_ = 0.008333452;
        auVar94._16_4_ = 0.008333452;
        auVar94._20_4_ = 0.008333452;
        auVar94._24_4_ = 0.008333452;
        auVar94._28_4_ = 0.008333452;
        auVar7 = vfmadd213ps_fma(auVar244,ZEXT1632(auVar7),auVar94);
        local_45a8 = ::_ps256_cephes_exp_p3;
        local_5540 = auVar7._0_8_;
        local_3220 = local_5540;
        uStack_5538 = auVar7._8_8_;
        uStack_3218 = uStack_5538;
        uStack_3210 = 0;
        uStack_3208 = 0;
        local_3240 = local_5480._0_8_;
        uStack_3238 = local_5480._8_8_;
        uStack_3230 = 0;
        uStack_3228 = 0;
        local_3260[0] = 0.041665796;
        local_3260[1] = 0.041665796;
        afStack_3258[0] = 0.041665796;
        afStack_3258[1] = 0.041665796;
        afStack_3250[0] = 0.041665796;
        afStack_3250[1] = 0.041665796;
        afStack_3248[0] = 0.041665796;
        afStack_3248[1] = 0.041665796;
        auVar95._8_4_ = 0.041665796;
        auVar95._12_4_ = 0.041665796;
        auVar95._0_4_ = 0.041665796;
        auVar95._4_4_ = 0.041665796;
        auVar95._16_4_ = 0.041665796;
        auVar95._20_4_ = 0.041665796;
        auVar95._24_4_ = 0.041665796;
        auVar95._28_4_ = 0.041665796;
        auVar7 = vfmadd213ps_fma(auVar244,ZEXT1632(auVar7),auVar95);
        local_45c0 = ::_ps256_cephes_exp_p4;
        local_5540 = auVar7._0_8_;
        local_31c0 = local_5540;
        uStack_5538 = auVar7._8_8_;
        uStack_31b8 = uStack_5538;
        uStack_31b0 = 0;
        uStack_31a8 = 0;
        local_31e0 = local_5480._0_8_;
        uStack_31d8 = local_5480._8_8_;
        uStack_31d0 = 0;
        uStack_31c8 = 0;
        local_3200[0] = 0.16666666;
        local_3200[1] = 0.16666666;
        afStack_31f8[0] = 0.16666666;
        afStack_31f8[1] = 0.16666666;
        afStack_31f0[0] = 0.16666666;
        afStack_31f0[1] = 0.16666666;
        afStack_31e8[0] = 0.16666666;
        afStack_31e8[1] = 0.16666666;
        auVar96._8_4_ = 0.16666666;
        auVar96._12_4_ = 0.16666666;
        auVar96._0_4_ = 0.16666666;
        auVar96._4_4_ = 0.16666666;
        auVar96._16_4_ = 0.16666666;
        auVar96._20_4_ = 0.16666666;
        auVar96._24_4_ = 0.16666666;
        auVar96._28_4_ = 0.16666666;
        auVar7 = vfmadd213ps_fma(auVar244,ZEXT1632(auVar7),auVar96);
        local_45d8 = ::_ps256_cephes_exp_p5;
        local_5540 = auVar7._0_8_;
        local_3160 = local_5540;
        uStack_5538 = auVar7._8_8_;
        uStack_3158 = uStack_5538;
        uStack_3150 = 0;
        uStack_3148 = 0;
        local_3180 = local_5480._0_8_;
        uStack_3178 = local_5480._8_8_;
        uStack_3170 = 0;
        uStack_3168 = 0;
        local_31a0[0] = 0.5;
        local_31a0[1] = 0.5;
        afStack_3198[0] = 0.5;
        afStack_3198[1] = 0.5;
        afStack_3190[0] = 0.5;
        afStack_3190[1] = 0.5;
        afStack_3188[0] = 0.5;
        afStack_3188[1] = 0.5;
        auVar97._8_4_ = 0.5;
        auVar97._12_4_ = 0.5;
        auVar97._0_4_ = 0.5;
        auVar97._4_4_ = 0.5;
        auVar97._16_4_ = 0.5;
        auVar97._20_4_ = 0.5;
        auVar97._24_4_ = 0.5;
        auVar97._28_4_ = 0.5;
        auVar7 = vfmadd213ps_fma(auVar244,ZEXT1632(auVar7),auVar97);
        local_45e8 = local_54a0;
        local_5540 = auVar7._0_8_;
        local_3100 = local_5540;
        uStack_5538 = auVar7._8_8_;
        uStack_30f8 = uStack_5538;
        uStack_30f0 = 0;
        uStack_30e8 = 0;
        uStack_5498 = auVar2._8_8_;
        uStack_3118 = uStack_5498;
        uStack_3110 = 0;
        uStack_3108 = 0;
        local_3140 = local_5480._0_8_;
        uStack_3138 = local_5480._8_8_;
        uStack_3130 = 0;
        uStack_3128 = 0;
        auVar7 = vfmadd213ps_fma(auVar35,ZEXT1632(auVar7),auVar244);
        local_5540 = auVar7._0_8_;
        uVar23 = local_5540;
        uStack_5538 = auVar7._8_8_;
        uVar24 = uStack_5538;
        uStack_53b0 = 0;
        uStack_53a8 = 0;
        local_53e0 = 0x3f8000003f800000;
        uStack_53d8 = 0x3f8000003f800000;
        uStack_53d0 = 0x3f8000003f800000;
        uStack_53c8 = 0x3f8000003f800000;
        local_53c0._0_4_ = auVar7._0_4_;
        local_53c0._4_4_ = auVar7._4_4_;
        uStack_53b8._0_4_ = auVar7._8_4_;
        uStack_53b8._4_4_ = auVar7._12_4_;
        local_5540._4_4_ = local_53c0._4_4_ + 1.0;
        local_5540._0_4_ = (float)local_53c0 + 1.0;
        uStack_5538._0_4_ = (float)uStack_53b8 + 1.0;
        uStack_5538._4_4_ = uStack_53b8._4_4_ + 1.0;
        uStack_5530._0_4_ = 0x3f800000;
        uStack_5530._4_4_ = 0x3f800000;
        auVar234 = _local_5540;
        uStack_5528._0_4_ = 0x3f800000;
        uStack_5528._4_4_ = 0x3f800000;
        auVar237 = _local_5540;
        local_2960._0_4_ = local_54c0._0_4_;
        local_2960._4_4_ = local_54c0._4_4_;
        uStack_2958._0_4_ = local_54c0._8_4_;
        uStack_2958._4_4_ = local_54c0._12_4_;
        uStack_2950._0_4_ = local_54c0._16_4_;
        uStack_2950._4_4_ = local_54c0._20_4_;
        uStack_2948._0_4_ = local_54c0._24_4_;
        uStack_2948._4_4_ = local_54c0._28_4_;
        local_54e0._4_4_ = (int)local_2960._4_4_;
        local_54e0._0_4_ = (int)(float)local_2960;
        local_54e0._8_4_ = (int)(float)uStack_2958;
        local_54e0._12_4_ = (int)uStack_2958._4_4_;
        local_54e0._16_4_ = (int)(float)uStack_2950;
        local_54e0._20_4_ = (int)uStack_2950._4_4_;
        auVar235 = local_54e0._0_24_;
        local_54e0._24_4_ = (int)(float)uStack_2948;
        local_54e0._28_4_ = (int)uStack_2948._4_4_;
        auVar4 = local_54e0;
        local_28a0 = local_54e0._0_8_;
        uStack_2898 = local_54e0._8_8_;
        local_54e0._16_8_ = auVar235._16_8_;
        uStack_2890 = local_54e0._16_8_;
        local_54e0._24_8_ = auVar4._24_8_;
        uStack_2888 = local_54e0._24_8_;
        local_28c0 = 0x7f0000007f;
        uStack_28b8 = 0x7f0000007f;
        uStack_28b0 = 0x7f0000007f;
        uStack_28a8 = 0x7f0000007f;
        local_25e0 = local_54e0._0_8_;
        uStack_25d8 = local_54e0._8_8_;
        uStack_25d0 = local_54e0._16_8_;
        uStack_25c8 = local_54e0._24_8_;
        local_2600 = 0x7f0000007f;
        uStack_25f8 = 0x7f0000007f;
        uStack_25f0 = 0x7f0000007f;
        uStack_25e8 = 0x7f0000007f;
        auVar124._16_8_ = local_54e0._16_8_;
        auVar124._0_16_ = local_54e0._0_16_;
        auVar124._24_8_ = local_54e0._24_8_;
        auVar123._8_8_ = 0x7f0000007f;
        auVar123._0_8_ = 0x7f0000007f;
        auVar123._16_8_ = 0x7f0000007f;
        auVar123._24_8_ = 0x7f0000007f;
        auVar4 = vpaddd_avx2(auVar124,auVar123);
        local_54e0._0_8_ = auVar4._0_8_;
        local_27a0 = local_54e0._0_8_;
        local_54e0._8_8_ = auVar4._8_8_;
        uStack_2798 = local_54e0._8_8_;
        local_54e0._16_8_ = auVar4._16_8_;
        uStack_2790 = local_54e0._16_8_;
        local_54e0._24_8_ = auVar4._24_8_;
        uStack_2788 = local_54e0._24_8_;
        local_27a4 = 0x17;
        local_24e0 = local_54e0._0_8_;
        uStack_24d8 = local_54e0._8_8_;
        uStack_24d0 = local_54e0._16_8_;
        uStack_24c8 = local_54e0._24_8_;
        local_24e4 = 0x17;
        local_54e0 = vpslld_avx2(auVar4,ZEXT416(0x17));
        local_26e0 = local_54e0._0_8_;
        uStack_26d8 = local_54e0._8_8_;
        uStack_26d0 = local_54e0._16_8_;
        uStack_26c8 = local_54e0._24_8_;
        local_5560 = local_54e0._0_8_;
        uStack_5558 = local_54e0._8_8_;
        uStack_5550 = local_54e0._16_8_;
        uStack_5548 = local_54e0._24_8_;
        local_5440 = local_5540;
        uStack_5438 = uStack_5538;
        uStack_5530 = auVar234._16_8_;
        uStack_5430 = uStack_5530;
        uStack_5528 = auVar237._24_8_;
        uStack_5428 = uStack_5528;
        local_5460._0_4_ = local_54e0._0_4_;
        local_5460._4_4_ = local_54e0._4_4_;
        uStack_5458._0_4_ = local_54e0._8_4_;
        uStack_5458._4_4_ = local_54e0._12_4_;
        uStack_5450._0_4_ = local_54e0._16_4_;
        uStack_5450._4_4_ = local_54e0._20_4_;
        uStack_5448._0_4_ = local_54e0._24_4_;
        local_5540._0_4_ = ((float)local_53c0 + 1.0) * (float)local_5460;
        local_5540._4_4_ = (local_53c0._4_4_ + 1.0) * local_5460._4_4_;
        uStack_5458._0_4_ = ((float)uStack_53b8 + 1.0) * (float)uStack_5458;
        uStack_5458._4_4_ = (uStack_53b8._4_4_ + 1.0) * uStack_5458._4_4_;
        uStack_5538._0_4_ = (float)uStack_5458;
        uStack_5538._4_4_ = uStack_5458._4_4_;
        uStack_5530._0_4_ = (float)uStack_5450 * 1.0;
        uStack_5530._4_4_ = uStack_5450._4_4_ * 1.0;
        auVar234 = _local_5540;
        uStack_5528._0_4_ = (float)uStack_5448 * 1.0;
        uStack_5528._4_4_ = 0x3f800000;
        auVar34 = _local_5540;
        local_55a0 = local_5540;
        uStack_5598 = uStack_5538;
        uStack_5530 = auVar234._16_8_;
        uStack_5590 = uStack_5530;
        uStack_5528 = auVar34._24_8_;
        uStack_5588 = uStack_5528;
        local_50e0 = (float)local_55e0 + (float)local_5540._0_4_;
        fStack_50dc = local_55e0._4_4_ + (float)local_5540._4_4_;
        fStack_50d8 = (float)uStack_55d8 + (float)uStack_5458;
        fStack_50d4 = uStack_55d8._4_4_ + uStack_5458._4_4_;
        fStack_50d0 = (float)uStack_55d0 + (float)uStack_5450 * 1.0;
        fStack_50cc = uStack_55d0._4_4_ + uStack_5450._4_4_ * 1.0;
        fStack_50c8 = (float)uStack_55c8 + (float)uStack_5448 * 1.0;
        fStack_50c4 = uStack_55c8._4_4_ + 1.0;
        auVar32._16_4_ = (float)uStack_55d0;
        auVar32._0_16_ = local_2440;
        auVar32._20_4_ = uStack_55d0._4_4_;
        auVar32._24_4_ = (float)uStack_55c8;
        auVar32._28_4_ = uStack_55c8._4_4_;
        auVar31._4_4_ = fStack_50dc;
        auVar31._0_4_ = local_50e0;
        auVar31._8_4_ = fStack_50d8;
        auVar31._12_4_ = fStack_50d4;
        auVar31._16_4_ = fStack_50d0;
        auVar31._20_4_ = fStack_50cc;
        auVar31._24_4_ = fStack_50c8;
        auVar31._28_4_ = fStack_50c4;
        auVar4 = vrcpps_avx(auVar31);
        auVar237._4_4_ = local_55e0._4_4_ * auVar4._4_4_;
        auVar237._0_4_ = (float)local_55e0 * auVar4._0_4_;
        auVar237._8_4_ = (float)uStack_55d8 * auVar4._8_4_;
        auVar237._12_4_ = uStack_55d8._4_4_ * auVar4._12_4_;
        auVar237._16_4_ = (float)uStack_55d0 * auVar4._16_4_;
        auVar237._20_4_ = uStack_55d0._4_4_ * auVar4._20_4_;
        auVar237._24_4_ = (float)uStack_55c8 * auVar4._24_4_;
        auVar237._28_4_ = uStack_55c8._4_4_;
        auVar7 = vfmsub213ps_fma(auVar237,auVar31,auVar32);
        auVar7 = vfnmadd213ps_fma(ZEXT1632(auVar7),auVar4,auVar237);
        local_5680 = local_22c0._0_8_;
        uStack_5678 = local_22c0._8_8_;
        uStack_5670 = auStack_22b0._0_8_;
        uStack_5668 = auStack_22b0._8_8_;
        local_56a0 = local_2300._0_8_;
        uStack_5698 = local_2300._8_8_;
        uStack_5690 = auStack_22f0._0_8_;
        uStack_5688 = auStack_22f0._8_8_;
        local_5660 = ZEXT1632(auVar7);
        auVar6._16_8_ = auStack_22b0._0_8_;
        auVar6._0_16_ = local_22c0;
        auVar6._24_8_ = auStack_22b0._8_8_;
        auVar5._16_8_ = auStack_22f0._0_8_;
        auVar5._0_16_ = local_2300;
        auVar5._24_8_ = auStack_22f0._8_8_;
        auVar245._8_4_ = 0x80000000;
        auVar245._0_8_ = 0x8000000080000000;
        auVar245._12_4_ = 0x80000000;
        auVar245._16_4_ = 0x80000000;
        auVar245._20_4_ = 0x80000000;
        auVar245._24_4_ = 0x80000000;
        auVar245._28_4_ = 0x80000000;
        auVar7 = vfmadd213ps_fma(auVar6,local_5660,auVar5 ^ auVar245);
        local_6160._0_4_ = auVar229._0_4_;
        local_6160._4_4_ = auVar229._4_4_;
        fStack_6158 = auVar229._8_4_;
        fStack_6154 = auVar229._12_4_;
        fStack_6150 = auVar229._16_4_;
        fStack_614c = auVar229._20_4_;
        fStack_6148 = (float)uStack_64a8;
        uStack_6144 = (undefined4)((ulong)uStack_64a8 >> 0x20);
        local_6180._0_4_ = auVar7._0_4_;
        local_6180._4_4_ = auVar7._4_4_;
        fStack_6178 = auVar7._8_4_;
        fStack_6174 = auVar7._12_4_;
        local_67a0 = CONCAT44((float)local_6160._4_4_ * (float)local_6180._4_4_,
                              (float)local_6160._0_4_ * (float)local_6180._0_4_);
        uStack_6798 = CONCAT44(fStack_6154 * fStack_6174,fStack_6158 * fStack_6178);
        uStack_6790 = CONCAT44(fStack_614c * 0.0,fStack_6150 * 0.0);
        uStack_6788 = CONCAT44(uStack_6144,fStack_6148 * 0.0);
        local_6448 = local_6720;
        local_6480 = local_67a0;
        uStack_6478 = uStack_6798;
        uStack_6470 = uStack_6790;
        uStack_6468 = uStack_6788;
        auVar4._8_8_ = uStack_6798;
        auVar4._0_8_ = local_67a0;
        auVar4._16_8_ = uStack_6790;
        auVar4._24_8_ = uStack_6788;
        *local_6720 = auVar4;
        local_6720 = local_6720 + 1;
        _local_6180 = ZEXT1632(auVar7);
        _local_6160 = auVar8;
        local_6040 = local_22c0._0_8_;
        uStack_6038 = local_22c0._8_8_;
        uStack_6030 = auStack_22b0._0_8_;
        uStack_6028 = auStack_22b0._8_8_;
        local_6020 = local_5e20;
        uStack_6018 = uStack_5e18;
        uStack_6010 = uStack_5e10;
        uStack_6008 = uStack_5e08;
        _local_5d20 = ZEXT1632(auVar1);
        local_5ca0 = uVar19;
        uStack_5c98 = uVar20;
        local_5c60 = local_5c80;
        uStack_5c58 = uStack_5c78;
        uStack_5c50 = uStack_5c70;
        uStack_5c48 = uStack_5c68;
        local_5c40 = uVar21;
        uStack_5c38 = uVar22;
        local_5c00 = local_5de0._0_8_;
        uStack_5bf8 = local_5de0._8_8_;
        uStack_5bf0 = local_5de0._16_8_;
        uStack_5be8 = local_5de0._24_8_;
        local_5be0 = uVar15;
        uStack_5bd8 = uVar16;
        uStack_5bd0 = uVar17;
        uStack_5bc8 = uVar18;
        local_5ba0 = uVar11;
        uStack_5b98 = uVar12;
        uStack_5b90 = uVar13;
        uStack_5b88 = uVar14;
        local_5a80 = local_2400._0_8_;
        uStack_5a78 = local_2400._8_8_;
        uStack_5a70 = auStack_23f0._0_8_;
        uStack_5a68 = auStack_23f0._8_8_;
        _local_5860 = auVar40;
        _local_57c0 = auVar48;
        local_57a0 = auVar238;
        local_5780 = local_5800._0_8_;
        uStack_5778 = local_5800._8_8_;
        uStack_5770 = local_5800._16_8_;
        uStack_5768 = local_5800._24_8_;
        local_5720 = local_5740;
        uStack_5718 = uStack_5738;
        uStack_5710 = uStack_5730;
        uStack_5708 = uStack_5728;
        local_56e0 = uVar9;
        uStack_56d8 = uVar10;
        local_55e0 = local_2440._0_8_;
        uStack_55d8 = local_2440._8_8_;
        uStack_55d0 = auStack_2430._0_8_;
        uStack_55c8 = auStack_2430._8_8_;
        _local_5540 = auVar34;
        _local_54a0 = auVar35;
        local_5480 = auVar244;
        local_5460 = local_54e0._0_8_;
        uStack_5458 = local_54e0._8_8_;
        uStack_5450 = local_54e0._16_8_;
        uStack_5448 = local_54e0._24_8_;
        local_5400 = local_5420;
        uStack_53f8 = uStack_5418;
        uStack_53f0 = uStack_5410;
        uStack_53e8 = uStack_5408;
        local_53c0 = uVar23;
        uStack_53b8 = uVar24;
        local_50c0 = local_5580;
        fStack_50bc = fStack_557c;
        fStack_50b8 = fStack_5578;
        fStack_50b4 = fStack_5574;
        fStack_50b0 = fStack_5570;
        fStack_50ac = fStack_556c;
        fStack_50a8 = fStack_5568;
        fStack_50a4 = fStack_5564;
        local_45d0 = local_45f0;
        local_45c8 = local_45e0;
        local_45b8 = local_45f0;
        local_45b0 = local_45e0;
        local_45a0 = local_45f0;
        local_4598 = local_45e0;
        local_4588 = local_45f0;
        local_4580 = local_45e0;
        local_4570 = local_45f0;
        local_4568 = local_45e0;
        local_4550 = local_45f0;
        local_4528 = local_4548;
        local_4520 = local_4538;
        local_4510 = local_4548;
        local_4508 = local_4538;
        local_44f8 = local_4548;
        local_44f0 = local_4538;
        local_44e0 = local_4548;
        local_44d8 = local_4538;
        local_44c8 = local_4548;
        local_44c0 = local_4538;
        local_44a8 = local_4548;
        local_43d0 = local_43e8;
        local_43c0 = local_43f8;
        local_43b8 = local_43e0;
        local_43a8 = local_43f8;
        local_43a0 = local_43e0;
        local_4390 = local_43f8;
        local_4388 = local_43e0;
        local_4378 = local_43f8;
        local_4370 = local_43e0;
        local_4360 = local_43f8;
        local_4358 = local_43e0;
        local_4348 = local_43f8;
        local_4340 = local_43e0;
        local_4330 = local_43f8;
        local_4328 = local_43e0;
        local_4318 = local_43f8;
        local_4310 = local_43e0;
        local_41e8 = local_45f0;
        local_41d0 = local_45f0;
        local_41c0 = local_41d8;
        local_41b8 = local_4548;
        local_41a0 = local_4548;
        local_4190 = local_41a8;
        local_4158 = local_43e0;
        uStack_29c8 = uStack_64a8;
        local_2960 = local_54c0._0_8_;
        uStack_2958 = local_54c0._8_8_;
        uStack_2950 = local_54c0._16_8_;
        uStack_2948 = local_54c0._24_8_;
        local_2940 = local_57e0._0_8_;
        uStack_2938 = local_57e0._8_8_;
        uStack_2930 = local_57e0._16_8_;
        uStack_2928 = local_57e0._24_8_;
        local_241c = local_2420;
        local_2418 = local_2420;
        local_2414 = local_2420;
        local_2410 = local_2420;
        local_240c = local_2420;
        local_2408 = local_2420;
        local_2404 = local_2420;
        local_23dc = local_23e0;
        local_23d8 = local_23e0;
        local_23d4 = local_23e0;
        local_23d0 = local_23e0;
        local_23cc = local_23e0;
        local_23c8 = local_23e0;
        local_23c4 = local_23e0;
        local_22dc = local_22e0;
        local_22d8 = local_22e0;
        local_22d4 = local_22e0;
        local_22d0 = local_22e0;
        local_22cc = local_22e0;
        local_22c8 = local_22e0;
        local_22c4 = local_22e0;
        local_229c = local_22a0;
        local_2298 = local_22a0;
        local_2294 = local_22a0;
        local_2290 = local_22a0;
        local_228c = local_22a0;
        local_2288 = local_22a0;
        local_2284 = local_22a0;
      }
      for (; local_6358 = local_6558, local_6748 = local_6228, local_676c + 3 < local_65c4;
          local_676c = local_676c + 4) {
        local_6410 = local_6720;
        local_6400 = *(undefined8 *)*local_6720;
        uStack_63f8 = *(undefined8 *)(*local_6720 + 8);
        auVar26 = *(undefined1 (*) [16])*local_6720;
        local_1680 = (undefined1  [16])0x0;
        local_1d30 = 0x3f800000;
        uStack_1d2c = 0x3f800000;
        uStack_1d28 = 0x3f800000;
        uStack_1d24 = 0x3f800000;
        local_2d0 = 0x42b0c0a5;
        uStack_2cc = 0x42b0c0a5;
        uStack_2c8 = 0x42b0c0a5;
        uStack_2c4 = 0x42b0c0a5;
        auVar215._8_4_ = 0x42b0c0a5;
        auVar215._0_8_ = 0x42b0c0a542b0c0a5;
        auVar215._12_4_ = 0x42b0c0a5;
        auVar7 = vminps_avx(*(undefined1 (*) [16])*local_6720,auVar215);
        local_1cf0._0_8_ = auVar7._0_8_;
        local_15b0 = local_1cf0._0_8_;
        local_1cf0._8_8_ = auVar7._8_8_;
        uStack_15a8 = local_1cf0._8_8_;
        local_15c0 = 0xc2b0c0a5;
        uStack_15bc = 0xc2b0c0a5;
        uStack_15b8 = 0xc2b0c0a5;
        uStack_15b4 = 0xc2b0c0a5;
        auVar139._8_4_ = 0xc2b0c0a5;
        auVar139._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar139._12_4_ = 0xc2b0c0a5;
        auVar2 = vmaxps_avx(auVar7,auVar139);
        local_1cf0._0_8_ = auVar2._0_8_;
        uVar9 = local_1cf0._0_8_;
        local_1cf0._8_8_ = auVar2._8_8_;
        uVar10 = local_1cf0._8_8_;
        local_1ca0 = 0x3fb8aa3b;
        uStack_1c9c = 0x3fb8aa3b;
        uStack_1c98 = 0x3fb8aa3b;
        uStack_1c94 = 0x3fb8aa3b;
        local_1c90._0_4_ = auVar2._0_4_;
        local_1c90._4_4_ = auVar2._4_4_;
        uStack_1c88._0_4_ = auVar2._8_4_;
        uStack_1c88._4_4_ = auVar2._12_4_;
        local_1d10._4_4_ = local_1c90._4_4_ * 1.442695;
        local_1d10._0_4_ = (float)local_1c90 * 1.442695;
        uStack_1d08._0_4_ = (float)uStack_1c88 * 1.442695;
        uStack_1d08._4_4_ = uStack_1c88._4_4_ * 1.442695;
        local_1c50 = local_1d10;
        uStack_1c48 = uStack_1d08;
        local_1c60 = 0x3f000000;
        uStack_1c5c = 0x3f000000;
        uStack_1c58 = 0x3f000000;
        uStack_1c54 = 0x3f000000;
        local_1d10._0_4_ = (float)local_1c90 * 1.442695 + 0.5;
        local_1d10._4_4_ = local_1c90._4_4_ * 1.442695 + 0.5;
        fVar236 = (float)uStack_1c88 * 1.442695 + 0.5;
        fVar239 = uStack_1c88._4_4_ * 1.442695 + 0.5;
        uStack_1d08._0_4_ = fVar236;
        uStack_1d08._4_4_ = fVar239;
        local_240 = local_1d10;
        uStack_238 = uStack_1d08;
        local_1d20._4_4_ = (int)(float)local_1d10._4_4_;
        local_1d20._0_4_ = (int)(float)local_1d10._0_4_;
        local_1d20._8_4_ = (int)fVar236;
        local_1d20._12_4_ = (int)fVar239;
        local_12c0 = local_1d20._0_8_;
        uStack_12b8 = local_1d20._8_8_;
        auVar159._8_8_ = local_1d20._8_8_;
        auVar159._0_8_ = local_1d20._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar159);
        local_1d00 = auVar1._0_8_;
        local_1c0 = local_1d00;
        uStack_1cf8 = auVar1._8_8_;
        uStack_1b8 = uStack_1cf8;
        local_1d0 = local_1d10;
        uStack_1c8 = uStack_1d08;
        auVar219._8_8_ = uStack_1d08;
        auVar219._0_8_ = local_1d10;
        auVar7 = vcmpps_avx(auVar219,auVar1,1);
        local_1d40._0_8_ = auVar7._0_8_;
        local_1490 = local_1d40._0_8_;
        local_1d40._8_8_ = auVar7._8_8_;
        uStack_1488 = local_1d40._8_8_;
        local_14a0 = 0x3f8000003f800000;
        uStack_1498 = 0x3f8000003f800000;
        auVar147._8_8_ = 0x3f8000003f800000;
        auVar147._0_8_ = 0x3f8000003f800000;
        local_1d40 = vpand_avx(auVar7,auVar147);
        local_1b70 = local_1d00;
        uStack_1b68 = uStack_1cf8;
        local_1b80 = local_1d40._0_8_;
        uStack_1b78 = local_1d40._8_8_;
        _local_1d10 = vsubps_avx(auVar1,local_1d40);
        local_db0 = local_1d10;
        local_da0 = ::_ps_cephes_exp_C1;
        local_1120 = local_1cf0;
        local_410 = local_1d10;
        uStack_408 = uStack_1d08;
        local_420[0] = 0.6933594;
        local_420[1] = 0.6933594;
        afStack_418[0] = 0.6933594;
        afStack_418[1] = 0.6933594;
        local_430 = local_1cf0._0_8_;
        uStack_428 = local_1cf0._8_8_;
        auVar207._8_4_ = 0.6933594;
        auVar207._12_4_ = 0.6933594;
        auVar207._0_4_ = 0.6933594;
        auVar207._4_4_ = 0.6933594;
        auVar7 = vfnmadd213ps_fma(auVar207,_local_1d10,auVar2);
        local_db8 = ::_ps_cephes_exp_C2;
        local_3e0 = local_1d10;
        uStack_3d8 = uStack_1d08;
        local_3f0[0] = -0.00021219444;
        local_3f0[1] = -0.00021219444;
        afStack_3e8[0] = -0.00021219444;
        afStack_3e8[1] = -0.00021219444;
        local_1cf0._0_8_ = auVar7._0_8_;
        local_400 = local_1cf0._0_8_;
        local_1cf0._8_8_ = auVar7._8_8_;
        uStack_3f8 = local_1cf0._8_8_;
        auVar208._8_4_ = -0.00021219444;
        auVar208._12_4_ = -0.00021219444;
        auVar208._0_4_ = -0.00021219444;
        auVar208._4_4_ = -0.00021219444;
        local_1cf0 = vfnmadd213ps_fma(auVar208,_local_1d10,auVar7);
        local_1cc0 = local_1cf0._0_8_;
        uStack_1cb8 = local_1cf0._8_8_;
        local_1cb0._0_4_ = local_1cf0._0_4_;
        local_1cb0._4_4_ = local_1cf0._4_4_;
        uStack_1ca8._0_4_ = local_1cf0._8_4_;
        uStack_1ca8._4_4_ = local_1cf0._12_4_;
        local_1d00._4_4_ = local_1cb0._4_4_ * local_1cb0._4_4_;
        local_1d00._0_4_ = (float)local_1cb0 * (float)local_1cb0;
        uStack_1cf8._0_4_ = (float)uStack_1ca8 * (float)uStack_1ca8;
        uStack_1cf8._4_4_ = uStack_1ca8._4_4_ * uStack_1ca8._4_4_;
        uStack_1d48._0_4_ = 0x39506967;
        local_1d50 = (undefined1  [8])0x3950696739506967;
        uStack_1d48._4_4_ = 0x39506967;
        local_1110 = local_1d50;
        local_10a8 = ::_ps_cephes_exp_p1;
        local_830 = 0x3950696739506967;
        uStack_828 = uStack_1d48;
        local_840 = local_1cf0._0_8_;
        uStack_838 = local_1cf0._8_8_;
        local_850[0] = 0.0013981999;
        local_850[1] = 0.0013981999;
        afStack_848[0] = 0.0013981999;
        afStack_848[1] = 0.0013981999;
        auVar188._8_4_ = 0.0013981999;
        auVar188._12_4_ = 0.0013981999;
        auVar188._0_4_ = 0.0013981999;
        auVar188._4_4_ = 0.0013981999;
        auVar7 = vfmadd213ps_fma(local_1cf0,_local_1d50,auVar188);
        local_10c0 = ::_ps_cephes_exp_p2;
        local_1d50 = auVar7._0_8_;
        local_800 = local_1d50;
        uStack_1d48 = auVar7._8_8_;
        uStack_7f8 = uStack_1d48;
        local_810 = local_1cf0._0_8_;
        uStack_808 = local_1cf0._8_8_;
        local_820[0] = 0.008333452;
        local_820[1] = 0.008333452;
        afStack_818[0] = 0.008333452;
        afStack_818[1] = 0.008333452;
        auVar189._8_4_ = 0.008333452;
        auVar189._12_4_ = 0.008333452;
        auVar189._0_4_ = 0.008333452;
        auVar189._4_4_ = 0.008333452;
        auVar7 = vfmadd213ps_fma(local_1cf0,auVar7,auVar189);
        local_10d8 = ::_ps_cephes_exp_p3;
        local_1d50 = auVar7._0_8_;
        local_7d0 = local_1d50;
        uStack_1d48 = auVar7._8_8_;
        uStack_7c8 = uStack_1d48;
        local_7e0 = local_1cf0._0_8_;
        uStack_7d8 = local_1cf0._8_8_;
        local_7f0[0] = 0.041665796;
        local_7f0[1] = 0.041665796;
        afStack_7e8[0] = 0.041665796;
        afStack_7e8[1] = 0.041665796;
        auVar190._8_4_ = 0.041665796;
        auVar190._12_4_ = 0.041665796;
        auVar190._0_4_ = 0.041665796;
        auVar190._4_4_ = 0.041665796;
        auVar7 = vfmadd213ps_fma(local_1cf0,auVar7,auVar190);
        local_10f0 = ::_ps_cephes_exp_p4;
        local_1d50 = auVar7._0_8_;
        local_7a0 = local_1d50;
        uStack_1d48 = auVar7._8_8_;
        uStack_798 = uStack_1d48;
        local_7b0 = local_1cf0._0_8_;
        uStack_7a8 = local_1cf0._8_8_;
        local_7c0[0] = 0.16666666;
        local_7c0[1] = 0.16666666;
        afStack_7b8[0] = 0.16666666;
        afStack_7b8[1] = 0.16666666;
        auVar191._8_4_ = 0.16666666;
        auVar191._12_4_ = 0.16666666;
        auVar191._0_4_ = 0.16666666;
        auVar191._4_4_ = 0.16666666;
        auVar7 = vfmadd213ps_fma(local_1cf0,auVar7,auVar191);
        local_1108 = ::_ps_cephes_exp_p5;
        local_1d50 = auVar7._0_8_;
        local_770 = local_1d50;
        uStack_1d48 = auVar7._8_8_;
        uStack_768 = uStack_1d48;
        local_780 = local_1cf0._0_8_;
        uStack_778 = local_1cf0._8_8_;
        local_790[0] = 0.5;
        local_790[1] = 0.5;
        afStack_788[0] = 0.5;
        afStack_788[1] = 0.5;
        auVar192._8_4_ = 0.5;
        auVar192._12_4_ = 0.5;
        auVar192._0_4_ = 0.5;
        auVar192._4_4_ = 0.5;
        auVar7 = vfmadd213ps_fma(local_1cf0,auVar7,auVar192);
        local_1118 = local_1d00;
        local_1d50 = auVar7._0_8_;
        local_740 = local_1d50;
        uStack_1d48 = auVar7._8_8_;
        uStack_738 = uStack_1d48;
        local_750 = local_1d00;
        uStack_748 = uStack_1cf8;
        local_760 = local_1cf0._0_8_;
        uStack_758 = local_1cf0._8_8_;
        auVar7 = vfmadd213ps_fma(_local_1d00,auVar7,local_1cf0);
        local_1d50 = auVar7._0_8_;
        uVar11 = local_1d50;
        uStack_1d48 = auVar7._8_8_;
        uVar12 = uStack_1d48;
        local_1c80 = 0x3f8000003f800000;
        uStack_1c78 = 0x3f8000003f800000;
        local_1c70._0_4_ = auVar7._0_4_;
        local_1c70._4_4_ = auVar7._4_4_;
        uStack_1c68._0_4_ = auVar7._8_4_;
        uStack_1c68._4_4_ = auVar7._12_4_;
        local_1d50._4_4_ = local_1c70._4_4_ + 1.0;
        local_1d50._0_4_ = (float)local_1c70 + 1.0;
        uStack_1d48._0_4_ = (float)uStack_1c68 + 1.0;
        uStack_1d48._4_4_ = uStack_1c68._4_4_ + 1.0;
        local_250._0_4_ = local_1d10._0_4_;
        local_250._4_4_ = local_1d10._4_4_;
        uStack_248._0_4_ = local_1d10._8_4_;
        uStack_248._4_4_ = local_1d10._12_4_;
        local_1d20._4_4_ = (int)local_250._4_4_;
        local_1d20._0_4_ = (int)(float)local_250;
        local_1d20._8_4_ = (int)(float)uStack_248;
        local_1d20._12_4_ = (int)uStack_248._4_4_;
        local_140 = local_1d20._0_8_;
        uStack_138 = local_1d20._8_8_;
        local_150 = 0x7f0000007f;
        uStack_148 = 0x7f0000007f;
        auVar226._8_8_ = local_1d20._8_8_;
        auVar226._0_8_ = local_1d20._0_8_;
        auVar225._8_8_ = 0x7f0000007f;
        auVar225._0_8_ = 0x7f0000007f;
        auVar7 = vpaddd_avx(auVar226,auVar225);
        local_1d20._0_8_ = auVar7._0_8_;
        local_c0 = local_1d20._0_8_;
        local_1d20._8_8_ = auVar7._8_8_;
        uStack_b8 = local_1d20._8_8_;
        local_c4 = 0x17;
        local_1d20 = vpslld_avx(auVar7,ZEXT416(0x17));
        local_70 = local_1d20._0_8_;
        uStack_68 = local_1d20._8_8_;
        local_1d60 = local_1d20._0_8_;
        uStack_1d58 = local_1d20._8_8_;
        local_1cd0 = local_1d50;
        uStack_1cc8 = uStack_1d48;
        local_1ce0._0_4_ = local_1d20._0_4_;
        local_1ce0._4_4_ = local_1d20._4_4_;
        uStack_1cd8._0_4_ = local_1d20._8_4_;
        uStack_1cd8._4_4_ = local_1d20._12_4_;
        local_1d50._0_4_ = ((float)local_1c70 + 1.0) * (float)local_1ce0;
        local_1d50._4_4_ = (local_1c70._4_4_ + 1.0) * local_1ce0._4_4_;
        uStack_1cd8._0_4_ = ((float)uStack_1c68 + 1.0) * (float)uStack_1cd8;
        uStack_1cd8._4_4_ = (uStack_1c68._4_4_ + 1.0) * uStack_1cd8._4_4_;
        uStack_1d48._0_4_ = (float)uStack_1cd8;
        uStack_1d48._4_4_ = uStack_1cd8._4_4_;
        local_1e90 = local_1d50;
        uStack_1e88 = uStack_1d48;
        local_1b84 = 0x3f800000;
        local_1ba0 = 0x3f800000;
        local_1ea0 = 0x3f8000003f800000;
        uStack_1e98 = 0x3f8000003f800000;
        local_1ff0._4_4_ = (float)local_1d50._4_4_ + 1.0;
        local_1ff0._0_4_ = (float)local_1d50._0_4_ + 1.0;
        uStack_1fe8._0_4_ = (float)uStack_1cd8 + 1.0;
        uStack_1fe8._4_4_ = uStack_1cd8._4_4_ + 1.0;
        local_2010 = 0x3f800000;
        uStack_200c = 0x3f800000;
        uStack_2008 = 0x3f800000;
        uStack_2004 = 0x3f800000;
        local_1630 = local_1ff0;
        uStack_1628 = uStack_1fe8;
        local_1660 = (undefined1  [16])0x0;
        local_1640 = 0;
        uStack_1638 = 0;
        auVar135._8_8_ = uStack_1fe8;
        auVar135._0_8_ = local_1ff0;
        local_2020 = vcmpps_avx(auVar135,ZEXT816(0),2);
        local_1570 = local_1ff0;
        uStack_1568 = uStack_1fe8;
        local_1580 = 0x800000;
        uStack_157c = 0x800000;
        uStack_1578 = 0x800000;
        uStack_1574 = 0x800000;
        auVar142._8_8_ = uStack_1fe8;
        auVar142._0_8_ = local_1ff0;
        auVar141._8_4_ = 0x800000;
        auVar141._0_8_ = 0x80000000800000;
        auVar141._12_4_ = 0x800000;
        auVar7 = vmaxps_avx(auVar142,auVar141);
        local_1ff0 = auVar7._0_8_;
        local_1500 = local_1ff0;
        uStack_1fe8 = auVar7._8_8_;
        uStack_14f8 = uStack_1fe8;
        local_1530 = local_1ff0;
        uStack_1528 = uStack_1fe8;
        local_1534 = 0x17;
        auVar2 = vpsrld_avx(auVar7,ZEXT416(0x17));
        local_1410 = local_1ff0;
        uStack_1408 = uStack_1fe8;
        local_1420 = 0x807fffff;
        uStack_141c = 0x807fffff;
        uStack_1418 = 0x807fffff;
        uStack_1414 = 0x807fffff;
        auVar150._8_4_ = 0x807fffff;
        auVar150._0_8_ = 0x807fffff807fffff;
        auVar150._12_4_ = 0x807fffff;
        auVar7 = vpand_avx(auVar7,auVar150);
        local_1ff0 = auVar7._0_8_;
        local_1370 = local_1ff0;
        uStack_1fe8 = auVar7._8_8_;
        uStack_1368 = uStack_1fe8;
        local_1380 = 0x3f000000;
        uStack_137c = 0x3f000000;
        uStack_1378 = 0x3f000000;
        uStack_1374 = 0x3f000000;
        auVar153._8_4_ = 0x3f000000;
        auVar153._0_8_ = 0x3f0000003f000000;
        auVar153._12_4_ = 0x3f000000;
        auVar1 = vpor_avx(auVar7,auVar153);
        local_2000._0_8_ = auVar2._0_8_;
        local_1310 = local_2000._0_8_;
        local_2000._8_8_ = auVar2._8_8_;
        uStack_1308 = local_2000._8_8_;
        local_1320 = 0x7f0000007f;
        uStack_1318 = 0x7f0000007f;
        auVar155._8_8_ = 0x7f0000007f;
        auVar155._0_8_ = 0x7f0000007f;
        local_2000 = vpsubd_avx(auVar2,auVar155);
        local_12a0 = local_2000._0_8_;
        uStack_1298 = local_2000._8_8_;
        auVar7 = vcvtdq2ps_avx(local_2000);
        local_2030 = auVar7._0_8_;
        uVar13 = local_2030;
        uStack_2028 = auVar7._8_8_;
        uVar14 = uStack_2028;
        local_1f40 = 0x3f8000003f800000;
        uStack_1f38 = 0x3f8000003f800000;
        local_1f30._0_4_ = auVar7._0_4_;
        local_1f30._4_4_ = auVar7._4_4_;
        uStack_1f28._0_4_ = auVar7._8_4_;
        uStack_1f28._4_4_ = auVar7._12_4_;
        local_2030._4_4_ = local_1f30._4_4_ + 1.0;
        local_2030._0_4_ = (float)local_1f30 + 1.0;
        uStack_2028._0_4_ = (float)uStack_1f28 + 1.0;
        uStack_2028._4_4_ = uStack_1f28._4_4_ + 1.0;
        local_1ff0 = auVar1._0_8_;
        local_1270 = local_1ff0;
        uStack_1fe8 = auVar1._8_8_;
        uStack_1268 = uStack_1fe8;
        local_1280 = 0x3f3504f3;
        uStack_127c = 0x3f3504f3;
        uStack_1278 = 0x3f3504f3;
        uStack_1274 = 0x3f3504f3;
        auVar161._8_4_ = 0x3f3504f3;
        auVar161._0_8_ = 0x3f3504f33f3504f3;
        auVar161._12_4_ = 0x3f3504f3;
        local_2040 = vcmpps_avx(auVar1,auVar161,1);
        local_1430 = local_1ff0;
        uStack_1428 = uStack_1fe8;
        local_1440 = local_2040._0_8_;
        uStack_1438 = local_2040._8_8_;
        local_2050 = vpand_avx(auVar1,local_2040);
        local_1b10 = local_1ff0;
        uStack_1b08 = uStack_1fe8;
        local_1b20 = 0x3f8000003f800000;
        uStack_1b18 = 0x3f8000003f800000;
        auVar2._8_8_ = 0x3f8000003f800000;
        auVar2._0_8_ = 0x3f8000003f800000;
        auVar7 = vsubps_avx(auVar1,auVar2);
        local_1b30 = local_2030;
        uStack_1b28 = uStack_2028;
        local_1450 = 0x3f8000003f800000;
        uStack_1448 = 0x3f8000003f800000;
        local_1460 = local_2040._0_8_;
        uStack_1458 = local_2040._8_8_;
        auVar149._8_8_ = 0x3f8000003f800000;
        auVar149._0_8_ = 0x3f8000003f800000;
        local_1b40 = vpand_avx(local_2040,auVar149);
        auVar1._8_8_ = uStack_2028;
        auVar1._0_8_ = local_2030;
        _local_2030 = vsubps_avx(auVar1,local_1b40);
        local_1ff0 = auVar7._0_8_;
        uVar15 = local_1ff0;
        uStack_1fe8 = auVar7._8_8_;
        uVar16 = uStack_1fe8;
        local_1f50._0_4_ = auVar7._0_4_;
        local_1f50._4_4_ = auVar7._4_4_;
        uStack_1f48._0_4_ = auVar7._8_4_;
        uStack_1f48._4_4_ = auVar7._12_4_;
        local_1f60._0_4_ = local_2050._0_4_;
        local_1f60._4_4_ = local_2050._4_4_;
        uStack_1f58._0_4_ = local_2050._8_4_;
        uStack_1f58._4_4_ = local_2050._12_4_;
        local_1ff0._0_4_ = (float)local_1f50 + (float)local_1f60;
        local_1ff0._4_4_ = local_1f50._4_4_ + local_1f60._4_4_;
        uStack_1f48._0_4_ = (float)uStack_1f48 + (float)uStack_1f58;
        uStack_1f48._4_4_ = uStack_1f48._4_4_ + uStack_1f58._4_4_;
        uStack_1fe8._0_4_ = (float)uStack_1f48;
        uStack_1fe8._4_4_ = uStack_1f48._4_4_;
        local_1fa0 = local_1ff0;
        uStack_1f98 = uStack_1fe8;
        local_2060 = (float)local_1ff0._0_4_ * (float)local_1ff0._0_4_;
        fStack_205c = (float)local_1ff0._4_4_ * (float)local_1ff0._4_4_;
        fStack_2058 = (float)uStack_1f48 * (float)uStack_1f48;
        fStack_2054 = uStack_1f48._4_4_ * uStack_1f48._4_4_;
        uStack_2068._0_4_ = 0x3d9021bb;
        local_2070 = (undefined1  [8])0x3d9021bb3d9021bb;
        uStack_2068._4_4_ = 0x3d9021bb;
        local_fe8 = local_2070;
        local_1000 = local_1ff0;
        local_f28 = ::_ps_cephes_log_p1;
        local_b30 = 0x3d9021bb3d9021bb;
        uStack_b28 = uStack_2068;
        local_b40 = local_1ff0;
        uStack_b38 = uStack_1fe8;
        local_b50[0] = -0.1151461;
        local_b50[1] = -0.1151461;
        afStack_b48[0] = -0.1151461;
        afStack_b48[1] = -0.1151461;
        auVar173._8_4_ = -0.1151461;
        auVar173._12_4_ = -0.1151461;
        auVar173._0_4_ = -0.1151461;
        auVar173._4_4_ = -0.1151461;
        auVar7 = vfmadd213ps_fma(_local_1ff0,_local_2070,auVar173);
        local_f40 = ::_ps_cephes_log_p2;
        local_2070 = auVar7._0_8_;
        local_b00 = local_2070;
        uStack_2068 = auVar7._8_8_;
        uStack_af8 = uStack_2068;
        local_b10 = local_1ff0;
        uStack_b08 = uStack_1fe8;
        local_b20[0] = 0.116769984;
        local_b20[1] = 0.116769984;
        afStack_b18[0] = 0.116769984;
        afStack_b18[1] = 0.116769984;
        auVar174._8_4_ = 0.116769984;
        auVar174._12_4_ = 0.116769984;
        auVar174._0_4_ = 0.116769984;
        auVar174._4_4_ = 0.116769984;
        auVar7 = vfmadd213ps_fma(_local_1ff0,auVar7,auVar174);
        local_f58 = ::_ps_cephes_log_p3;
        local_2070 = auVar7._0_8_;
        local_ad0 = local_2070;
        uStack_2068 = auVar7._8_8_;
        uStack_ac8 = uStack_2068;
        local_ae0 = local_1ff0;
        uStack_ad8 = uStack_1fe8;
        local_af0[0] = -0.12420141;
        local_af0[1] = -0.12420141;
        afStack_ae8[0] = -0.12420141;
        afStack_ae8[1] = -0.12420141;
        auVar175._8_4_ = -0.12420141;
        auVar175._12_4_ = -0.12420141;
        auVar175._0_4_ = -0.12420141;
        auVar175._4_4_ = -0.12420141;
        auVar7 = vfmadd213ps_fma(_local_1ff0,auVar7,auVar175);
        local_f70 = ::_ps_cephes_log_p4;
        local_2070 = auVar7._0_8_;
        local_aa0 = local_2070;
        uStack_2068 = auVar7._8_8_;
        uStack_a98 = uStack_2068;
        local_ab0 = local_1ff0;
        uStack_aa8 = uStack_1fe8;
        local_ac0[0] = 0.14249323;
        local_ac0[1] = 0.14249323;
        afStack_ab8[0] = 0.14249323;
        afStack_ab8[1] = 0.14249323;
        auVar176._8_4_ = 0.14249323;
        auVar176._12_4_ = 0.14249323;
        auVar176._0_4_ = 0.14249323;
        auVar176._4_4_ = 0.14249323;
        auVar7 = vfmadd213ps_fma(_local_1ff0,auVar7,auVar176);
        local_f88 = ::_ps_cephes_log_p5;
        local_2070 = auVar7._0_8_;
        local_a70 = local_2070;
        uStack_2068 = auVar7._8_8_;
        uStack_a68 = uStack_2068;
        local_a80 = local_1ff0;
        uStack_a78 = uStack_1fe8;
        local_a90[0] = -0.16668057;
        local_a90[1] = -0.16668057;
        afStack_a88[0] = -0.16668057;
        afStack_a88[1] = -0.16668057;
        auVar177._8_4_ = -0.16668057;
        auVar177._12_4_ = -0.16668057;
        auVar177._0_4_ = -0.16668057;
        auVar177._4_4_ = -0.16668057;
        auVar7 = vfmadd213ps_fma(_local_1ff0,auVar7,auVar177);
        local_fa0 = ::_ps_cephes_log_p6;
        local_2070 = auVar7._0_8_;
        local_a40 = local_2070;
        uStack_2068 = auVar7._8_8_;
        uStack_a38 = uStack_2068;
        local_a50 = local_1ff0;
        uStack_a48 = uStack_1fe8;
        local_a60[0] = 0.20000714;
        local_a60[1] = 0.20000714;
        afStack_a58[0] = 0.20000714;
        afStack_a58[1] = 0.20000714;
        auVar178._8_4_ = 0.20000714;
        auVar178._12_4_ = 0.20000714;
        auVar178._0_4_ = 0.20000714;
        auVar178._4_4_ = 0.20000714;
        auVar7 = vfmadd213ps_fma(_local_1ff0,auVar7,auVar178);
        local_fb8 = ::_ps_cephes_log_p7;
        local_2070 = auVar7._0_8_;
        local_a10 = local_2070;
        uStack_2068 = auVar7._8_8_;
        uStack_a08 = uStack_2068;
        local_a20 = local_1ff0;
        uStack_a18 = uStack_1fe8;
        local_a30[0] = -0.24999994;
        local_a30[1] = -0.24999994;
        afStack_a28[0] = -0.24999994;
        afStack_a28[1] = -0.24999994;
        auVar179._8_4_ = -0.24999994;
        auVar179._12_4_ = -0.24999994;
        auVar179._0_4_ = -0.24999994;
        auVar179._4_4_ = -0.24999994;
        auVar7 = vfmadd213ps_fma(_local_1ff0,auVar7,auVar179);
        local_fd0 = ::_ps_cephes_log_p8;
        local_2070 = auVar7._0_8_;
        local_9e0 = local_2070;
        uStack_2068 = auVar7._8_8_;
        uStack_9d8 = uStack_2068;
        local_9f0 = local_1ff0;
        uStack_9e8 = uStack_1fe8;
        local_a00[0] = 0.3333333;
        local_a00[1] = 0.3333333;
        afStack_9f8[0] = 0.3333333;
        afStack_9f8[1] = 0.3333333;
        auVar180._8_4_ = 0.3333333;
        auVar180._12_4_ = 0.3333333;
        auVar180._0_4_ = 0.3333333;
        auVar180._4_4_ = 0.3333333;
        auVar7 = vfmadd213ps_fma(_local_1ff0,auVar7,auVar180);
        local_2070 = auVar7._0_8_;
        uVar17 = local_2070;
        uStack_2068 = auVar7._8_8_;
        uVar18 = uStack_2068;
        local_1fc0 = local_1ff0;
        uStack_1fb8 = uStack_1fe8;
        local_1fb0._0_4_ = auVar7._0_4_;
        local_1fb0._4_4_ = auVar7._4_4_;
        uStack_1fa8._0_4_ = auVar7._8_4_;
        uStack_1fa8._4_4_ = auVar7._12_4_;
        local_2070._4_4_ = local_1fb0._4_4_ * (float)local_1ff0._4_4_;
        local_2070._0_4_ = (float)local_1fb0 * (float)local_1ff0._0_4_;
        uStack_2068._0_4_ = (float)uStack_1fa8 * (float)uStack_1f48;
        uStack_2068._4_4_ = uStack_1fa8._4_4_ * uStack_1f48._4_4_;
        local_1fd0 = local_2070;
        uStack_1fc8 = uStack_2068;
        local_1fe0 = CONCAT44(fStack_205c,local_2060);
        uStack_1fd8 = CONCAT44(fStack_2054,fStack_2058);
        local_2070._4_4_ = local_1fb0._4_4_ * (float)local_1ff0._4_4_ * fStack_205c;
        local_2070._0_4_ = (float)local_1fb0 * (float)local_1ff0._0_4_ * local_2060;
        uStack_2068._0_4_ = (float)uStack_1fa8 * (float)uStack_1f48 * fStack_2058;
        uStack_2068._4_4_ = uStack_1fa8._4_4_ * uStack_1f48._4_4_ * fStack_2054;
        local_ff0 = local_2030;
        local_fe0 = ::_ps_cephes_log_q1;
        local_9b0 = local_2030;
        uStack_9a8 = uStack_2028;
        local_9c0[0] = -0.00021219444;
        local_9c0[1] = -0.00021219444;
        afStack_9b8[0] = -0.00021219444;
        afStack_9b8[1] = -0.00021219444;
        local_9d0 = local_2070;
        uStack_9c8 = uStack_2068;
        auVar181._8_4_ = -0.00021219444;
        auVar181._12_4_ = -0.00021219444;
        auVar181._0_4_ = -0.00021219444;
        auVar181._4_4_ = -0.00021219444;
        auVar7 = vfmadd213ps_fma(auVar181,_local_2030,_local_2070);
        local_d50 = &local_2060;
        local_d58 = ::_ps_0p5;
        local_4a0 = CONCAT44(fStack_205c,local_2060);
        uStack_498 = CONCAT44(fStack_2054,fStack_2058);
        auVar233._4_4_ = fStack_205c;
        auVar233._0_4_ = local_2060;
        auVar233._8_4_ = fStack_2058;
        auVar233._12_4_ = fStack_2054;
        local_4b0[0] = 0.5;
        local_4b0[1] = 0.5;
        afStack_4a8[0] = 0.5;
        afStack_4a8[1] = 0.5;
        local_2070 = auVar7._0_8_;
        local_4c0 = local_2070;
        uStack_2068 = auVar7._8_8_;
        uStack_4b8 = uStack_2068;
        auVar204._8_4_ = 0.5;
        auVar204._12_4_ = 0.5;
        auVar204._0_4_ = 0.5;
        auVar204._4_4_ = 0.5;
        _local_2070 = vfnmadd213ps_fma(auVar204,auVar233,auVar7);
        local_1f70 = local_1ff0;
        uStack_1f68 = uStack_1fe8;
        local_1f80._0_4_ = local_2070._0_4_;
        local_1f80._4_4_ = local_2070._4_4_;
        uStack_1f78._0_4_ = local_2070._8_4_;
        uStack_1f78._4_4_ = local_2070._12_4_;
        local_1ff0._4_4_ = (float)local_1ff0._4_4_ + local_1f80._4_4_;
        local_1ff0._0_4_ = (float)local_1ff0._0_4_ + (float)local_1f80;
        uStack_1fe8._0_4_ = (float)uStack_1f48 + (float)uStack_1f78;
        uStack_1fe8._4_4_ = uStack_1f48._4_4_ + uStack_1f78._4_4_;
        local_ff8 = ::_ps_cephes_log_q2;
        local_980 = local_2030;
        uStack_978 = uStack_2028;
        local_990[0] = 0.6933594;
        local_990[1] = 0.6933594;
        afStack_988[0] = 0.6933594;
        afStack_988[1] = 0.6933594;
        local_9a0 = local_1ff0;
        uStack_998 = uStack_1fe8;
        auVar182._8_4_ = 0.6933594;
        auVar182._12_4_ = 0.6933594;
        auVar182._0_4_ = 0.6933594;
        auVar182._4_4_ = 0.6933594;
        auVar7 = vfmadd213ps_fma(auVar182,_local_2030,_local_1ff0);
        local_1ff0 = auVar7._0_8_;
        local_1390 = local_1ff0;
        uStack_1fe8 = auVar7._8_8_;
        uStack_1388 = uStack_1fe8;
        local_13a0 = local_2020._0_8_;
        uStack_1398 = local_2020._8_8_;
        _local_1ff0 = vpor_avx(auVar7,local_2020);
        local_21b0 = local_1ff0;
        uStack_21a8 = uStack_1fe8;
        local_1c04 = 0x3f800000;
        local_1c20 = 0x3f800000;
        local_21c0 = 0x3f8000003f800000;
        uStack_21b8 = 0x3f8000003f800000;
        local_1c24 = 0x40000000;
        local_1c40 = 0x40000000;
        local_21d0 = 0x4000000040000000;
        uStack_21c8 = 0x4000000040000000;
        local_2170._0_4_ = local_1ff0._0_4_;
        local_2170._4_4_ = local_1ff0._4_4_;
        uStack_2168._0_4_ = local_1ff0._8_4_;
        uStack_2168._4_4_ = local_1ff0._12_4_;
        local_1a70 = (float)local_2170 * 2.0;
        fStack_1a6c = local_2170._4_4_ * 2.0;
        fStack_1a68 = (float)uStack_2168 * 2.0;
        fStack_1a64 = uStack_2168._4_4_ * 2.0;
        local_1904 = 0x3f800000;
        local_1920 = 0x3f800000;
        local_1a80 = 0x3f8000003f800000;
        uStack_1a78 = 0x3f8000003f800000;
        local_1a50._8_8_ = 0x3f8000003f800000;
        local_1a50._0_8_ = 0x3f8000003f800000;
        local_1690 = (undefined1  [16])0x0;
        local_18d0 = 0;
        uStack_18c8 = 0;
        local_18e0 = CONCAT44(fStack_1a6c,local_1a70);
        uStack_18d8 = CONCAT44(fStack_1a64,fStack_1a68);
        auVar130._8_8_ = uStack_18d8;
        auVar130._0_8_ = local_18e0;
        auVar7 = vsubps_avx(ZEXT816(0),auVar130);
        local_16a0 = (undefined1  [16])0x0;
        local_1a10 = 0x3f800000;
        uStack_1a0c = 0x3f800000;
        uStack_1a08 = 0x3f800000;
        uStack_1a04 = 0x3f800000;
        local_19d0._0_8_ = auVar7._0_8_;
        local_2e0 = local_19d0._0_8_;
        local_19d0._8_8_ = auVar7._8_8_;
        uStack_2d8 = local_19d0._8_8_;
        local_2f0 = 0x42b0c0a5;
        uStack_2ec = 0x42b0c0a5;
        uStack_2e8 = 0x42b0c0a5;
        uStack_2e4 = 0x42b0c0a5;
        auVar214._8_4_ = 0x42b0c0a5;
        auVar214._0_8_ = 0x42b0c0a542b0c0a5;
        auVar214._12_4_ = 0x42b0c0a5;
        auVar7 = vminps_avx(auVar7,auVar214);
        local_19d0._0_8_ = auVar7._0_8_;
        local_15d0 = local_19d0._0_8_;
        local_19d0._8_8_ = auVar7._8_8_;
        uStack_15c8 = local_19d0._8_8_;
        local_15e0 = 0xc2b0c0a5;
        uStack_15dc = 0xc2b0c0a5;
        uStack_15d8 = 0xc2b0c0a5;
        uStack_15d4 = 0xc2b0c0a5;
        auVar138._8_4_ = 0xc2b0c0a5;
        auVar138._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar138._12_4_ = 0xc2b0c0a5;
        auVar2 = vmaxps_avx(auVar138,auVar7);
        local_19d0._0_8_ = auVar2._0_8_;
        uVar19 = local_19d0._0_8_;
        local_19d0._8_8_ = auVar2._8_8_;
        uVar20 = local_19d0._8_8_;
        local_1980 = 0x3fb8aa3b;
        uStack_197c = 0x3fb8aa3b;
        uStack_1978 = 0x3fb8aa3b;
        uStack_1974 = 0x3fb8aa3b;
        local_1970._0_4_ = auVar2._0_4_;
        local_1970._4_4_ = auVar2._4_4_;
        uStack_1968._0_4_ = auVar2._8_4_;
        uStack_1968._4_4_ = auVar2._12_4_;
        local_19f0._4_4_ = local_1970._4_4_ * 1.442695;
        local_19f0._0_4_ = (float)local_1970 * 1.442695;
        uStack_19e8._0_4_ = (float)uStack_1968 * 1.442695;
        uStack_19e8._4_4_ = uStack_1968._4_4_ * 1.442695;
        local_1930 = local_19f0;
        uStack_1928 = uStack_19e8;
        local_1940 = 0x3f000000;
        uStack_193c = 0x3f000000;
        uStack_1938 = 0x3f000000;
        uStack_1934 = 0x3f000000;
        local_19f0._0_4_ = (float)local_1970 * 1.442695 + 0.5;
        local_19f0._4_4_ = local_1970._4_4_ * 1.442695 + 0.5;
        fVar236 = (float)uStack_1968 * 1.442695 + 0.5;
        fVar239 = uStack_1968._4_4_ * 1.442695 + 0.5;
        uStack_19e8._0_4_ = fVar236;
        uStack_19e8._4_4_ = fVar239;
        local_260 = local_19f0;
        uStack_258 = uStack_19e8;
        local_1a00._4_4_ = (int)(float)local_19f0._4_4_;
        local_1a00._0_4_ = (int)(float)local_19f0._0_4_;
        local_1a00._8_4_ = (int)fVar236;
        local_1a00._12_4_ = (int)fVar239;
        local_12d0 = local_1a00._0_8_;
        uStack_12c8 = local_1a00._8_8_;
        auVar158._8_8_ = local_1a00._8_8_;
        auVar158._0_8_ = local_1a00._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar158);
        local_19e0 = auVar1._0_8_;
        local_1e0 = local_19e0;
        uStack_19d8 = auVar1._8_8_;
        uStack_1d8 = uStack_19d8;
        local_1f0 = local_19f0;
        uStack_1e8 = uStack_19e8;
        auVar218._8_8_ = uStack_19e8;
        auVar218._0_8_ = local_19f0;
        auVar7 = vcmpps_avx(auVar218,auVar1,1);
        local_1a20._0_8_ = auVar7._0_8_;
        local_14b0 = local_1a20._0_8_;
        local_1a20._8_8_ = auVar7._8_8_;
        uStack_14a8 = local_1a20._8_8_;
        local_14c0 = 0x3f8000003f800000;
        uStack_14b8 = 0x3f8000003f800000;
        auVar146._8_8_ = 0x3f8000003f800000;
        auVar146._0_8_ = 0x3f8000003f800000;
        local_1a20 = vpand_avx(auVar7,auVar146);
        local_18f0 = local_19e0;
        uStack_18e8 = uStack_19d8;
        local_1900 = local_1a20._0_8_;
        uStack_18f8 = local_1a20._8_8_;
        _local_19f0 = vsubps_avx(auVar1,local_1a20);
        local_de0 = local_19f0;
        local_dd0 = ::_ps_cephes_exp_C1;
        local_11b0 = local_19d0;
        local_3b0 = local_19f0;
        uStack_3a8 = uStack_19e8;
        local_3c0[0] = 0.6933594;
        local_3c0[1] = 0.6933594;
        afStack_3b8[0] = 0.6933594;
        afStack_3b8[1] = 0.6933594;
        local_3d0 = local_19d0._0_8_;
        uStack_3c8 = local_19d0._8_8_;
        auVar209._8_4_ = 0.6933594;
        auVar209._12_4_ = 0.6933594;
        auVar209._0_4_ = 0.6933594;
        auVar209._4_4_ = 0.6933594;
        auVar7 = vfnmadd213ps_fma(auVar209,_local_19f0,auVar2);
        local_de8 = ::_ps_cephes_exp_C2;
        local_380 = local_19f0;
        uStack_378 = uStack_19e8;
        local_390[0] = -0.00021219444;
        local_390[1] = -0.00021219444;
        afStack_388[0] = -0.00021219444;
        afStack_388[1] = -0.00021219444;
        local_19d0._0_8_ = auVar7._0_8_;
        local_3a0 = local_19d0._0_8_;
        local_19d0._8_8_ = auVar7._8_8_;
        uStack_398 = local_19d0._8_8_;
        auVar210._8_4_ = -0.00021219444;
        auVar210._12_4_ = -0.00021219444;
        auVar210._0_4_ = -0.00021219444;
        auVar210._4_4_ = -0.00021219444;
        local_19d0 = vfnmadd213ps_fma(auVar210,_local_19f0,auVar7);
        local_19a0 = local_19d0._0_8_;
        uStack_1998 = local_19d0._8_8_;
        local_1990._0_4_ = local_19d0._0_4_;
        local_1990._4_4_ = local_19d0._4_4_;
        uStack_1988._0_4_ = local_19d0._8_4_;
        uStack_1988._4_4_ = local_19d0._12_4_;
        local_19e0._4_4_ = local_1990._4_4_ * local_1990._4_4_;
        local_19e0._0_4_ = (float)local_1990 * (float)local_1990;
        uStack_19d8._0_4_ = (float)uStack_1988 * (float)uStack_1988;
        uStack_19d8._4_4_ = uStack_1988._4_4_ * uStack_1988._4_4_;
        uStack_1a28._0_4_ = 0x39506967;
        local_1a30 = (undefined1  [8])0x3950696739506967;
        uStack_1a28._4_4_ = 0x39506967;
        local_11a0 = local_1a30;
        local_1138 = ::_ps_cephes_exp_p1;
        local_710 = 0x3950696739506967;
        uStack_708 = uStack_1a28;
        local_720 = local_19d0._0_8_;
        uStack_718 = local_19d0._8_8_;
        local_730[0] = 0.0013981999;
        local_730[1] = 0.0013981999;
        afStack_728[0] = 0.0013981999;
        afStack_728[1] = 0.0013981999;
        auVar193._8_4_ = 0.0013981999;
        auVar193._12_4_ = 0.0013981999;
        auVar193._0_4_ = 0.0013981999;
        auVar193._4_4_ = 0.0013981999;
        auVar7 = vfmadd213ps_fma(local_19d0,_local_1a30,auVar193);
        local_1150 = ::_ps_cephes_exp_p2;
        local_1a30 = auVar7._0_8_;
        local_6e0 = local_1a30;
        uStack_1a28 = auVar7._8_8_;
        uStack_6d8 = uStack_1a28;
        local_6f0 = local_19d0._0_8_;
        uStack_6e8 = local_19d0._8_8_;
        local_700[0] = 0.008333452;
        local_700[1] = 0.008333452;
        afStack_6f8[0] = 0.008333452;
        afStack_6f8[1] = 0.008333452;
        auVar194._8_4_ = 0.008333452;
        auVar194._12_4_ = 0.008333452;
        auVar194._0_4_ = 0.008333452;
        auVar194._4_4_ = 0.008333452;
        auVar7 = vfmadd213ps_fma(local_19d0,auVar7,auVar194);
        local_1168 = ::_ps_cephes_exp_p3;
        local_1a30 = auVar7._0_8_;
        local_6b0 = local_1a30;
        uStack_1a28 = auVar7._8_8_;
        uStack_6a8 = uStack_1a28;
        local_6c0 = local_19d0._0_8_;
        uStack_6b8 = local_19d0._8_8_;
        local_6d0[0] = 0.041665796;
        local_6d0[1] = 0.041665796;
        afStack_6c8[0] = 0.041665796;
        afStack_6c8[1] = 0.041665796;
        auVar195._8_4_ = 0.041665796;
        auVar195._12_4_ = 0.041665796;
        auVar195._0_4_ = 0.041665796;
        auVar195._4_4_ = 0.041665796;
        auVar7 = vfmadd213ps_fma(local_19d0,auVar7,auVar195);
        local_1180 = ::_ps_cephes_exp_p4;
        local_1a30 = auVar7._0_8_;
        local_680 = local_1a30;
        uStack_1a28 = auVar7._8_8_;
        uStack_678 = uStack_1a28;
        local_690 = local_19d0._0_8_;
        uStack_688 = local_19d0._8_8_;
        local_6a0[0] = 0.16666666;
        local_6a0[1] = 0.16666666;
        afStack_698[0] = 0.16666666;
        afStack_698[1] = 0.16666666;
        auVar196._8_4_ = 0.16666666;
        auVar196._12_4_ = 0.16666666;
        auVar196._0_4_ = 0.16666666;
        auVar196._4_4_ = 0.16666666;
        auVar7 = vfmadd213ps_fma(local_19d0,auVar7,auVar196);
        local_1198 = ::_ps_cephes_exp_p5;
        local_1a30 = auVar7._0_8_;
        local_650 = local_1a30;
        uStack_1a28 = auVar7._8_8_;
        uStack_648 = uStack_1a28;
        local_660 = local_19d0._0_8_;
        uStack_658 = local_19d0._8_8_;
        local_670[0] = 0.5;
        local_670[1] = 0.5;
        afStack_668[0] = 0.5;
        afStack_668[1] = 0.5;
        auVar197._8_4_ = 0.5;
        auVar197._12_4_ = 0.5;
        auVar197._0_4_ = 0.5;
        auVar197._4_4_ = 0.5;
        auVar7 = vfmadd213ps_fma(local_19d0,auVar7,auVar197);
        local_11a8 = local_19e0;
        local_1a30 = auVar7._0_8_;
        local_620 = local_1a30;
        uStack_1a28 = auVar7._8_8_;
        uStack_618 = uStack_1a28;
        local_630 = local_19e0;
        uStack_628 = uStack_19d8;
        local_640 = local_19d0._0_8_;
        uStack_638 = local_19d0._8_8_;
        auVar7 = vfmadd213ps_fma(_local_19e0,auVar7,local_19d0);
        local_1a30 = auVar7._0_8_;
        uVar21 = local_1a30;
        uStack_1a28 = auVar7._8_8_;
        uVar22 = uStack_1a28;
        local_1960 = 0x3f8000003f800000;
        uStack_1958 = 0x3f8000003f800000;
        local_1950._0_4_ = auVar7._0_4_;
        local_1950._4_4_ = auVar7._4_4_;
        uStack_1948._0_4_ = auVar7._8_4_;
        uStack_1948._4_4_ = auVar7._12_4_;
        local_1a30._4_4_ = local_1950._4_4_ + 1.0;
        local_1a30._0_4_ = (float)local_1950 + 1.0;
        uStack_1a28._0_4_ = (float)uStack_1948 + 1.0;
        uStack_1a28._4_4_ = uStack_1948._4_4_ + 1.0;
        local_270._0_4_ = local_19f0._0_4_;
        local_270._4_4_ = local_19f0._4_4_;
        uStack_268._0_4_ = local_19f0._8_4_;
        uStack_268._4_4_ = local_19f0._12_4_;
        local_1a00._4_4_ = (int)local_270._4_4_;
        local_1a00._0_4_ = (int)(float)local_270;
        local_1a00._8_4_ = (int)(float)uStack_268;
        local_1a00._12_4_ = (int)uStack_268._4_4_;
        local_160 = local_1a00._0_8_;
        uStack_158 = local_1a00._8_8_;
        local_170 = 0x7f0000007f;
        uStack_168 = 0x7f0000007f;
        auVar224._8_8_ = local_1a00._8_8_;
        auVar224._0_8_ = local_1a00._0_8_;
        auVar223._8_8_ = 0x7f0000007f;
        auVar223._0_8_ = 0x7f0000007f;
        auVar7 = vpaddd_avx(auVar224,auVar223);
        local_1a00._0_8_ = auVar7._0_8_;
        local_e0 = local_1a00._0_8_;
        local_1a00._8_8_ = auVar7._8_8_;
        uStack_d8 = local_1a00._8_8_;
        local_e4 = 0x17;
        local_1a00 = vpslld_avx(auVar7,ZEXT416(0x17));
        local_80 = local_1a00._0_8_;
        uStack_78 = local_1a00._8_8_;
        local_1a40 = local_1a00._0_8_;
        uStack_1a38 = local_1a00._8_8_;
        local_19b0 = _local_1a30;
        local_19c0._0_4_ = local_1a00._0_4_;
        local_19c0._4_4_ = local_1a00._4_4_;
        uStack_19b8._0_4_ = local_1a00._8_4_;
        uStack_19b8._4_4_ = local_1a00._12_4_;
        local_1a30._0_4_ = ((float)local_1950 + 1.0) * (float)local_19c0;
        local_1a30._4_4_ = (local_1950._4_4_ + 1.0) * local_19c0._4_4_;
        uStack_19b8._0_4_ = ((float)uStack_1948 + 1.0) * (float)uStack_19b8;
        uStack_19b8._4_4_ = (uStack_1948._4_4_ + 1.0) * uStack_19b8._4_4_;
        uStack_1a28._0_4_ = (float)uStack_19b8;
        uStack_1a28._4_4_ = uStack_19b8._4_4_;
        local_1a60 = local_1a30;
        uStack_1a58 = uStack_1a28;
        local_16e0 = (float)local_1a30._0_4_ + 1.0;
        fStack_16dc = (float)local_1a30._4_4_ + 1.0;
        fStack_16d8 = (float)uStack_19b8 + 1.0;
        fStack_16d4 = uStack_19b8._4_4_ + 1.0;
        auVar134._4_4_ = fStack_16dc;
        auVar134._0_4_ = local_16e0;
        auVar134._8_4_ = fStack_16d8;
        auVar134._12_4_ = fStack_16d4;
        _local_2190 = vdivps_avx(local_1a50,auVar134);
        local_1ab0._0_4_ = (float)local_2190._0_4_ * 2.0;
        local_1ab0._4_4_ = (float)local_2190._4_4_ * 2.0;
        local_1ab0._8_4_ = fStack_2188 * 2.0;
        local_1ab0._12_4_ = fStack_2184 * 2.0;
        auVar3._8_8_ = 0x3f8000003f800000;
        auVar3._0_8_ = 0x3f8000003f800000;
        _local_2260 = vsubps_avx(local_1ab0,auVar3);
        local_2250._0_4_ = (undefined4)local_6400;
        local_2250._4_4_ = (undefined4)((ulong)local_6400 >> 0x20);
        fStack_2248 = (float)uStack_63f8;
        fStack_2244 = (float)((ulong)uStack_63f8 >> 0x20);
        local_67b0 = CONCAT44((float)local_2250._4_4_ * (float)local_2260._4_4_,
                              (float)local_2250._0_4_ * (float)local_2260._0_4_);
        uStack_67a8 = CONCAT44(fStack_2244 * fStack_2254,fStack_2248 * fStack_2258);
        local_63c8 = local_6720;
        local_63e0 = local_67b0;
        uStack_63d8 = uStack_67a8;
        auVar7._8_8_ = uStack_67a8;
        auVar7._0_8_ = local_67b0;
        *(undefined1 (*) [16])*local_6720 = auVar7;
        local_6720 = (undefined1 (*) [32])(*local_6720 + 0x10);
        _local_2250 = auVar26;
        local_21a0 = local_21d0;
        uStack_2198 = uStack_21c8;
        local_2180 = local_21d0;
        uStack_2178 = uStack_21c8;
        local_2170 = local_1ff0;
        uStack_2168 = uStack_1fe8;
        local_1fb0 = uVar17;
        uStack_1fa8 = uVar18;
        local_1f90 = local_1fa0;
        uStack_1f88 = uStack_1f98;
        local_1f80 = local_2070;
        uStack_1f78 = uStack_2068;
        local_1f60 = local_2050._0_8_;
        uStack_1f58 = local_2050._8_8_;
        local_1f50 = uVar15;
        uStack_1f48 = uVar16;
        local_1f30 = uVar13;
        uStack_1f28 = uVar14;
        local_1ce0 = local_1d20._0_8_;
        uStack_1cd8 = local_1d20._8_8_;
        local_1cb0 = local_1cc0;
        uStack_1ca8 = uStack_1cb8;
        local_1c90 = uVar9;
        uStack_1c88 = uVar10;
        local_1c70 = uVar11;
        uStack_1c68 = uVar12;
        uStack_1c3c = local_1c40;
        uStack_1c38 = local_1c40;
        uStack_1c34 = local_1c40;
        uStack_1c1c = local_1c20;
        uStack_1c18 = local_1c20;
        uStack_1c14 = local_1c20;
        uStack_1b9c = local_1ba0;
        uStack_1b98 = local_1ba0;
        uStack_1b94 = local_1ba0;
        local_1ac0 = local_21c0;
        uStack_1ab8 = uStack_21b8;
        local_19c0 = local_1a00._0_8_;
        uStack_19b8 = local_1a00._8_8_;
        local_1990 = local_19a0;
        uStack_1988 = uStack_1998;
        local_1970 = uVar19;
        uStack_1968 = uVar20;
        local_1950 = uVar21;
        uStack_1948 = uVar22;
        uStack_191c = local_1920;
        uStack_1918 = local_1920;
        uStack_1914 = local_1920;
        local_16d0 = local_1a50;
        local_1190 = local_11b0;
        local_1188 = local_11a0;
        local_1178 = local_11b0;
        local_1170 = local_11a0;
        local_1160 = local_11b0;
        local_1158 = local_11a0;
        local_1148 = local_11b0;
        local_1140 = local_11a0;
        local_1130 = local_11b0;
        local_1128 = local_11a0;
        local_1100 = local_1120;
        local_10f8 = local_1110;
        local_10e8 = local_1120;
        local_10e0 = local_1110;
        local_10d0 = local_1120;
        local_10c8 = local_1110;
        local_10b8 = local_1120;
        local_10b0 = local_1110;
        local_10a0 = local_1120;
        local_1098 = local_1110;
        local_fd8 = local_ff0;
        local_fc8 = local_1000;
        local_fc0 = local_fe8;
        local_fb0 = local_1000;
        local_fa8 = local_fe8;
        local_f98 = local_1000;
        local_f90 = local_fe8;
        local_f80 = local_1000;
        local_f78 = local_fe8;
        local_f68 = local_1000;
        local_f60 = local_fe8;
        local_f50 = local_1000;
        local_f48 = local_fe8;
        local_f38 = local_1000;
        local_f30 = local_fe8;
        local_f20 = local_1000;
        local_f18 = local_fe8;
        local_df0 = local_11b0;
        local_dd8 = local_11b0;
        local_dc8 = local_de0;
        local_dc0 = local_1120;
        local_da8 = local_1120;
        local_d98 = local_db0;
        local_d60 = local_fe8;
        local_2c0 = local_6400;
        uStack_2b8 = uStack_63f8;
        local_270 = local_19f0;
        uStack_268 = uStack_19e8;
        local_250 = local_1d10;
        uStack_248 = uStack_1d08;
      }
      for (; local_676c < local_65c4; local_676c = local_676c + 1) {
        fVar236 = *(float *)*local_6720;
        fVar239 = expf(*(float *)*local_6720);
        fVar239 = logf(fVar239 + 1.0);
        fVar239 = tanhf(fVar239);
        *(float *)*local_6720 = fVar236 * fVar239;
        local_6720 = (undefined1 (*) [32])(*local_6720 + 4);
      }
    }
    local_6594 = 0;
  }
  return local_6594;
}

Assistant:

int Mish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}